

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx::CurveNiIntersectorK<4,8>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  uint uVar7;
  Primitive PVar8;
  uint uVar9;
  uint uVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [28];
  undefined1 auVar99 [28];
  undefined1 auVar100 [28];
  RTCIntersectArguments *pRVar101;
  ulong uVar102;
  uint uVar103;
  long lVar104;
  undefined4 uVar105;
  ulong uVar106;
  long lVar107;
  ulong uVar108;
  float fVar109;
  float fVar124;
  float fVar126;
  vint4 bi_1;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar128;
  float fVar130;
  float fVar132;
  float fVar134;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar125;
  float fVar127;
  float fVar129;
  float fVar131;
  float fVar133;
  float fVar135;
  float fVar136;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  float fVar137;
  float fVar152;
  float fVar153;
  vint4 bi_2;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar155;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar154;
  undefined1 auVar151 [64];
  float fVar169;
  vint4 ai;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar170;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar171;
  float fVar186;
  float fVar187;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar188;
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar189;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  float fVar193;
  float fVar194;
  float fVar205;
  float fVar207;
  vint4 bi;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar198 [16];
  undefined1 auVar197 [16];
  undefined1 auVar199 [32];
  float fVar209;
  undefined1 auVar200 [32];
  float fVar206;
  float fVar208;
  float fVar210;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar211;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar212;
  float fVar222;
  float fVar225;
  vint4 ai_2;
  float fVar228;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar213;
  float fVar214;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar223;
  float fVar224;
  float fVar226;
  float fVar227;
  float fVar229;
  float fVar230;
  float fVar231;
  undefined1 auVar221 [64];
  float fVar232;
  float fVar241;
  float fVar243;
  vint4 ai_1;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar244;
  float fVar246;
  undefined1 auVar242 [12];
  undefined1 auVar235 [16];
  float fVar245;
  float fVar247;
  float fVar248;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar249;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar255;
  float fVar256;
  float fVar257;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar258;
  float fVar259;
  float fVar263;
  float fVar264;
  float fVar265;
  undefined1 auVar260 [16];
  float fVar267;
  undefined1 auVar261 [16];
  float fVar266;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar262 [32];
  float fVar272;
  float fVar282;
  float fVar284;
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  float fVar273;
  float fVar283;
  float fVar285;
  float fVar286;
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar287;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  float fVar292;
  float fVar293;
  float fVar294;
  undefined1 auVar291 [64];
  float fVar296;
  float fVar297;
  undefined1 auVar295 [32];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar309;
  float fVar310;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  float fVar311;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar312 [32];
  float fVar316;
  float fVar321;
  float fVar322;
  float fVar323;
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [16];
  undefined1 auStack_7d0 [16];
  undefined1 local_7c0 [48];
  undefined1 (*local_790) [16];
  undefined1 (*local_788) [16];
  undefined1 (*local_780) [32];
  Precalculations *local_778;
  RTCFilterFunctionNArguments local_770;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6d0 [8];
  undefined8 uStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined1 local_660 [32];
  LinearSpace3fa *local_630;
  ulong local_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 auStack_5d0 [8];
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 local_520 [8];
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  uint local_3e0;
  uint local_3dc;
  float local_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined1 local_380 [32];
  float local_360 [4];
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  RTCHitN local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar143 [24];
  undefined1 auVar240 [32];
  undefined1 auVar281 [64];
  undefined1 auVar300 [32];
  
  PVar8 = prim[1];
  uVar106 = (ulong)(byte)PVar8;
  fVar258 = *(float *)(prim + uVar106 * 0x19 + 0x12);
  auVar161 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar161 = vinsertps_avx(auVar161,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar176 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar176 = vinsertps_avx(auVar176,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar161 = vsubps_avx(auVar161,*(undefined1 (*) [16])(prim + uVar106 * 0x19 + 6));
  auVar138._0_4_ = fVar258 * auVar161._0_4_;
  auVar138._4_4_ = fVar258 * auVar161._4_4_;
  auVar138._8_4_ = fVar258 * auVar161._8_4_;
  auVar138._12_4_ = fVar258 * auVar161._12_4_;
  auVar250._0_4_ = fVar258 * auVar176._0_4_;
  auVar250._4_4_ = fVar258 * auVar176._4_4_;
  auVar250._8_4_ = fVar258 * auVar176._8_4_;
  auVar250._12_4_ = fVar258 * auVar176._12_4_;
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 4 + 6)));
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar176 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 5 + 6)));
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 6 + 6)));
  auVar177 = vcvtdq2ps_avx(auVar177);
  auVar178 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0xb + 6)));
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0xc + 6)));
  auVar175 = vcvtdq2ps_avx(auVar175);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0xd + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x12 + 6)));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar112 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x13 + 6)));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x14 + 6)));
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar291 = ZEXT1664(auVar140);
  auVar110 = vshufps_avx(auVar250,auVar250,0);
  auVar139 = vshufps_avx(auVar250,auVar250,0x55);
  auVar156 = vshufps_avx(auVar250,auVar250,0xaa);
  fVar258 = auVar156._0_4_;
  fVar212 = auVar156._4_4_;
  fVar171 = auVar156._8_4_;
  fVar263 = auVar156._12_4_;
  fVar187 = auVar139._0_4_;
  fVar267 = auVar139._4_4_;
  fVar228 = auVar139._8_4_;
  fVar188 = auVar139._12_4_;
  fVar222 = auVar110._0_4_;
  fVar186 = auVar110._4_4_;
  fVar265 = auVar110._8_4_;
  fVar225 = auVar110._12_4_;
  auVar298._0_4_ = fVar222 * auVar161._0_4_ + fVar187 * auVar176._0_4_ + fVar258 * auVar177._0_4_;
  auVar298._4_4_ = fVar186 * auVar161._4_4_ + fVar267 * auVar176._4_4_ + fVar212 * auVar177._4_4_;
  auVar298._8_4_ = fVar265 * auVar161._8_4_ + fVar228 * auVar176._8_4_ + fVar171 * auVar177._8_4_;
  auVar298._12_4_ =
       fVar225 * auVar161._12_4_ + fVar188 * auVar176._12_4_ + fVar263 * auVar177._12_4_;
  auVar305._0_4_ = fVar222 * auVar178._0_4_ + fVar187 * auVar175._0_4_ + auVar15._0_4_ * fVar258;
  auVar305._4_4_ = fVar186 * auVar178._4_4_ + fVar267 * auVar175._4_4_ + auVar15._4_4_ * fVar212;
  auVar305._8_4_ = fVar265 * auVar178._8_4_ + fVar228 * auVar175._8_4_ + auVar15._8_4_ * fVar171;
  auVar305._12_4_ = fVar225 * auVar178._12_4_ + fVar188 * auVar175._12_4_ + auVar15._12_4_ * fVar263
  ;
  auVar251._0_4_ = fVar222 * auVar111._0_4_ + fVar187 * auVar112._0_4_ + auVar140._0_4_ * fVar258;
  auVar251._4_4_ = fVar186 * auVar111._4_4_ + fVar267 * auVar112._4_4_ + auVar140._4_4_ * fVar212;
  auVar251._8_4_ = fVar265 * auVar111._8_4_ + fVar228 * auVar112._8_4_ + auVar140._8_4_ * fVar171;
  auVar251._12_4_ =
       fVar225 * auVar111._12_4_ + fVar188 * auVar112._12_4_ + auVar140._12_4_ * fVar263;
  auVar110 = vshufps_avx(auVar138,auVar138,0);
  auVar139 = vshufps_avx(auVar138,auVar138,0x55);
  auVar156 = vshufps_avx(auVar138,auVar138,0xaa);
  fVar258 = auVar156._0_4_;
  fVar212 = auVar156._4_4_;
  fVar171 = auVar156._8_4_;
  fVar263 = auVar156._12_4_;
  fVar187 = auVar139._0_4_;
  fVar267 = auVar139._4_4_;
  fVar228 = auVar139._8_4_;
  fVar188 = auVar139._12_4_;
  fVar222 = auVar110._0_4_;
  fVar186 = auVar110._4_4_;
  fVar265 = auVar110._8_4_;
  fVar225 = auVar110._12_4_;
  auVar233._0_4_ = fVar222 * auVar161._0_4_ + fVar187 * auVar176._0_4_ + fVar258 * auVar177._0_4_;
  auVar233._4_4_ = fVar186 * auVar161._4_4_ + fVar267 * auVar176._4_4_ + fVar212 * auVar177._4_4_;
  auVar233._8_4_ = fVar265 * auVar161._8_4_ + fVar228 * auVar176._8_4_ + fVar171 * auVar177._8_4_;
  auVar233._12_4_ =
       fVar225 * auVar161._12_4_ + fVar188 * auVar176._12_4_ + fVar263 * auVar177._12_4_;
  auVar110._0_4_ = fVar222 * auVar178._0_4_ + auVar15._0_4_ * fVar258 + fVar187 * auVar175._0_4_;
  auVar110._4_4_ = fVar186 * auVar178._4_4_ + auVar15._4_4_ * fVar212 + fVar267 * auVar175._4_4_;
  auVar110._8_4_ = fVar265 * auVar178._8_4_ + auVar15._8_4_ * fVar171 + fVar228 * auVar175._8_4_;
  auVar110._12_4_ = fVar225 * auVar178._12_4_ + auVar15._12_4_ * fVar263 + fVar188 * auVar175._12_4_
  ;
  auVar260._8_4_ = 0x7fffffff;
  auVar260._0_8_ = 0x7fffffff7fffffff;
  auVar260._12_4_ = 0x7fffffff;
  auVar161 = vandps_avx(auVar298,auVar260);
  auVar195._8_4_ = 0x219392ef;
  auVar195._0_8_ = 0x219392ef219392ef;
  auVar195._12_4_ = 0x219392ef;
  auVar161 = vcmpps_avx(auVar161,auVar195,1);
  auVar176 = vblendvps_avx(auVar298,auVar195,auVar161);
  auVar161 = vandps_avx(auVar305,auVar260);
  auVar161 = vcmpps_avx(auVar161,auVar195,1);
  auVar177 = vblendvps_avx(auVar305,auVar195,auVar161);
  auVar161 = vandps_avx(auVar260,auVar251);
  auVar161 = vcmpps_avx(auVar161,auVar195,1);
  auVar161 = vblendvps_avx(auVar251,auVar195,auVar161);
  auVar139._0_4_ = fVar222 * auVar111._0_4_ + fVar187 * auVar112._0_4_ + auVar140._0_4_ * fVar258;
  auVar139._4_4_ = fVar186 * auVar111._4_4_ + fVar267 * auVar112._4_4_ + auVar140._4_4_ * fVar212;
  auVar139._8_4_ = fVar265 * auVar111._8_4_ + fVar228 * auVar112._8_4_ + auVar140._8_4_ * fVar171;
  auVar139._12_4_ =
       fVar225 * auVar111._12_4_ + fVar188 * auVar112._12_4_ + auVar140._12_4_ * fVar263;
  auVar178 = vrcpps_avx(auVar176);
  fVar258 = auVar178._0_4_;
  auVar172._0_4_ = fVar258 * auVar176._0_4_;
  fVar263 = auVar178._4_4_;
  auVar172._4_4_ = fVar263 * auVar176._4_4_;
  fVar265 = auVar178._8_4_;
  auVar172._8_4_ = fVar265 * auVar176._8_4_;
  fVar267 = auVar178._12_4_;
  auVar172._12_4_ = fVar267 * auVar176._12_4_;
  auVar252._8_4_ = 0x3f800000;
  auVar252._0_8_ = 0x3f8000003f800000;
  auVar252._12_4_ = 0x3f800000;
  auVar176 = vsubps_avx(auVar252,auVar172);
  fVar258 = fVar258 + fVar258 * auVar176._0_4_;
  fVar263 = fVar263 + fVar263 * auVar176._4_4_;
  fVar265 = fVar265 + fVar265 * auVar176._8_4_;
  fVar267 = fVar267 + fVar267 * auVar176._12_4_;
  auVar176 = vrcpps_avx(auVar177);
  fVar212 = auVar176._0_4_;
  auVar173._0_4_ = fVar212 * auVar177._0_4_;
  fVar222 = auVar176._4_4_;
  auVar173._4_4_ = fVar222 * auVar177._4_4_;
  fVar225 = auVar176._8_4_;
  auVar173._8_4_ = fVar225 * auVar177._8_4_;
  fVar228 = auVar176._12_4_;
  auVar173._12_4_ = fVar228 * auVar177._12_4_;
  auVar176 = vsubps_avx(auVar252,auVar173);
  fVar212 = fVar212 + fVar212 * auVar176._0_4_;
  fVar222 = fVar222 + fVar222 * auVar176._4_4_;
  fVar225 = fVar225 + fVar225 * auVar176._8_4_;
  fVar228 = fVar228 + fVar228 * auVar176._12_4_;
  auVar176 = vrcpps_avx(auVar161);
  fVar171 = auVar176._0_4_;
  auVar174._0_4_ = fVar171 * auVar161._0_4_;
  fVar186 = auVar176._4_4_;
  auVar174._4_4_ = fVar186 * auVar161._4_4_;
  fVar187 = auVar176._8_4_;
  auVar174._8_4_ = fVar187 * auVar161._8_4_;
  fVar188 = auVar176._12_4_;
  auVar174._12_4_ = fVar188 * auVar161._12_4_;
  auVar161 = vsubps_avx(auVar252,auVar174);
  fVar171 = fVar171 + fVar171 * auVar161._0_4_;
  fVar186 = fVar186 + fVar186 * auVar161._4_4_;
  fVar187 = fVar187 + fVar187 * auVar161._8_4_;
  fVar188 = fVar188 + fVar188 * auVar161._12_4_;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + uVar106 * 7 + 6);
  auVar161 = vpmovsxwd_avx(auVar161);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar161 = vsubps_avx(auVar161,auVar233);
  auVar156._0_4_ = fVar258 * auVar161._0_4_;
  auVar156._4_4_ = fVar263 * auVar161._4_4_;
  auVar156._8_4_ = fVar265 * auVar161._8_4_;
  auVar156._12_4_ = fVar267 * auVar161._12_4_;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *(ulong *)(prim + uVar106 * 9 + 6);
  auVar161 = vpmovsxwd_avx(auVar176);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar161 = vsubps_avx(auVar161,auVar233);
  auVar196._0_4_ = fVar258 * auVar161._0_4_;
  auVar196._4_4_ = fVar263 * auVar161._4_4_;
  auVar196._8_4_ = fVar265 * auVar161._8_4_;
  auVar196._12_4_ = fVar267 * auVar161._12_4_;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = *(ulong *)(prim + uVar106 * 0xe + 6);
  auVar161 = vpmovsxwd_avx(auVar177);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar161 = vsubps_avx(auVar161,auVar110);
  auVar234._0_4_ = auVar161._0_4_ * fVar212;
  auVar234._4_4_ = auVar161._4_4_ * fVar222;
  auVar234._8_4_ = auVar161._8_4_ * fVar225;
  auVar234._12_4_ = auVar161._12_4_ * fVar228;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar161 = vpmovsxwd_avx(auVar178);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar161 = vsubps_avx(auVar161,auVar110);
  auVar111._0_4_ = fVar212 * auVar161._0_4_;
  auVar111._4_4_ = fVar222 * auVar161._4_4_;
  auVar111._8_4_ = fVar225 * auVar161._8_4_;
  auVar111._12_4_ = fVar228 * auVar161._12_4_;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *(ulong *)(prim + uVar106 * 0x15 + 6);
  auVar161 = vpmovsxwd_avx(auVar175);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar161 = vsubps_avx(auVar161,auVar139);
  auVar215._0_4_ = auVar161._0_4_ * fVar171;
  auVar215._4_4_ = auVar161._4_4_ * fVar186;
  auVar215._8_4_ = auVar161._8_4_ * fVar187;
  auVar215._12_4_ = auVar161._12_4_ * fVar188;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar106 * 0x17 + 6);
  auVar161 = vpmovsxwd_avx(auVar15);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar161 = vsubps_avx(auVar161,auVar139);
  auVar140._0_4_ = auVar161._0_4_ * fVar171;
  auVar140._4_4_ = auVar161._4_4_ * fVar186;
  auVar140._8_4_ = auVar161._8_4_ * fVar187;
  auVar140._12_4_ = auVar161._12_4_ * fVar188;
  auVar161 = vpminsd_avx(auVar156,auVar196);
  auVar176 = vpminsd_avx(auVar234,auVar111);
  auVar161 = vmaxps_avx(auVar161,auVar176);
  auVar176 = vpminsd_avx(auVar215,auVar140);
  uVar105 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar274._4_4_ = uVar105;
  auVar274._0_4_ = uVar105;
  auVar274._8_4_ = uVar105;
  auVar274._12_4_ = uVar105;
  auVar281 = ZEXT1664(auVar274);
  auVar176 = vmaxps_avx(auVar176,auVar274);
  auVar161 = vmaxps_avx(auVar161,auVar176);
  local_450._0_4_ = auVar161._0_4_ * 0.99999964;
  local_450._4_4_ = auVar161._4_4_ * 0.99999964;
  local_450._8_4_ = auVar161._8_4_ * 0.99999964;
  local_450._12_4_ = auVar161._12_4_ * 0.99999964;
  auVar161 = vpmaxsd_avx(auVar156,auVar196);
  auVar176 = vpmaxsd_avx(auVar234,auVar111);
  auVar161 = vminps_avx(auVar161,auVar176);
  auVar176 = vpmaxsd_avx(auVar215,auVar140);
  uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar157._4_4_ = uVar105;
  auVar157._0_4_ = uVar105;
  auVar157._8_4_ = uVar105;
  auVar157._12_4_ = uVar105;
  auVar176 = vminps_avx(auVar176,auVar157);
  auVar161 = vminps_avx(auVar161,auVar176);
  auVar112._0_4_ = auVar161._0_4_ * 1.0000004;
  auVar112._4_4_ = auVar161._4_4_ * 1.0000004;
  auVar112._8_4_ = auVar161._8_4_ * 1.0000004;
  auVar112._12_4_ = auVar161._12_4_ * 1.0000004;
  auVar161 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar176 = vpcmpgtd_avx(auVar161,_DAT_01f4ad30);
  auVar161 = vcmpps_avx(local_450,auVar112,2);
  auVar161 = vandps_avx(auVar161,auVar176);
  uVar105 = vmovmskps_avx(auVar161);
  local_630 = pre->ray_space + k;
  local_620 = mm_lookupmask_ps._16_8_;
  uStack_618 = mm_lookupmask_ps._24_8_;
  uStack_610 = mm_lookupmask_ps._16_8_;
  uStack_608 = mm_lookupmask_ps._24_8_;
  local_780 = (undefined1 (*) [32])&local_180;
  uVar103 = 1 << ((byte)k & 0x1f);
  local_788 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar103 & 0xf) << 4));
  local_790 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar103 >> 4) * 0x10);
  local_628 = CONCAT44((int)((ulong)ray >> 0x20),uVar105);
  local_778 = pre;
  while (local_628 != 0) {
    auVar278 = auVar291._0_32_;
    auVar275 = auVar281._0_32_;
    lVar104 = 0;
    if (local_628 != 0) {
      for (; (local_628 >> lVar104 & 1) == 0; lVar104 = lVar104 + 1) {
      }
    }
    uVar108 = local_628 - 1 & local_628;
    uVar103 = *(uint *)(prim + 2);
    uVar9 = *(uint *)(prim + lVar104 * 4 + 6);
    pGVar11 = (context->scene->geometries).items[uVar103].ptr;
    uVar106 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                              pGVar11[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i * (ulong)uVar9);
    p_Var12 = pGVar11[1].intersectionFilterN;
    lVar104 = *(long *)&pGVar11[1].time_range.upper;
    auVar161 = *(undefined1 (*) [16])(lVar104 + (long)p_Var12 * uVar106);
    auVar176 = *(undefined1 (*) [16])(lVar104 + (uVar106 + 1) * (long)p_Var12);
    _local_6d0 = *(undefined1 (*) [16])(lVar104 + (uVar106 + 2) * (long)p_Var12);
    lVar107 = 0;
    if (uVar108 != 0) {
      for (; (uVar108 >> lVar107 & 1) == 0; lVar107 = lVar107 + 1) {
      }
    }
    auVar177 = *(undefined1 (*) [16])(lVar104 + (uVar106 + 3) * (long)p_Var12);
    uVar106 = uVar108 - 1;
    if (((uVar108 != 0) && (uVar106 = uVar106 & uVar108, uVar106 != 0)) &&
       (lVar104 = 0, uVar106 != 0)) {
      for (; (uVar106 >> lVar104 & 1) == 0; lVar104 = lVar104 + 1) {
      }
    }
    auVar178 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    uVar10 = (uint)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar111 = vinsertps_avx(auVar178,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar15 = vsubps_avx(auVar161,auVar111);
    auVar178 = vshufps_avx(auVar15,auVar15,0);
    auVar175 = vshufps_avx(auVar15,auVar15,0x55);
    auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
    fVar258 = (local_630->vx).field_0.m128[0];
    fVar212 = (local_630->vx).field_0.m128[1];
    fVar171 = (local_630->vx).field_0.m128[2];
    fVar263 = (local_630->vx).field_0.m128[3];
    fVar222 = (local_630->vy).field_0.m128[0];
    fVar186 = (local_630->vy).field_0.m128[1];
    fVar265 = (local_630->vy).field_0.m128[2];
    fVar225 = (local_630->vy).field_0.m128[3];
    fVar187 = (local_630->vz).field_0.m128[0];
    fVar267 = (local_630->vz).field_0.m128[1];
    fVar228 = (local_630->vz).field_0.m128[2];
    fVar188 = (local_630->vz).field_0.m128[3];
    auVar141._0_4_ = auVar178._0_4_ * fVar258 + auVar175._0_4_ * fVar222 + fVar187 * auVar15._0_4_;
    auVar141._4_4_ = auVar178._4_4_ * fVar212 + auVar175._4_4_ * fVar186 + fVar267 * auVar15._4_4_;
    auVar141._8_4_ = auVar178._8_4_ * fVar171 + auVar175._8_4_ * fVar265 + fVar228 * auVar15._8_4_;
    auVar141._12_4_ =
         auVar178._12_4_ * fVar263 + auVar175._12_4_ * fVar225 + fVar188 * auVar15._12_4_;
    auVar178 = vblendps_avx(auVar141,auVar161,8);
    auVar112 = vsubps_avx(auVar176,auVar111);
    auVar175 = vshufps_avx(auVar112,auVar112,0);
    auVar15 = vshufps_avx(auVar112,auVar112,0x55);
    auVar112 = vshufps_avx(auVar112,auVar112,0xaa);
    auVar306._0_4_ = auVar175._0_4_ * fVar258 + auVar15._0_4_ * fVar222 + fVar187 * auVar112._0_4_;
    auVar306._4_4_ = auVar175._4_4_ * fVar212 + auVar15._4_4_ * fVar186 + fVar267 * auVar112._4_4_;
    auVar306._8_4_ = auVar175._8_4_ * fVar171 + auVar15._8_4_ * fVar265 + fVar228 * auVar112._8_4_;
    auVar306._12_4_ =
         auVar175._12_4_ * fVar263 + auVar15._12_4_ * fVar225 + fVar188 * auVar112._12_4_;
    auVar175 = vblendps_avx(auVar306,auVar176,8);
    auVar140 = vsubps_avx(_local_6d0,auVar111);
    auVar15 = vshufps_avx(auVar140,auVar140,0);
    auVar112 = vshufps_avx(auVar140,auVar140,0x55);
    auVar140 = vshufps_avx(auVar140,auVar140,0xaa);
    auVar216._0_4_ = auVar15._0_4_ * fVar258 + auVar112._0_4_ * fVar222 + fVar187 * auVar140._0_4_;
    auVar216._4_4_ = auVar15._4_4_ * fVar212 + auVar112._4_4_ * fVar186 + fVar267 * auVar140._4_4_;
    auVar216._8_4_ = auVar15._8_4_ * fVar171 + auVar112._8_4_ * fVar265 + fVar228 * auVar140._8_4_;
    auVar216._12_4_ =
         auVar15._12_4_ * fVar263 + auVar112._12_4_ * fVar225 + fVar188 * auVar140._12_4_;
    auVar140 = vshufps_avx(_local_6d0,_local_6d0,0xff);
    auVar15 = vblendps_avx(auVar216,_local_6d0,8);
    auVar110 = vsubps_avx(auVar177,auVar111);
    auVar111 = vshufps_avx(auVar110,auVar110,0);
    auVar112 = vshufps_avx(auVar110,auVar110,0x55);
    auVar110 = vshufps_avx(auVar110,auVar110,0xaa);
    auVar261._0_4_ = auVar111._0_4_ * fVar258 + auVar112._0_4_ * fVar222 + fVar187 * auVar110._0_4_;
    auVar261._4_4_ = auVar111._4_4_ * fVar212 + auVar112._4_4_ * fVar186 + fVar267 * auVar110._4_4_;
    auVar261._8_4_ = auVar111._8_4_ * fVar171 + auVar112._8_4_ * fVar265 + fVar228 * auVar110._8_4_;
    auVar261._12_4_ =
         auVar111._12_4_ * fVar263 + auVar112._12_4_ * fVar225 + fVar188 * auVar110._12_4_;
    auVar110 = vshufps_avx(auVar177,auVar177,0xff);
    auVar111 = vblendps_avx(auVar261,auVar177,8);
    auVar197._8_4_ = 0x7fffffff;
    auVar197._0_8_ = 0x7fffffff7fffffff;
    auVar197._12_4_ = 0x7fffffff;
    auVar178 = vandps_avx(auVar178,auVar197);
    auVar175 = vandps_avx(auVar175,auVar197);
    auVar112 = vmaxps_avx(auVar178,auVar175);
    auVar178 = vandps_avx(auVar15,auVar197);
    auVar175 = vandps_avx(auVar111,auVar197);
    auVar178 = vmaxps_avx(auVar178,auVar175);
    auVar178 = vmaxps_avx(auVar112,auVar178);
    auVar175 = vmovshdup_avx(auVar178);
    auVar175 = vmaxss_avx(auVar175,auVar178);
    auVar178 = vshufpd_avx(auVar178,auVar178,1);
    auVar178 = vmaxss_avx(auVar178,auVar175);
    lVar104 = (long)(int)uVar10 * 0x44;
    fVar258 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar104 + 0x908);
    fVar212 = *(float *)(catmullrom_basis0 + lVar104 + 0x90c);
    fVar171 = *(float *)(catmullrom_basis0 + lVar104 + 0x910);
    fVar263 = *(float *)(catmullrom_basis0 + lVar104 + 0x914);
    fVar222 = *(float *)(catmullrom_basis0 + lVar104 + 0x918);
    fVar186 = *(float *)(catmullrom_basis0 + lVar104 + 0x91c);
    fVar265 = *(float *)(catmullrom_basis0 + lVar104 + 0x920);
    auVar98 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar104 + 0x908);
    auVar175 = vshufps_avx(auVar216,auVar216,0);
    register0x00001390 = auVar175;
    _local_560 = auVar175;
    auVar15 = vshufps_avx(auVar216,auVar216,0x55);
    register0x00001450 = auVar140;
    _local_280 = auVar140;
    fVar259 = *(float *)(catmullrom_basis0 + lVar104 + 0xd8c);
    fVar189 = *(float *)(catmullrom_basis0 + lVar104 + 0xd90);
    fVar255 = *(float *)(catmullrom_basis0 + lVar104 + 0xd94);
    fVar264 = *(float *)(catmullrom_basis0 + lVar104 + 0xd98);
    fVar266 = *(float *)(catmullrom_basis0 + lVar104 + 0xd9c);
    fVar190 = *(float *)(catmullrom_basis0 + lVar104 + 0xda0);
    fVar256 = *(float *)(catmullrom_basis0 + lVar104 + 0xda4);
    auVar111 = vshufps_avx(auVar261,auVar261,0);
    register0x000015d0 = auVar111;
    _local_580 = auVar111;
    auVar112 = vshufps_avx(auVar261,auVar261,0x55);
    register0x000013d0 = auVar110;
    _local_80 = auVar110;
    fVar316 = auVar111._0_4_;
    fVar321 = auVar111._4_4_;
    fVar322 = auVar111._8_4_;
    fVar323 = auVar111._12_4_;
    fVar137 = auVar112._0_4_;
    fVar152 = auVar112._4_4_;
    fVar153 = auVar112._8_4_;
    fVar154 = auVar112._12_4_;
    fVar231 = auVar175._0_4_;
    fVar249 = auVar175._4_4_;
    fVar243 = auVar175._8_4_;
    fVar245 = auVar175._12_4_;
    fVar213 = auVar15._0_4_;
    fVar223 = auVar15._4_4_;
    fVar226 = auVar15._8_4_;
    fVar229 = auVar15._12_4_;
    fVar194 = auVar110._0_4_;
    fVar206 = auVar110._4_4_;
    fVar208 = auVar110._8_4_;
    fVar210 = auVar110._12_4_;
    fVar272 = auVar140._0_4_;
    fVar282 = auVar140._4_4_;
    fVar284 = auVar140._8_4_;
    auVar175 = vshufps_avx(auVar306,auVar306,0);
    fVar225 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar104 + 0x484);
    fVar187 = *(float *)(catmullrom_basis0 + lVar104 + 0x488);
    fVar267 = *(float *)(catmullrom_basis0 + lVar104 + 0x48c);
    fVar228 = *(float *)(catmullrom_basis0 + lVar104 + 0x490);
    fVar188 = *(float *)(catmullrom_basis0 + lVar104 + 0x494);
    fVar297 = *(float *)(catmullrom_basis0 + lVar104 + 0x498);
    fVar296 = *(float *)(catmullrom_basis0 + lVar104 + 0x49c);
    auVar99 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar104 + 0x484);
    fVar287 = auVar175._0_4_;
    fVar292 = auVar175._4_4_;
    fVar293 = auVar175._8_4_;
    fVar294 = auVar175._12_4_;
    auVar175 = vshufps_avx(auVar306,auVar306,0x55);
    auVar199._16_16_ = auVar175;
    auVar199._0_16_ = auVar175;
    fVar193 = auVar175._0_4_;
    fVar205 = auVar175._4_4_;
    fVar207 = auVar175._8_4_;
    fVar209 = auVar175._12_4_;
    auVar175 = vshufps_avx(auVar176,auVar176,0xff);
    register0x00001590 = auVar175;
    _local_a0 = auVar175;
    fVar309 = auVar175._0_4_;
    fVar311 = auVar175._4_4_;
    fVar313 = auVar175._8_4_;
    fVar314 = auVar175._12_4_;
    fVar310 = *(float *)(catmullrom_basis0 + lVar104 + 0x924) + 0.0 + 0.0;
    auVar175 = vshufps_avx(auVar141,auVar141,0);
    register0x00001350 = auVar175;
    _local_2a0 = auVar175;
    local_4c0 = *(float *)(catmullrom_basis0 + lVar104);
    fStack_4bc = *(float *)(catmullrom_basis0 + lVar104 + 4);
    fStack_4b8 = *(float *)(catmullrom_basis0 + lVar104 + 8);
    fStack_4b4 = *(float *)(catmullrom_basis0 + lVar104 + 0xc);
    fStack_4b0 = *(float *)(catmullrom_basis0 + lVar104 + 0x10);
    fStack_4ac = *(float *)(catmullrom_basis0 + lVar104 + 0x14);
    fStack_4a8 = *(float *)(catmullrom_basis0 + lVar104 + 0x18);
    fStack_4a4 = *(float *)(catmullrom_basis0 + lVar104 + 0x1c);
    fVar214 = auVar175._0_4_;
    fVar224 = auVar175._4_4_;
    fVar227 = auVar175._8_4_;
    fVar230 = auVar175._12_4_;
    auVar299._0_4_ = fVar214 * local_4c0 + fVar287 * fVar225 + fVar231 * fVar258 + fVar316 * fVar259
    ;
    auVar299._4_4_ =
         fVar224 * fStack_4bc + fVar292 * fVar187 + fVar249 * fVar212 + fVar321 * fVar189;
    auVar299._8_4_ =
         fVar227 * fStack_4b8 + fVar293 * fVar267 + fVar243 * fVar171 + fVar322 * fVar255;
    auVar299._12_4_ =
         fVar230 * fStack_4b4 + fVar294 * fVar228 + fVar245 * fVar263 + fVar323 * fVar264;
    auVar300._16_4_ =
         fVar214 * fStack_4b0 + fVar287 * fVar188 + fVar231 * fVar222 + fVar316 * fVar266;
    auVar300._0_16_ = auVar299;
    auVar300._20_4_ =
         fVar224 * fStack_4ac + fVar292 * fVar297 + fVar249 * fVar186 + fVar321 * fVar190;
    auVar300._24_4_ =
         fVar227 * fStack_4a8 + fVar293 * fVar296 + fVar243 * fVar265 + fVar322 * fVar256;
    auVar300._28_4_ = fVar245 + 0.0;
    auVar175 = vshufps_avx(auVar141,auVar141,0x55);
    register0x00001290 = auVar175;
    _local_4a0 = auVar175;
    fVar135 = auVar175._0_4_;
    fVar211 = auVar175._4_4_;
    fVar169 = auVar175._8_4_;
    fVar170 = auVar175._12_4_;
    auVar295._0_4_ = fVar135 * local_4c0 + fVar193 * fVar225 + fVar213 * fVar258 + fVar137 * fVar259
    ;
    auVar295._4_4_ =
         fVar211 * fStack_4bc + fVar205 * fVar187 + fVar223 * fVar212 + fVar152 * fVar189;
    auVar295._8_4_ =
         fVar169 * fStack_4b8 + fVar207 * fVar267 + fVar226 * fVar171 + fVar153 * fVar255;
    auVar295._12_4_ =
         fVar170 * fStack_4b4 + fVar209 * fVar228 + fVar229 * fVar263 + fVar154 * fVar264;
    auVar295._16_4_ =
         fVar135 * fStack_4b0 + fVar193 * fVar188 + fVar213 * fVar222 + fVar137 * fVar266;
    auVar295._20_4_ =
         fVar211 * fStack_4ac + fVar205 * fVar297 + fVar223 * fVar186 + fVar152 * fVar190;
    auVar295._24_4_ =
         fVar169 * fStack_4a8 + fVar207 * fVar296 + fVar226 * fVar265 + fVar153 * fVar256;
    auVar295._28_4_ = fVar154 + 0.0 + 0.0 + 0.0;
    auVar175 = vpermilps_avx(auVar161,0xff);
    register0x00001450 = auVar175;
    _local_c0 = auVar175;
    fVar273 = auVar175._0_4_;
    fVar283 = auVar175._4_4_;
    fVar285 = auVar175._8_4_;
    local_7c0._0_4_ =
         fVar309 * fVar225 + fVar272 * fVar258 + fVar194 * fVar259 + fVar273 * local_4c0;
    local_7c0._4_4_ =
         fVar311 * fVar187 + fVar282 * fVar212 + fVar206 * fVar189 + fVar283 * fStack_4bc;
    local_7c0._8_4_ =
         fVar313 * fVar267 + fVar284 * fVar171 + fVar208 * fVar255 + fVar285 * fStack_4b8;
    local_7c0._12_4_ =
         fVar314 * fVar228 + auVar140._12_4_ * fVar263 + fVar210 * fVar264 +
         auVar175._12_4_ * fStack_4b4;
    local_7c0._16_4_ =
         fVar309 * fVar188 + fVar272 * fVar222 + fVar194 * fVar266 + fVar273 * fStack_4b0;
    local_7c0._20_4_ =
         fVar311 * fVar297 + fVar282 * fVar186 + fVar206 * fVar190 + fVar283 * fStack_4ac;
    local_7c0._24_4_ =
         fVar313 * fVar296 + fVar284 * fVar265 + fVar208 * fVar256 + fVar285 * fStack_4a8;
    local_7c0._28_4_ = fVar310 + 0.0;
    fVar268 = *(float *)(catmullrom_basis1 + lVar104 + 0x908);
    fVar269 = *(float *)(catmullrom_basis1 + lVar104 + 0x90c);
    fVar191 = *(float *)(catmullrom_basis1 + lVar104 + 0x910);
    fVar257 = *(float *)(catmullrom_basis1 + lVar104 + 0x914);
    fVar270 = *(float *)(catmullrom_basis1 + lVar104 + 0x918);
    fVar271 = *(float *)(catmullrom_basis1 + lVar104 + 0x91c);
    fVar192 = *(float *)(catmullrom_basis1 + lVar104 + 0x920);
    fVar155 = *(float *)(catmullrom_basis1 + lVar104 + 0xd8c);
    fVar286 = *(float *)(catmullrom_basis1 + lVar104 + 0xd90);
    fVar124 = *(float *)(catmullrom_basis1 + lVar104 + 0xd94);
    fVar126 = *(float *)(catmullrom_basis1 + lVar104 + 0xd98);
    fVar128 = *(float *)(catmullrom_basis1 + lVar104 + 0xd9c);
    fVar130 = *(float *)(catmullrom_basis1 + lVar104 + 0xda0);
    fVar132 = *(float *)(catmullrom_basis1 + lVar104 + 0xda4);
    fVar136 = *(float *)(catmullrom_basis1 + lVar104 + 0x484);
    fVar232 = *(float *)(catmullrom_basis1 + lVar104 + 0x488);
    fVar241 = *(float *)(catmullrom_basis1 + lVar104 + 0x48c);
    fVar244 = *(float *)(catmullrom_basis1 + lVar104 + 0x490);
    fVar246 = *(float *)(catmullrom_basis1 + lVar104 + 0x494);
    fVar247 = *(float *)(catmullrom_basis1 + lVar104 + 0x498);
    fVar248 = *(float *)(catmullrom_basis1 + lVar104 + 0x49c);
    fVar109 = *(float *)(catmullrom_basis1 + lVar104);
    fVar125 = *(float *)(catmullrom_basis1 + lVar104 + 4);
    fVar127 = *(float *)(catmullrom_basis1 + lVar104 + 8);
    fVar129 = *(float *)(catmullrom_basis1 + lVar104 + 0xc);
    fVar131 = *(float *)(catmullrom_basis1 + lVar104 + 0x10);
    fVar133 = *(float *)(catmullrom_basis1 + lVar104 + 0x14);
    fVar134 = *(float *)(catmullrom_basis1 + lVar104 + 0x18);
    auVar200._0_4_ = fVar214 * fVar109 + fVar287 * fVar136 + fVar268 * fVar231 + fVar316 * fVar155;
    auVar200._4_4_ = fVar224 * fVar125 + fVar292 * fVar232 + fVar269 * fVar249 + fVar321 * fVar286;
    auVar200._8_4_ = fVar227 * fVar127 + fVar293 * fVar241 + fVar191 * fVar243 + fVar322 * fVar124;
    auVar200._12_4_ = fVar230 * fVar129 + fVar294 * fVar244 + fVar257 * fVar245 + fVar323 * fVar126;
    auVar200._16_4_ = fVar214 * fVar131 + fVar287 * fVar246 + fVar270 * fVar231 + fVar316 * fVar128;
    auVar200._20_4_ = fVar224 * fVar133 + fVar292 * fVar247 + fVar271 * fVar249 + fVar321 * fVar130;
    auVar200._24_4_ = fVar227 * fVar134 + fVar293 * fVar248 + fVar192 * fVar243 + fVar322 * fVar132;
    auVar200._28_4_ = fVar314 + fVar310 + fVar245 + 0.0;
    auVar179._0_4_ = fVar135 * fVar109 + fVar193 * fVar136 + fVar268 * fVar213 + fVar155 * fVar137;
    auVar179._4_4_ = fVar211 * fVar125 + fVar205 * fVar232 + fVar269 * fVar223 + fVar286 * fVar152;
    auVar179._8_4_ = fVar169 * fVar127 + fVar207 * fVar241 + fVar191 * fVar226 + fVar124 * fVar153;
    auVar179._12_4_ = fVar170 * fVar129 + fVar209 * fVar244 + fVar257 * fVar229 + fVar126 * fVar154;
    auVar179._16_4_ = fVar135 * fVar131 + fVar193 * fVar246 + fVar270 * fVar213 + fVar128 * fVar137;
    auVar179._20_4_ = fVar211 * fVar133 + fVar205 * fVar247 + fVar271 * fVar223 + fVar130 * fVar152;
    auVar179._24_4_ = fVar169 * fVar134 + fVar207 * fVar248 + fVar192 * fVar226 + fVar132 * fVar153;
    auVar179._28_4_ = fVar170 + fVar310 + fVar245 + 0.0;
    auVar317._0_4_ = fVar309 * fVar136 + fVar268 * fVar272 + fVar194 * fVar155 + fVar273 * fVar109;
    auVar317._4_4_ = fVar311 * fVar232 + fVar269 * fVar282 + fVar206 * fVar286 + fVar283 * fVar125;
    auVar317._8_4_ = fVar313 * fVar241 + fVar191 * fVar284 + fVar208 * fVar124 + fVar285 * fVar127;
    auVar317._12_4_ =
         fVar314 * fVar244 + fVar257 * auVar140._12_4_ + fVar210 * fVar126 +
         auVar175._12_4_ * fVar129;
    auVar317._16_4_ = fVar309 * fVar246 + fVar270 * fVar272 + fVar194 * fVar128 + fVar273 * fVar131;
    auVar317._20_4_ = fVar311 * fVar247 + fVar271 * fVar282 + fVar206 * fVar130 + fVar283 * fVar133;
    auVar317._24_4_ = fVar313 * fVar248 + fVar192 * fVar284 + fVar208 * fVar132 + fVar285 * fVar134;
    auVar317._28_4_ = fVar310 + fVar210 + fVar245 + fVar170;
    auVar16 = vsubps_avx(auVar200,auVar300);
    auVar17 = vsubps_avx(auVar179,auVar295);
    _auStack_5d0 = auVar17._16_16_;
    fVar258 = auVar16._0_4_;
    fVar171 = auVar16._4_4_;
    auVar149._4_4_ = auVar295._4_4_ * fVar171;
    auVar149._0_4_ = auVar295._0_4_ * fVar258;
    fVar222 = auVar16._8_4_;
    auVar149._8_4_ = auVar295._8_4_ * fVar222;
    fVar265 = auVar16._12_4_;
    auVar149._12_4_ = auVar295._12_4_ * fVar265;
    fVar187 = auVar16._16_4_;
    auVar149._16_4_ = auVar295._16_4_ * fVar187;
    fVar228 = auVar16._20_4_;
    auVar149._20_4_ = auVar295._20_4_ * fVar228;
    fVar297 = auVar16._24_4_;
    auVar149._24_4_ = auVar295._24_4_ * fVar297;
    auVar149._28_4_ = fVar170;
    fVar212 = auVar17._0_4_;
    fVar263 = auVar17._4_4_;
    auVar18._4_4_ = auVar299._4_4_ * fVar263;
    auVar18._0_4_ = auVar299._0_4_ * fVar212;
    fVar186 = auVar17._8_4_;
    auVar18._8_4_ = auVar299._8_4_ * fVar186;
    fVar225 = auVar17._12_4_;
    auVar18._12_4_ = auVar299._12_4_ * fVar225;
    fVar267 = auVar17._16_4_;
    auVar18._16_4_ = auVar300._16_4_ * fVar267;
    fVar188 = auVar17._20_4_;
    auVar18._20_4_ = auVar300._20_4_ * fVar188;
    fVar296 = auVar17._24_4_;
    auVar18._24_4_ = auVar300._24_4_ * fVar296;
    auVar18._28_4_ = auVar179._28_4_;
    auVar18 = vsubps_avx(auVar149,auVar18);
    auVar149 = vmaxps_avx(local_7c0._0_32_,auVar317);
    auVar24._4_4_ = auVar149._4_4_ * auVar149._4_4_ * (fVar171 * fVar171 + fVar263 * fVar263);
    auVar24._0_4_ = auVar149._0_4_ * auVar149._0_4_ * (fVar258 * fVar258 + fVar212 * fVar212);
    auVar24._8_4_ = auVar149._8_4_ * auVar149._8_4_ * (fVar222 * fVar222 + fVar186 * fVar186);
    auVar24._12_4_ = auVar149._12_4_ * auVar149._12_4_ * (fVar265 * fVar265 + fVar225 * fVar225);
    auVar24._16_4_ = auVar149._16_4_ * auVar149._16_4_ * (fVar187 * fVar187 + fVar267 * fVar267);
    auVar24._20_4_ = auVar149._20_4_ * auVar149._20_4_ * (fVar228 * fVar228 + fVar188 * fVar188);
    auVar24._24_4_ = auVar149._24_4_ * auVar149._24_4_ * (fVar297 * fVar297 + fVar296 * fVar296);
    auVar24._28_4_ = auVar16._28_4_ + auVar179._28_4_;
    auVar13._4_4_ = auVar18._4_4_ * auVar18._4_4_;
    auVar13._0_4_ = auVar18._0_4_ * auVar18._0_4_;
    auVar13._8_4_ = auVar18._8_4_ * auVar18._8_4_;
    auVar13._12_4_ = auVar18._12_4_ * auVar18._12_4_;
    auVar13._16_4_ = auVar18._16_4_ * auVar18._16_4_;
    auVar13._20_4_ = auVar18._20_4_ * auVar18._20_4_;
    auVar13._24_4_ = auVar18._24_4_ * auVar18._24_4_;
    auVar13._28_4_ = auVar18._28_4_;
    auVar198._0_4_ = (float)(int)uVar10;
    auVar198._4_12_ = auVar299._4_12_;
    auVar149 = vcmpps_avx(auVar13,auVar24,2);
    local_5a0._0_16_ = auVar198;
    auVar175 = vshufps_avx(auVar198,auVar198,0);
    auVar180._16_16_ = auVar175;
    auVar180._0_16_ = auVar175;
    auVar18 = vcmpps_avx(_DAT_01f7b060,auVar180,1);
    auVar185 = ZEXT3264(auVar18);
    auVar175 = vpermilps_avx(auVar141,0xaa);
    register0x00001450 = auVar175;
    _local_2c0 = auVar175;
    auVar15 = vpermilps_avx(auVar306,0xaa);
    register0x00001550 = auVar15;
    _local_480 = auVar15;
    auVar111 = vpermilps_avx(auVar216,0xaa);
    register0x00001590 = auVar111;
    _local_e0 = auVar111;
    auVar112 = vpermilps_avx(auVar261,0xaa);
    register0x00001310 = auVar112;
    _local_5c0 = auVar112;
    auVar24 = auVar18 & auVar149;
    uVar7 = *(uint *)(ray + k * 4 + 0x60);
    _local_720 = ZEXT416(uVar9);
    auVar178 = ZEXT416((uint)(auVar178._0_4_ * 4.7683716e-07));
    local_960 = auVar161._0_4_;
    fStack_958 = auVar161._8_4_;
    fStack_954 = auVar161._12_4_;
    fStack_95c = auVar161._4_4_;
    local_930 = auVar176._0_4_;
    fStack_928 = auVar176._8_4_;
    fStack_924 = auVar176._12_4_;
    fStack_92c = auVar176._4_4_;
    fStack_8bc = auVar177._4_4_;
    fStack_8b8 = auVar177._8_4_;
    fStack_8b4 = auVar177._12_4_;
    local_8c0 = auVar177._0_4_;
    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar24 >> 0x7f,0) == '\0') &&
          (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar24 >> 0xbf,0) == '\0') &&
        (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar24[0x1f]) {
      uVar106 = 0;
      auVar281 = ZEXT3264(auVar275);
      auVar291 = ZEXT3264(auVar278);
    }
    else {
      local_4e0 = vandps_avx(auVar149,auVar18);
      fVar272 = auVar175._0_4_;
      fVar273 = auVar175._4_4_;
      fVar282 = auVar175._8_4_;
      fVar283 = auVar175._12_4_;
      fVar284 = auVar15._0_4_;
      fVar285 = auVar15._4_4_;
      fVar310 = auVar15._8_4_;
      fVar309 = auVar15._12_4_;
      fVar311 = auVar111._0_4_;
      fVar313 = auVar111._4_4_;
      fVar314 = auVar111._8_4_;
      fVar315 = auVar111._12_4_;
      fVar194 = auVar112._0_4_;
      fVar206 = auVar112._4_4_;
      fVar208 = auVar112._8_4_;
      fVar210 = auVar112._12_4_;
      fVar258 = auVar18._28_4_ + *(float *)(catmullrom_basis1 + lVar104 + 0x924) + 0.0;
      local_500._0_4_ =
           fVar272 * fVar109 + fVar284 * fVar136 + fVar311 * fVar268 + fVar194 * fVar155;
      local_500._4_4_ =
           fVar273 * fVar125 + fVar285 * fVar232 + fVar313 * fVar269 + fVar206 * fVar286;
      fStack_4f8 = fVar282 * fVar127 + fVar310 * fVar241 + fVar314 * fVar191 + fVar208 * fVar124;
      fStack_4f4 = fVar283 * fVar129 + fVar309 * fVar244 + fVar315 * fVar257 + fVar210 * fVar126;
      fStack_4f0 = fVar272 * fVar131 + fVar284 * fVar246 + fVar311 * fVar270 + fVar194 * fVar128;
      fStack_4ec = fVar273 * fVar133 + fVar285 * fVar247 + fVar313 * fVar271 + fVar206 * fVar130;
      fStack_4e8 = fVar282 * fVar134 + fVar310 * fVar248 + fVar314 * fVar192 + fVar208 * fVar132;
      fStack_4e4 = local_4e0._28_4_ + fVar258;
      local_600._0_4_ = auVar99._0_4_;
      local_600._4_4_ = auVar99._4_4_;
      fStack_5f8 = auVar99._8_4_;
      fStack_5f4 = auVar99._12_4_;
      fStack_5f0 = auVar99._16_4_;
      fStack_5ec = auVar99._20_4_;
      fStack_5e8 = auVar99._24_4_;
      local_740._0_4_ = auVar98._0_4_;
      local_740._4_4_ = auVar98._4_4_;
      fStack_738 = auVar98._8_4_;
      fStack_734 = auVar98._12_4_;
      fStack_730 = auVar98._16_4_;
      fStack_72c = auVar98._20_4_;
      fStack_728 = auVar98._24_4_;
      local_6a0 = fVar272 * local_4c0 +
                  fVar284 * (float)local_600._0_4_ +
                  fVar311 * (float)local_740._0_4_ + fVar194 * fVar259;
      fStack_69c = fVar273 * fStack_4bc +
                   fVar285 * (float)local_600._4_4_ +
                   fVar313 * (float)local_740._4_4_ + fVar206 * fVar189;
      fStack_698 = fVar282 * fStack_4b8 +
                   fVar310 * fStack_5f8 + fVar314 * fStack_738 + fVar208 * fVar255;
      fStack_694 = fVar283 * fStack_4b4 +
                   fVar309 * fStack_5f4 + fVar315 * fStack_734 + fVar210 * fVar264;
      fStack_690 = fVar272 * fStack_4b0 +
                   fVar284 * fStack_5f0 + fVar311 * fStack_730 + fVar194 * fVar266;
      fStack_68c = fVar273 * fStack_4ac +
                   fVar285 * fStack_5ec + fVar313 * fStack_72c + fVar206 * fVar190;
      fStack_688 = fVar282 * fStack_4a8 +
                   fVar310 * fStack_5e8 + fVar314 * fStack_728 + fVar208 * fVar256;
      fStack_684 = fStack_4e4 + fVar258 + local_4e0._28_4_ + auVar18._28_4_;
      fVar258 = *(float *)(catmullrom_basis0 + lVar104 + 0x1210);
      fVar212 = *(float *)(catmullrom_basis0 + lVar104 + 0x1214);
      fVar171 = *(float *)(catmullrom_basis0 + lVar104 + 0x1218);
      fVar263 = *(float *)(catmullrom_basis0 + lVar104 + 0x121c);
      fVar222 = *(float *)(catmullrom_basis0 + lVar104 + 0x1220);
      fVar186 = *(float *)(catmullrom_basis0 + lVar104 + 0x1224);
      fVar265 = *(float *)(catmullrom_basis0 + lVar104 + 0x1228);
      fVar225 = *(float *)(catmullrom_basis0 + lVar104 + 0x1694);
      fVar187 = *(float *)(catmullrom_basis0 + lVar104 + 0x1698);
      fVar267 = *(float *)(catmullrom_basis0 + lVar104 + 0x169c);
      fVar228 = *(float *)(catmullrom_basis0 + lVar104 + 0x16a0);
      fVar188 = *(float *)(catmullrom_basis0 + lVar104 + 0x16a4);
      fVar297 = *(float *)(catmullrom_basis0 + lVar104 + 0x16a8);
      fVar296 = *(float *)(catmullrom_basis0 + lVar104 + 0x16ac);
      fVar259 = *(float *)(catmullrom_basis0 + lVar104 + 0x1b18);
      fVar189 = *(float *)(catmullrom_basis0 + lVar104 + 0x1b1c);
      fVar255 = *(float *)(catmullrom_basis0 + lVar104 + 0x1b20);
      fVar264 = *(float *)(catmullrom_basis0 + lVar104 + 0x1b24);
      fVar266 = *(float *)(catmullrom_basis0 + lVar104 + 0x1b28);
      fVar190 = *(float *)(catmullrom_basis0 + lVar104 + 0x1b2c);
      fVar256 = *(float *)(catmullrom_basis0 + lVar104 + 0x1b30);
      fVar268 = *(float *)(catmullrom_basis0 + lVar104 + 0x1f9c);
      fVar269 = *(float *)(catmullrom_basis0 + lVar104 + 0x1fa0);
      fVar191 = *(float *)(catmullrom_basis0 + lVar104 + 0x1fa4);
      fVar257 = *(float *)(catmullrom_basis0 + lVar104 + 0x1fa8);
      fVar270 = *(float *)(catmullrom_basis0 + lVar104 + 0x1fac);
      fVar271 = *(float *)(catmullrom_basis0 + lVar104 + 0x1fb0);
      fVar192 = *(float *)(catmullrom_basis0 + lVar104 + 0x1fb4);
      fVar155 = *(float *)(catmullrom_basis0 + lVar104 + 0x1b34) +
                *(float *)(catmullrom_basis0 + lVar104 + 0x1fb8);
      fVar286 = *(float *)(catmullrom_basis0 + lVar104 + 0x16b0) + fVar155;
      local_600._4_4_ =
           fVar224 * fVar212 + fVar292 * fVar187 + fVar249 * fVar189 + fVar321 * fVar269;
      local_600._0_4_ =
           fVar214 * fVar258 + fVar287 * fVar225 + fVar231 * fVar259 + fVar316 * fVar268;
      fStack_5f8 = fVar227 * fVar171 + fVar293 * fVar267 + fVar243 * fVar255 + fVar322 * fVar191;
      fStack_5f4 = fVar230 * fVar263 + fVar294 * fVar228 + fVar245 * fVar264 + fVar323 * fVar257;
      fStack_5f0 = fVar214 * fVar222 + fVar287 * fVar188 + fVar231 * fVar266 + fVar316 * fVar270;
      fStack_5ec = fVar224 * fVar186 + fVar292 * fVar297 + fVar249 * fVar190 + fVar321 * fVar271;
      fStack_5e8 = fVar227 * fVar265 + fVar293 * fVar296 + fVar243 * fVar256 + fVar322 * fVar192;
      fStack_5e4 = *(float *)(catmullrom_basis0 + lVar104 + 0x16b0) +
                   *(float *)(catmullrom_basis0 + lVar104 + 0x1fb8) +
                   fVar283 + *(float *)(catmullrom_basis1 + lVar104 + 0x4a0);
      auVar144._0_4_ = fVar135 * fVar258 + fVar213 * fVar259 + fVar137 * fVar268 + fVar193 * fVar225
      ;
      auVar144._4_4_ = fVar211 * fVar212 + fVar223 * fVar189 + fVar152 * fVar269 + fVar205 * fVar187
      ;
      auVar144._8_4_ = fVar169 * fVar171 + fVar226 * fVar255 + fVar153 * fVar191 + fVar207 * fVar267
      ;
      auVar144._12_4_ =
           fVar170 * fVar263 + fVar229 * fVar264 + fVar154 * fVar257 + fVar209 * fVar228;
      auVar144._16_4_ =
           fVar135 * fVar222 + fVar213 * fVar266 + fVar137 * fVar270 + fVar193 * fVar188;
      auVar144._20_4_ =
           fVar211 * fVar186 + fVar223 * fVar190 + fVar152 * fVar271 + fVar205 * fVar297;
      auVar144._24_4_ =
           fVar169 * fVar265 + fVar226 * fVar256 + fVar153 * fVar192 + fVar207 * fVar296;
      auVar144._28_4_ =
           fVar155 + fVar283 + *(float *)(catmullrom_basis1 + lVar104 + 0x1c) +
                     fVar283 + *(float *)(catmullrom_basis1 + lVar104 + 0x4a0);
      auVar236._0_4_ = fVar284 * fVar225 + fVar311 * fVar259 + fVar194 * fVar268 + fVar272 * fVar258
      ;
      auVar236._4_4_ = fVar285 * fVar187 + fVar313 * fVar189 + fVar206 * fVar269 + fVar273 * fVar212
      ;
      auVar236._8_4_ = fVar310 * fVar267 + fVar314 * fVar255 + fVar208 * fVar191 + fVar282 * fVar171
      ;
      auVar236._12_4_ =
           fVar309 * fVar228 + fVar315 * fVar264 + fVar210 * fVar257 + fVar283 * fVar263;
      auVar236._16_4_ =
           fVar284 * fVar188 + fVar311 * fVar266 + fVar194 * fVar270 + fVar272 * fVar222;
      auVar236._20_4_ =
           fVar285 * fVar297 + fVar313 * fVar190 + fVar206 * fVar271 + fVar273 * fVar186;
      auVar236._24_4_ =
           fVar310 * fVar296 + fVar314 * fVar256 + fVar208 * fVar192 + fVar282 * fVar265;
      auVar236._28_4_ = fVar286 + *(float *)(catmullrom_basis0 + lVar104 + 0x122c);
      fVar258 = *(float *)(catmullrom_basis1 + lVar104 + 0x1b18);
      fVar212 = *(float *)(catmullrom_basis1 + lVar104 + 0x1b1c);
      fVar171 = *(float *)(catmullrom_basis1 + lVar104 + 0x1b20);
      fVar263 = *(float *)(catmullrom_basis1 + lVar104 + 0x1b24);
      fVar222 = *(float *)(catmullrom_basis1 + lVar104 + 0x1b28);
      fVar186 = *(float *)(catmullrom_basis1 + lVar104 + 0x1b2c);
      fVar265 = *(float *)(catmullrom_basis1 + lVar104 + 0x1b30);
      fVar225 = *(float *)(catmullrom_basis1 + lVar104 + 0x1f9c);
      fVar187 = *(float *)(catmullrom_basis1 + lVar104 + 0x1fa0);
      fVar267 = *(float *)(catmullrom_basis1 + lVar104 + 0x1fa4);
      fVar228 = *(float *)(catmullrom_basis1 + lVar104 + 0x1fa8);
      fVar188 = *(float *)(catmullrom_basis1 + lVar104 + 0x1fac);
      fVar297 = *(float *)(catmullrom_basis1 + lVar104 + 0x1fb0);
      fVar296 = *(float *)(catmullrom_basis1 + lVar104 + 0x1fb4);
      fVar259 = *(float *)(catmullrom_basis1 + lVar104 + 0x1694);
      fVar189 = *(float *)(catmullrom_basis1 + lVar104 + 0x1698);
      fVar255 = *(float *)(catmullrom_basis1 + lVar104 + 0x169c);
      fVar264 = *(float *)(catmullrom_basis1 + lVar104 + 0x16a0);
      fVar266 = *(float *)(catmullrom_basis1 + lVar104 + 0x16a4);
      fVar190 = *(float *)(catmullrom_basis1 + lVar104 + 0x16a8);
      fVar256 = *(float *)(catmullrom_basis1 + lVar104 + 0x16ac);
      fVar268 = *(float *)(catmullrom_basis1 + lVar104 + 0x1210);
      fVar269 = *(float *)(catmullrom_basis1 + lVar104 + 0x1214);
      fVar191 = *(float *)(catmullrom_basis1 + lVar104 + 0x1218);
      fVar257 = *(float *)(catmullrom_basis1 + lVar104 + 0x121c);
      fVar270 = *(float *)(catmullrom_basis1 + lVar104 + 0x1220);
      fVar271 = *(float *)(catmullrom_basis1 + lVar104 + 0x1224);
      fVar192 = *(float *)(catmullrom_basis1 + lVar104 + 0x1228);
      auVar253._0_4_ = fVar214 * fVar268 + fVar287 * fVar259 + fVar231 * fVar258 + fVar316 * fVar225
      ;
      auVar253._4_4_ = fVar224 * fVar269 + fVar292 * fVar189 + fVar249 * fVar212 + fVar321 * fVar187
      ;
      auVar253._8_4_ = fVar227 * fVar191 + fVar293 * fVar255 + fVar243 * fVar171 + fVar322 * fVar267
      ;
      auVar253._12_4_ =
           fVar230 * fVar257 + fVar294 * fVar264 + fVar245 * fVar263 + fVar323 * fVar228;
      auVar253._16_4_ =
           fVar214 * fVar270 + fVar287 * fVar266 + fVar231 * fVar222 + fVar316 * fVar188;
      auVar253._20_4_ =
           fVar224 * fVar271 + fVar292 * fVar190 + fVar249 * fVar186 + fVar321 * fVar297;
      auVar253._24_4_ =
           fVar227 * fVar192 + fVar293 * fVar256 + fVar243 * fVar265 + fVar322 * fVar296;
      auVar253._28_4_ = fVar245 + fVar245 + fVar286 + fVar323;
      auVar276._0_4_ = fVar135 * fVar268 + fVar193 * fVar259 + fVar213 * fVar258 + fVar137 * fVar225
      ;
      auVar276._4_4_ = fVar211 * fVar269 + fVar205 * fVar189 + fVar223 * fVar212 + fVar152 * fVar187
      ;
      auVar276._8_4_ = fVar169 * fVar191 + fVar207 * fVar255 + fVar226 * fVar171 + fVar153 * fVar267
      ;
      auVar276._12_4_ =
           fVar170 * fVar257 + fVar209 * fVar264 + fVar229 * fVar263 + fVar154 * fVar228;
      auVar276._16_4_ =
           fVar135 * fVar270 + fVar193 * fVar266 + fVar213 * fVar222 + fVar137 * fVar188;
      auVar276._20_4_ =
           fVar211 * fVar271 + fVar205 * fVar190 + fVar223 * fVar186 + fVar152 * fVar297;
      auVar276._24_4_ =
           fVar169 * fVar192 + fVar207 * fVar256 + fVar226 * fVar265 + fVar153 * fVar296;
      auVar276._28_4_ = fVar245 + fVar245 + fVar245 + fVar286;
      auVar163._0_4_ = fVar272 * fVar268 + fVar284 * fVar259 + fVar311 * fVar258 + fVar225 * fVar194
      ;
      auVar163._4_4_ = fVar273 * fVar269 + fVar285 * fVar189 + fVar313 * fVar212 + fVar187 * fVar206
      ;
      auVar163._8_4_ = fVar282 * fVar191 + fVar310 * fVar255 + fVar314 * fVar171 + fVar267 * fVar208
      ;
      auVar163._12_4_ =
           fVar283 * fVar257 + fVar309 * fVar264 + fVar315 * fVar263 + fVar228 * fVar210;
      auVar163._16_4_ =
           fVar272 * fVar270 + fVar284 * fVar266 + fVar311 * fVar222 + fVar188 * fVar194;
      auVar163._20_4_ =
           fVar273 * fVar271 + fVar285 * fVar190 + fVar313 * fVar186 + fVar297 * fVar206;
      auVar163._24_4_ =
           fVar282 * fVar192 + fVar310 * fVar256 + fVar314 * fVar265 + fVar296 * fVar208;
      auVar163._28_4_ =
           *(float *)(catmullrom_basis1 + lVar104 + 0x122c) +
           *(float *)(catmullrom_basis1 + lVar104 + 0x16b0) +
           *(float *)(catmullrom_basis1 + lVar104 + 0x1b34) +
           *(float *)(catmullrom_basis1 + lVar104 + 0x1fb8);
      auVar201._8_4_ = 0x7fffffff;
      auVar201._0_8_ = 0x7fffffff7fffffff;
      auVar201._12_4_ = 0x7fffffff;
      auVar201._16_4_ = 0x7fffffff;
      auVar201._20_4_ = 0x7fffffff;
      auVar201._24_4_ = 0x7fffffff;
      auVar201._28_4_ = 0x7fffffff;
      auVar149 = vandps_avx(_local_600,auVar201);
      auVar18 = vandps_avx(auVar144,auVar201);
      auVar18 = vmaxps_avx(auVar149,auVar18);
      auVar149 = vandps_avx(auVar236,auVar201);
      auVar149 = vmaxps_avx(auVar18,auVar149);
      auVar161 = vpermilps_avx(auVar178,0);
      auVar237._16_16_ = auVar161;
      auVar237._0_16_ = auVar161;
      auVar149 = vcmpps_avx(auVar149,auVar237,1);
      auVar24 = vblendvps_avx(_local_600,auVar16,auVar149);
      auVar13 = vblendvps_avx(auVar144,auVar17,auVar149);
      auVar149 = vandps_avx(auVar253,auVar201);
      auVar18 = vandps_avx(auVar276,auVar201);
      auVar180 = vmaxps_avx(auVar149,auVar18);
      auVar149 = vandps_avx(auVar163,auVar201);
      auVar149 = vmaxps_avx(auVar180,auVar149);
      auVar180 = vcmpps_avx(auVar149,auVar237,1);
      auVar149 = vblendvps_avx(auVar253,auVar16,auVar180);
      auVar16 = vblendvps_avx(auVar276,auVar17,auVar180);
      fVar286 = auVar24._0_4_;
      fVar124 = auVar24._4_4_;
      fVar126 = auVar24._8_4_;
      fVar128 = auVar24._12_4_;
      fVar130 = auVar24._16_4_;
      fVar132 = auVar24._20_4_;
      fVar136 = auVar24._24_4_;
      fVar232 = auVar149._0_4_;
      fVar241 = auVar149._4_4_;
      fVar244 = auVar149._8_4_;
      fVar246 = auVar149._12_4_;
      fVar247 = auVar149._16_4_;
      fVar248 = auVar149._20_4_;
      fVar109 = auVar149._24_4_;
      fVar125 = -auVar149._28_4_;
      fVar258 = auVar13._0_4_;
      fVar222 = auVar13._4_4_;
      fVar187 = auVar13._8_4_;
      fVar297 = auVar13._12_4_;
      fVar255 = auVar13._16_4_;
      fVar256 = auVar13._20_4_;
      fVar257 = auVar13._24_4_;
      auVar115._0_4_ = fVar258 * fVar258 + fVar286 * fVar286;
      auVar115._4_4_ = fVar222 * fVar222 + fVar124 * fVar124;
      auVar115._8_4_ = fVar187 * fVar187 + fVar126 * fVar126;
      auVar115._12_4_ = fVar297 * fVar297 + fVar128 * fVar128;
      auVar115._16_4_ = fVar255 * fVar255 + fVar130 * fVar130;
      auVar115._20_4_ = fVar256 * fVar256 + fVar132 * fVar132;
      auVar115._24_4_ = fVar257 * fVar257 + fVar136 * fVar136;
      auVar115._28_4_ = auVar276._28_4_ + auVar24._28_4_;
      auVar17 = vrsqrtps_avx(auVar115);
      fVar212 = auVar17._0_4_;
      fVar171 = auVar17._4_4_;
      auVar14._4_4_ = fVar171 * 1.5;
      auVar14._0_4_ = fVar212 * 1.5;
      fVar263 = auVar17._8_4_;
      auVar14._8_4_ = fVar263 * 1.5;
      fVar186 = auVar17._12_4_;
      auVar14._12_4_ = fVar186 * 1.5;
      fVar265 = auVar17._16_4_;
      auVar14._16_4_ = fVar265 * 1.5;
      fVar225 = auVar17._20_4_;
      auVar14._20_4_ = fVar225 * 1.5;
      fVar267 = auVar17._24_4_;
      fVar155 = auVar18._28_4_;
      auVar14._24_4_ = fVar267 * 1.5;
      auVar14._28_4_ = fVar155;
      auVar17._4_4_ = fVar171 * fVar171 * fVar171 * auVar115._4_4_ * 0.5;
      auVar17._0_4_ = fVar212 * fVar212 * fVar212 * auVar115._0_4_ * 0.5;
      auVar17._8_4_ = fVar263 * fVar263 * fVar263 * auVar115._8_4_ * 0.5;
      auVar17._12_4_ = fVar186 * fVar186 * fVar186 * auVar115._12_4_ * 0.5;
      auVar17._16_4_ = fVar265 * fVar265 * fVar265 * auVar115._16_4_ * 0.5;
      auVar17._20_4_ = fVar225 * fVar225 * fVar225 * auVar115._20_4_ * 0.5;
      auVar17._24_4_ = fVar267 * fVar267 * fVar267 * auVar115._24_4_ * 0.5;
      auVar17._28_4_ = auVar115._28_4_;
      auVar18 = vsubps_avx(auVar14,auVar17);
      fVar212 = auVar18._0_4_;
      fVar186 = auVar18._4_4_;
      fVar267 = auVar18._8_4_;
      fVar296 = auVar18._12_4_;
      fVar264 = auVar18._16_4_;
      fVar268 = auVar18._20_4_;
      fVar270 = auVar18._24_4_;
      fVar171 = auVar16._0_4_;
      fVar265 = auVar16._4_4_;
      fVar228 = auVar16._8_4_;
      fVar259 = auVar16._12_4_;
      fVar266 = auVar16._16_4_;
      fVar269 = auVar16._20_4_;
      fVar271 = auVar16._24_4_;
      auVar116._0_4_ = fVar171 * fVar171 + fVar232 * fVar232;
      auVar116._4_4_ = fVar265 * fVar265 + fVar241 * fVar241;
      auVar116._8_4_ = fVar228 * fVar228 + fVar244 * fVar244;
      auVar116._12_4_ = fVar259 * fVar259 + fVar246 * fVar246;
      auVar116._16_4_ = fVar266 * fVar266 + fVar247 * fVar247;
      auVar116._20_4_ = fVar269 * fVar269 + fVar248 * fVar248;
      auVar116._24_4_ = fVar271 * fVar271 + fVar109 * fVar109;
      auVar116._28_4_ = auVar149._28_4_ + auVar18._28_4_;
      auVar149 = vrsqrtps_avx(auVar116);
      fVar263 = auVar149._0_4_;
      fVar225 = auVar149._4_4_;
      auVar19._4_4_ = fVar225 * 1.5;
      auVar19._0_4_ = fVar263 * 1.5;
      fVar188 = auVar149._8_4_;
      auVar19._8_4_ = fVar188 * 1.5;
      fVar189 = auVar149._12_4_;
      auVar19._12_4_ = fVar189 * 1.5;
      fVar190 = auVar149._16_4_;
      auVar19._16_4_ = fVar190 * 1.5;
      fVar191 = auVar149._20_4_;
      auVar19._20_4_ = fVar191 * 1.5;
      fVar192 = auVar149._24_4_;
      auVar19._24_4_ = fVar192 * 1.5;
      auVar19._28_4_ = fVar155;
      auVar20._4_4_ = fVar225 * fVar225 * fVar225 * auVar116._4_4_ * 0.5;
      auVar20._0_4_ = fVar263 * fVar263 * fVar263 * auVar116._0_4_ * 0.5;
      auVar20._8_4_ = fVar188 * fVar188 * fVar188 * auVar116._8_4_ * 0.5;
      auVar20._12_4_ = fVar189 * fVar189 * fVar189 * auVar116._12_4_ * 0.5;
      auVar20._16_4_ = fVar190 * fVar190 * fVar190 * auVar116._16_4_ * 0.5;
      auVar20._20_4_ = fVar191 * fVar191 * fVar191 * auVar116._20_4_ * 0.5;
      auVar20._24_4_ = fVar192 * fVar192 * fVar192 * auVar116._24_4_ * 0.5;
      auVar20._28_4_ = auVar116._28_4_;
      auVar149 = vsubps_avx(auVar19,auVar20);
      fVar263 = auVar149._0_4_;
      fVar225 = auVar149._4_4_;
      fVar188 = auVar149._8_4_;
      fVar189 = auVar149._12_4_;
      fVar190 = auVar149._16_4_;
      fVar191 = auVar149._20_4_;
      fVar192 = auVar149._24_4_;
      fVar258 = local_7c0._0_4_ * fVar258 * fVar212;
      fVar222 = local_7c0._4_4_ * fVar222 * fVar186;
      auVar21._4_4_ = fVar222;
      auVar21._0_4_ = fVar258;
      fVar187 = local_7c0._8_4_ * fVar187 * fVar267;
      auVar21._8_4_ = fVar187;
      fVar297 = local_7c0._12_4_ * fVar297 * fVar296;
      auVar21._12_4_ = fVar297;
      fVar255 = local_7c0._16_4_ * fVar255 * fVar264;
      auVar21._16_4_ = fVar255;
      fVar256 = local_7c0._20_4_ * fVar256 * fVar268;
      auVar21._20_4_ = fVar256;
      fVar257 = local_7c0._24_4_ * fVar257 * fVar270;
      auVar21._24_4_ = fVar257;
      auVar21._28_4_ = fVar125;
      local_6c0._4_4_ = auVar299._4_4_ + fVar222;
      local_6c0._0_4_ = auVar299._0_4_ + fVar258;
      fStack_6b8 = auVar299._8_4_ + fVar187;
      fStack_6b4 = auVar299._12_4_ + fVar297;
      fStack_6b0 = auVar300._16_4_ + fVar255;
      fStack_6ac = auVar300._20_4_ + fVar256;
      fStack_6a8 = auVar300._24_4_ + fVar257;
      fStack_6a4 = auVar300._28_4_ + fVar125;
      fVar258 = local_7c0._0_4_ * fVar212 * -fVar286;
      fVar222 = local_7c0._4_4_ * fVar186 * -fVar124;
      auVar23._4_4_ = fVar222;
      auVar23._0_4_ = fVar258;
      fVar187 = local_7c0._8_4_ * fVar267 * -fVar126;
      auVar23._8_4_ = fVar187;
      fVar297 = local_7c0._12_4_ * fVar296 * -fVar128;
      auVar23._12_4_ = fVar297;
      fVar255 = local_7c0._16_4_ * fVar264 * -fVar130;
      auVar23._16_4_ = fVar255;
      fVar256 = local_7c0._20_4_ * fVar268 * -fVar132;
      auVar23._20_4_ = fVar256;
      fVar257 = local_7c0._24_4_ * fVar270 * -fVar136;
      auVar23._24_4_ = fVar257;
      auVar23._28_4_ = fVar155;
      local_5e0._4_4_ = fVar222 + auVar295._4_4_;
      local_5e0._0_4_ = fVar258 + auVar295._0_4_;
      fStack_5d8 = fVar187 + auVar295._8_4_;
      fStack_5d4 = fVar297 + auVar295._12_4_;
      auStack_5d0._0_4_ = fVar255 + auVar295._16_4_;
      auStack_5d0._4_4_ = fVar256 + auVar295._20_4_;
      fStack_5c8 = fVar257 + auVar295._24_4_;
      fStack_5c4 = fVar155 + auVar295._28_4_;
      fVar258 = local_7c0._0_4_ * fVar212 * 0.0;
      fVar212 = local_7c0._4_4_ * fVar186 * 0.0;
      auVar22._4_4_ = fVar212;
      auVar22._0_4_ = fVar258;
      fVar222 = local_7c0._8_4_ * fVar267 * 0.0;
      auVar22._8_4_ = fVar222;
      fVar186 = local_7c0._12_4_ * fVar296 * 0.0;
      auVar22._12_4_ = fVar186;
      fVar187 = local_7c0._16_4_ * fVar264 * 0.0;
      auVar22._16_4_ = fVar187;
      fVar267 = local_7c0._20_4_ * fVar268 * 0.0;
      auVar22._20_4_ = fVar267;
      fVar297 = local_7c0._24_4_ * fVar270 * 0.0;
      auVar22._24_4_ = fVar297;
      auVar22._28_4_ = fVar230;
      auVar95._4_4_ = fStack_69c;
      auVar95._0_4_ = local_6a0;
      auVar95._8_4_ = fStack_698;
      auVar95._12_4_ = fStack_694;
      auVar95._16_4_ = fStack_690;
      auVar95._20_4_ = fStack_68c;
      auVar95._24_4_ = fStack_688;
      auVar95._28_4_ = fStack_684;
      auVar238._0_4_ = fVar258 + local_6a0;
      auVar238._4_4_ = fVar212 + fStack_69c;
      auVar238._8_4_ = fVar222 + fStack_698;
      auVar238._12_4_ = fVar186 + fStack_694;
      auVar238._16_4_ = fVar187 + fStack_690;
      auVar238._20_4_ = fVar267 + fStack_68c;
      auVar238._24_4_ = fVar297 + fStack_688;
      auVar238._28_4_ = fVar230 + fStack_684;
      fVar258 = auVar317._0_4_ * fVar171 * fVar263;
      fVar212 = auVar317._4_4_ * fVar265 * fVar225;
      auVar25._4_4_ = fVar212;
      auVar25._0_4_ = fVar258;
      fVar171 = auVar317._8_4_ * fVar228 * fVar188;
      auVar25._8_4_ = fVar171;
      fVar222 = auVar317._12_4_ * fVar259 * fVar189;
      auVar25._12_4_ = fVar222;
      fVar186 = auVar317._16_4_ * fVar266 * fVar190;
      auVar25._16_4_ = fVar186;
      fVar265 = auVar317._20_4_ * fVar269 * fVar191;
      auVar25._20_4_ = fVar265;
      fVar187 = auVar317._24_4_ * fVar271 * fVar192;
      auVar25._24_4_ = fVar187;
      auVar25._28_4_ = auVar16._28_4_;
      auVar13 = vsubps_avx(auVar300,auVar21);
      auVar277._0_4_ = auVar200._0_4_ + fVar258;
      auVar277._4_4_ = auVar200._4_4_ + fVar212;
      auVar277._8_4_ = auVar200._8_4_ + fVar171;
      auVar277._12_4_ = auVar200._12_4_ + fVar222;
      auVar277._16_4_ = auVar200._16_4_ + fVar186;
      auVar277._20_4_ = auVar200._20_4_ + fVar265;
      auVar277._24_4_ = auVar200._24_4_ + fVar187;
      auVar277._28_4_ = auVar200._28_4_ + auVar16._28_4_;
      fVar258 = auVar317._0_4_ * fVar263 * -fVar232;
      fVar212 = auVar317._4_4_ * fVar225 * -fVar241;
      auVar16._4_4_ = fVar212;
      auVar16._0_4_ = fVar258;
      fVar171 = auVar317._8_4_ * fVar188 * -fVar244;
      auVar16._8_4_ = fVar171;
      fVar222 = auVar317._12_4_ * fVar189 * -fVar246;
      auVar16._12_4_ = fVar222;
      fVar186 = auVar317._16_4_ * fVar190 * -fVar247;
      auVar16._16_4_ = fVar186;
      fVar265 = auVar317._20_4_ * fVar191 * -fVar248;
      auVar16._20_4_ = fVar265;
      fVar187 = auVar317._24_4_ * fVar192 * -fVar109;
      auVar16._24_4_ = fVar187;
      auVar16._28_4_ = fVar309;
      auVar180 = vsubps_avx(auVar295,auVar23);
      auVar288._0_4_ = fVar258 + auVar179._0_4_;
      auVar288._4_4_ = fVar212 + auVar179._4_4_;
      auVar288._8_4_ = fVar171 + auVar179._8_4_;
      auVar288._12_4_ = fVar222 + auVar179._12_4_;
      auVar288._16_4_ = fVar186 + auVar179._16_4_;
      auVar288._20_4_ = fVar265 + auVar179._20_4_;
      auVar288._24_4_ = fVar187 + auVar179._24_4_;
      auVar288._28_4_ = fVar309 + auVar179._28_4_;
      fVar258 = auVar317._0_4_ * fVar263 * 0.0;
      fVar212 = auVar317._4_4_ * fVar225 * 0.0;
      auVar26._4_4_ = fVar212;
      auVar26._0_4_ = fVar258;
      fVar171 = auVar317._8_4_ * fVar188 * 0.0;
      auVar26._8_4_ = fVar171;
      fVar263 = auVar317._12_4_ * fVar189 * 0.0;
      auVar26._12_4_ = fVar263;
      fVar222 = auVar317._16_4_ * fVar190 * 0.0;
      auVar26._16_4_ = fVar222;
      fVar186 = auVar317._20_4_ * fVar191 * 0.0;
      auVar26._20_4_ = fVar186;
      fVar265 = auVar317._24_4_ * fVar192 * 0.0;
      auVar26._24_4_ = fVar265;
      auVar26._28_4_ = 0x3f000000;
      auVar295 = vsubps_avx(auVar95,auVar22);
      auVar312._0_4_ = fVar258 + (float)local_500._0_4_;
      auVar312._4_4_ = fVar212 + (float)local_500._4_4_;
      auVar312._8_4_ = fVar171 + fStack_4f8;
      auVar312._12_4_ = fVar263 + fStack_4f4;
      auVar312._16_4_ = fVar222 + fStack_4f0;
      auVar312._20_4_ = fVar186 + fStack_4ec;
      auVar312._24_4_ = fVar265 + fStack_4e8;
      auVar312._28_4_ = fStack_4e4 + 0.5;
      auVar149 = vsubps_avx(auVar200,auVar25);
      auVar18 = vsubps_avx(auVar179,auVar16);
      auVar14 = vsubps_avx(_local_500,auVar26);
      auVar16 = vsubps_avx(auVar288,auVar180);
      auVar17 = vsubps_avx(auVar312,auVar295);
      auVar27._4_4_ = auVar295._4_4_ * auVar16._4_4_;
      auVar27._0_4_ = auVar295._0_4_ * auVar16._0_4_;
      auVar27._8_4_ = auVar295._8_4_ * auVar16._8_4_;
      auVar27._12_4_ = auVar295._12_4_ * auVar16._12_4_;
      auVar27._16_4_ = auVar295._16_4_ * auVar16._16_4_;
      auVar27._20_4_ = auVar295._20_4_ * auVar16._20_4_;
      auVar27._24_4_ = auVar295._24_4_ * auVar16._24_4_;
      auVar27._28_4_ = fVar283;
      auVar28._4_4_ = auVar180._4_4_ * auVar17._4_4_;
      auVar28._0_4_ = auVar180._0_4_ * auVar17._0_4_;
      auVar28._8_4_ = auVar180._8_4_ * auVar17._8_4_;
      auVar28._12_4_ = auVar180._12_4_ * auVar17._12_4_;
      auVar28._16_4_ = auVar180._16_4_ * auVar17._16_4_;
      auVar28._20_4_ = auVar180._20_4_ * auVar17._20_4_;
      auVar28._24_4_ = auVar180._24_4_ * auVar17._24_4_;
      auVar28._28_4_ = auVar179._28_4_;
      auVar24 = vsubps_avx(auVar28,auVar27);
      auVar29._4_4_ = auVar13._4_4_ * auVar17._4_4_;
      auVar29._0_4_ = auVar13._0_4_ * auVar17._0_4_;
      auVar29._8_4_ = auVar13._8_4_ * auVar17._8_4_;
      auVar29._12_4_ = auVar13._12_4_ * auVar17._12_4_;
      auVar29._16_4_ = auVar13._16_4_ * auVar17._16_4_;
      auVar29._20_4_ = auVar13._20_4_ * auVar17._20_4_;
      auVar29._24_4_ = auVar13._24_4_ * auVar17._24_4_;
      auVar29._28_4_ = auVar17._28_4_;
      auVar179 = vsubps_avx(auVar277,auVar13);
      auVar30._4_4_ = auVar295._4_4_ * auVar179._4_4_;
      auVar30._0_4_ = auVar295._0_4_ * auVar179._0_4_;
      auVar30._8_4_ = auVar295._8_4_ * auVar179._8_4_;
      auVar30._12_4_ = auVar295._12_4_ * auVar179._12_4_;
      auVar30._16_4_ = auVar295._16_4_ * auVar179._16_4_;
      auVar30._20_4_ = auVar295._20_4_ * auVar179._20_4_;
      auVar30._24_4_ = auVar295._24_4_ * auVar179._24_4_;
      auVar30._28_4_ = auVar200._28_4_;
      auVar200 = vsubps_avx(auVar30,auVar29);
      auVar31._4_4_ = auVar179._4_4_ * auVar180._4_4_;
      auVar31._0_4_ = auVar179._0_4_ * auVar180._0_4_;
      auVar31._8_4_ = auVar179._8_4_ * auVar180._8_4_;
      auVar31._12_4_ = auVar179._12_4_ * auVar180._12_4_;
      auVar31._16_4_ = auVar179._16_4_ * auVar180._16_4_;
      auVar31._20_4_ = auVar179._20_4_ * auVar180._20_4_;
      auVar31._24_4_ = auVar179._24_4_ * auVar180._24_4_;
      auVar31._28_4_ = auVar17._28_4_;
      auVar32._4_4_ = auVar13._4_4_ * auVar16._4_4_;
      auVar32._0_4_ = auVar13._0_4_ * auVar16._0_4_;
      auVar32._8_4_ = auVar13._8_4_ * auVar16._8_4_;
      auVar32._12_4_ = auVar13._12_4_ * auVar16._12_4_;
      auVar32._16_4_ = auVar13._16_4_ * auVar16._16_4_;
      auVar32._20_4_ = auVar13._20_4_ * auVar16._20_4_;
      auVar32._24_4_ = auVar13._24_4_ * auVar16._24_4_;
      auVar32._28_4_ = auVar16._28_4_;
      auVar16 = vsubps_avx(auVar32,auVar31);
      auVar117._0_4_ = auVar24._0_4_ * 0.0 + auVar16._0_4_ + auVar200._0_4_ * 0.0;
      auVar117._4_4_ = auVar24._4_4_ * 0.0 + auVar16._4_4_ + auVar200._4_4_ * 0.0;
      auVar117._8_4_ = auVar24._8_4_ * 0.0 + auVar16._8_4_ + auVar200._8_4_ * 0.0;
      auVar117._12_4_ = auVar24._12_4_ * 0.0 + auVar16._12_4_ + auVar200._12_4_ * 0.0;
      auVar117._16_4_ = auVar24._16_4_ * 0.0 + auVar16._16_4_ + auVar200._16_4_ * 0.0;
      auVar117._20_4_ = auVar24._20_4_ * 0.0 + auVar16._20_4_ + auVar200._20_4_ * 0.0;
      auVar117._24_4_ = auVar24._24_4_ * 0.0 + auVar16._24_4_ + auVar200._24_4_ * 0.0;
      auVar117._28_4_ = auVar16._28_4_ + auVar16._28_4_ + auVar200._28_4_;
      auVar200 = vcmpps_avx(auVar117,ZEXT432(0) << 0x20,2);
      local_700 = vblendvps_avx(auVar149,_local_6c0,auVar200);
      auVar149 = vblendvps_avx(auVar18,_local_5e0,auVar200);
      auVar18 = vblendvps_avx(auVar14,auVar238,auVar200);
      auVar16 = vblendvps_avx(auVar13,auVar277,auVar200);
      auVar17 = vblendvps_avx(auVar180,auVar288,auVar200);
      auVar24 = vblendvps_avx(auVar295,auVar312,auVar200);
      auVar13 = vblendvps_avx(auVar277,auVar13,auVar200);
      auVar179 = vblendvps_avx(auVar288,auVar180,auVar200);
      local_7e0 = vpackssdw_avx(local_4e0._0_16_,local_4e0._16_16_);
      auStack_7d0 = auVar300._16_16_;
      auVar180 = vblendvps_avx(auVar312,auVar295,auVar200);
      auVar13 = vsubps_avx(auVar13,local_700);
      auVar295 = vsubps_avx(auVar179,auVar149);
      auVar180 = vsubps_avx(auVar180,auVar18);
      auVar300 = vsubps_avx(auVar149,auVar17);
      fVar258 = auVar295._0_4_;
      fVar136 = auVar18._0_4_;
      fVar186 = auVar295._4_4_;
      fVar232 = auVar18._4_4_;
      auVar33._4_4_ = fVar232 * fVar186;
      auVar33._0_4_ = fVar136 * fVar258;
      fVar228 = auVar295._8_4_;
      fVar241 = auVar18._8_4_;
      auVar33._8_4_ = fVar241 * fVar228;
      fVar189 = auVar295._12_4_;
      fVar244 = auVar18._12_4_;
      auVar33._12_4_ = fVar244 * fVar189;
      fVar256 = auVar295._16_4_;
      fVar246 = auVar18._16_4_;
      auVar33._16_4_ = fVar246 * fVar256;
      fVar270 = auVar295._20_4_;
      fVar247 = auVar18._20_4_;
      auVar33._20_4_ = fVar247 * fVar270;
      fVar124 = auVar295._24_4_;
      fVar248 = auVar18._24_4_;
      auVar33._24_4_ = fVar248 * fVar124;
      auVar33._28_4_ = auVar179._28_4_;
      fVar212 = auVar149._0_4_;
      fVar135 = auVar180._0_4_;
      fVar265 = auVar149._4_4_;
      fVar211 = auVar180._4_4_;
      auVar34._4_4_ = fVar211 * fVar265;
      auVar34._0_4_ = fVar135 * fVar212;
      fVar188 = auVar149._8_4_;
      fVar169 = auVar180._8_4_;
      auVar34._8_4_ = fVar169 * fVar188;
      fVar255 = auVar149._12_4_;
      fVar170 = auVar180._12_4_;
      auVar34._12_4_ = fVar170 * fVar255;
      fVar268 = auVar149._16_4_;
      fVar214 = auVar180._16_4_;
      auVar34._16_4_ = fVar214 * fVar268;
      fVar271 = auVar149._20_4_;
      fVar224 = auVar180._20_4_;
      auVar34._20_4_ = fVar224 * fVar271;
      fVar126 = auVar149._24_4_;
      fVar227 = auVar180._24_4_;
      uVar105 = auVar14._28_4_;
      auVar34._24_4_ = fVar227 * fVar126;
      auVar34._28_4_ = uVar105;
      auVar149 = vsubps_avx(auVar34,auVar33);
      fVar171 = local_700._0_4_;
      fVar225 = local_700._4_4_;
      auVar35._4_4_ = fVar211 * fVar225;
      auVar35._0_4_ = fVar135 * fVar171;
      fVar297 = local_700._8_4_;
      auVar35._8_4_ = fVar169 * fVar297;
      fVar264 = local_700._12_4_;
      auVar35._12_4_ = fVar170 * fVar264;
      fVar269 = local_700._16_4_;
      auVar35._16_4_ = fVar214 * fVar269;
      fVar192 = local_700._20_4_;
      auVar35._20_4_ = fVar224 * fVar192;
      fVar128 = local_700._24_4_;
      auVar35._24_4_ = fVar227 * fVar128;
      auVar35._28_4_ = uVar105;
      fVar263 = auVar13._0_4_;
      fVar187 = auVar13._4_4_;
      auVar36._4_4_ = fVar232 * fVar187;
      auVar36._0_4_ = fVar136 * fVar263;
      fVar296 = auVar13._8_4_;
      auVar36._8_4_ = fVar241 * fVar296;
      fVar266 = auVar13._12_4_;
      auVar36._12_4_ = fVar244 * fVar266;
      fVar191 = auVar13._16_4_;
      auVar36._16_4_ = fVar246 * fVar191;
      fVar155 = auVar13._20_4_;
      auVar36._20_4_ = fVar247 * fVar155;
      fVar130 = auVar13._24_4_;
      auVar36._24_4_ = fVar248 * fVar130;
      auVar36._28_4_ = auVar312._28_4_;
      auVar179 = vsubps_avx(auVar36,auVar35);
      auVar37._4_4_ = fVar265 * fVar187;
      auVar37._0_4_ = fVar212 * fVar263;
      auVar37._8_4_ = fVar188 * fVar296;
      auVar37._12_4_ = fVar255 * fVar266;
      auVar37._16_4_ = fVar268 * fVar191;
      auVar37._20_4_ = fVar271 * fVar155;
      auVar37._24_4_ = fVar126 * fVar130;
      auVar37._28_4_ = uVar105;
      auVar318._0_4_ = fVar171 * fVar258;
      auVar318._4_4_ = fVar225 * fVar186;
      auVar318._8_4_ = fVar297 * fVar228;
      auVar318._12_4_ = fVar264 * fVar189;
      auVar318._16_4_ = fVar269 * fVar256;
      auVar318._20_4_ = fVar192 * fVar270;
      auVar318._24_4_ = fVar128 * fVar124;
      auVar318._28_4_ = 0;
      auVar14 = vsubps_avx(auVar318,auVar37);
      auVar19 = vsubps_avx(auVar18,auVar24);
      fVar222 = auVar14._28_4_ + auVar179._28_4_;
      auVar145._0_4_ = auVar14._0_4_ + auVar179._0_4_ * 0.0 + auVar149._0_4_ * 0.0;
      auVar145._4_4_ = auVar14._4_4_ + auVar179._4_4_ * 0.0 + auVar149._4_4_ * 0.0;
      auVar145._8_4_ = auVar14._8_4_ + auVar179._8_4_ * 0.0 + auVar149._8_4_ * 0.0;
      auVar145._12_4_ = auVar14._12_4_ + auVar179._12_4_ * 0.0 + auVar149._12_4_ * 0.0;
      auVar145._16_4_ = auVar14._16_4_ + auVar179._16_4_ * 0.0 + auVar149._16_4_ * 0.0;
      auVar145._20_4_ = auVar14._20_4_ + auVar179._20_4_ * 0.0 + auVar149._20_4_ * 0.0;
      auVar145._24_4_ = auVar14._24_4_ + auVar179._24_4_ * 0.0 + auVar149._24_4_ * 0.0;
      auVar145._28_4_ = fVar222 + auVar149._28_4_;
      fVar109 = auVar300._0_4_;
      fVar125 = auVar300._4_4_;
      auVar38._4_4_ = fVar125 * auVar24._4_4_;
      auVar38._0_4_ = fVar109 * auVar24._0_4_;
      fVar127 = auVar300._8_4_;
      auVar38._8_4_ = fVar127 * auVar24._8_4_;
      fVar129 = auVar300._12_4_;
      auVar38._12_4_ = fVar129 * auVar24._12_4_;
      fVar131 = auVar300._16_4_;
      auVar38._16_4_ = fVar131 * auVar24._16_4_;
      fVar133 = auVar300._20_4_;
      auVar38._20_4_ = fVar133 * auVar24._20_4_;
      fVar134 = auVar300._24_4_;
      auVar38._24_4_ = fVar134 * auVar24._24_4_;
      auVar38._28_4_ = fVar222;
      fVar222 = auVar19._0_4_;
      fVar267 = auVar19._4_4_;
      auVar39._4_4_ = auVar17._4_4_ * fVar267;
      auVar39._0_4_ = auVar17._0_4_ * fVar222;
      fVar259 = auVar19._8_4_;
      auVar39._8_4_ = auVar17._8_4_ * fVar259;
      fVar190 = auVar19._12_4_;
      auVar39._12_4_ = auVar17._12_4_ * fVar190;
      fVar257 = auVar19._16_4_;
      auVar39._16_4_ = auVar17._16_4_ * fVar257;
      fVar286 = auVar19._20_4_;
      auVar39._20_4_ = auVar17._20_4_ * fVar286;
      fVar132 = auVar19._24_4_;
      auVar39._24_4_ = auVar17._24_4_ * fVar132;
      auVar39._28_4_ = auVar14._28_4_;
      auVar179 = vsubps_avx(auVar39,auVar38);
      auVar300 = vsubps_avx(local_700,auVar16);
      fVar230 = auVar300._0_4_;
      fVar231 = auVar300._4_4_;
      auVar40._4_4_ = fVar231 * auVar24._4_4_;
      auVar40._0_4_ = fVar230 * auVar24._0_4_;
      fVar249 = auVar300._8_4_;
      auVar40._8_4_ = fVar249 * auVar24._8_4_;
      fVar243 = auVar300._12_4_;
      auVar40._12_4_ = fVar243 * auVar24._12_4_;
      fVar245 = auVar300._16_4_;
      auVar40._16_4_ = fVar245 * auVar24._16_4_;
      fVar194 = auVar300._20_4_;
      auVar40._20_4_ = fVar194 * auVar24._20_4_;
      fVar206 = auVar300._24_4_;
      auVar40._24_4_ = fVar206 * auVar24._24_4_;
      auVar40._28_4_ = auVar24._28_4_;
      auVar41._4_4_ = auVar16._4_4_ * fVar267;
      auVar41._0_4_ = auVar16._0_4_ * fVar222;
      auVar41._8_4_ = auVar16._8_4_ * fVar259;
      auVar41._12_4_ = auVar16._12_4_ * fVar190;
      auVar41._16_4_ = auVar16._16_4_ * fVar257;
      auVar41._20_4_ = auVar16._20_4_ * fVar286;
      auVar41._24_4_ = auVar16._24_4_ * fVar132;
      auVar41._28_4_ = auVar149._28_4_;
      auVar149 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = auVar17._4_4_ * fVar231;
      auVar42._0_4_ = auVar17._0_4_ * fVar230;
      auVar42._8_4_ = auVar17._8_4_ * fVar249;
      auVar42._12_4_ = auVar17._12_4_ * fVar243;
      auVar42._16_4_ = auVar17._16_4_ * fVar245;
      auVar42._20_4_ = auVar17._20_4_ * fVar194;
      auVar42._24_4_ = auVar17._24_4_ * fVar206;
      auVar42._28_4_ = auVar24._28_4_;
      auVar43._4_4_ = auVar16._4_4_ * fVar125;
      auVar43._0_4_ = auVar16._0_4_ * fVar109;
      auVar43._8_4_ = auVar16._8_4_ * fVar127;
      auVar43._12_4_ = auVar16._12_4_ * fVar129;
      auVar43._16_4_ = auVar16._16_4_ * fVar131;
      auVar43._20_4_ = auVar16._20_4_ * fVar133;
      auVar43._24_4_ = auVar16._24_4_ * fVar134;
      auVar43._28_4_ = auVar16._28_4_;
      auVar16 = vsubps_avx(auVar43,auVar42);
      auVar202._0_4_ = auVar179._0_4_ * 0.0 + auVar16._0_4_ + auVar149._0_4_ * 0.0;
      auVar202._4_4_ = auVar179._4_4_ * 0.0 + auVar16._4_4_ + auVar149._4_4_ * 0.0;
      auVar202._8_4_ = auVar179._8_4_ * 0.0 + auVar16._8_4_ + auVar149._8_4_ * 0.0;
      auVar202._12_4_ = auVar179._12_4_ * 0.0 + auVar16._12_4_ + auVar149._12_4_ * 0.0;
      auVar202._16_4_ = auVar179._16_4_ * 0.0 + auVar16._16_4_ + auVar149._16_4_ * 0.0;
      auVar202._20_4_ = auVar179._20_4_ * 0.0 + auVar16._20_4_ + auVar149._20_4_ * 0.0;
      auVar202._24_4_ = auVar179._24_4_ * 0.0 + auVar16._24_4_ + auVar149._24_4_ * 0.0;
      auVar202._28_4_ = auVar16._28_4_ + auVar16._28_4_ + auVar149._28_4_;
      auVar149 = vmaxps_avx(auVar145,auVar202);
      auVar149 = vcmpps_avx(auVar149,ZEXT832(0) << 0x20,2);
      auVar161 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
      auVar161 = vpand_avx(auVar161,local_7e0);
      auVar176 = vpmovsxwd_avx(auVar161);
      auVar177 = vpunpckhwd_avx(auVar161,auVar161);
      auVar181._16_16_ = auVar177;
      auVar181._0_16_ = auVar176;
      if ((((((((auVar181 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar181 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar181 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar181 >> 0x7f,0) == '\0') &&
            (auVar181 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar177 >> 0x3f,0) == '\0') &&
          (auVar181 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar177[0xf]
         ) {
LAB_00822684:
        auVar145 = auVar179;
        auVar219._8_8_ = uStack_618;
        auVar219._0_8_ = local_620;
        auVar219._16_8_ = uStack_610;
        auVar219._24_8_ = uStack_608;
        auVar291 = ZEXT3264(auVar278);
        auVar281 = ZEXT3264(auVar275);
        auVar185 = ZEXT3264(auVar181);
      }
      else {
        auVar44._4_4_ = fVar267 * fVar186;
        auVar44._0_4_ = fVar222 * fVar258;
        auVar44._8_4_ = fVar259 * fVar228;
        auVar44._12_4_ = fVar190 * fVar189;
        auVar44._16_4_ = fVar257 * fVar256;
        auVar44._20_4_ = fVar286 * fVar270;
        auVar44._24_4_ = fVar132 * fVar124;
        auVar44._28_4_ = auVar177._12_4_;
        auVar301._0_4_ = fVar109 * fVar135;
        auVar301._4_4_ = fVar125 * fVar211;
        auVar301._8_4_ = fVar127 * fVar169;
        auVar301._12_4_ = fVar129 * fVar170;
        auVar301._16_4_ = fVar131 * fVar214;
        auVar301._20_4_ = fVar133 * fVar224;
        auVar301._24_4_ = fVar134 * fVar227;
        auVar301._28_4_ = 0;
        auVar149 = vsubps_avx(auVar301,auVar44);
        auVar45._4_4_ = fVar231 * fVar211;
        auVar45._0_4_ = fVar230 * fVar135;
        auVar45._8_4_ = fVar249 * fVar169;
        auVar45._12_4_ = fVar243 * fVar170;
        auVar45._16_4_ = fVar245 * fVar214;
        auVar45._20_4_ = fVar194 * fVar224;
        auVar45._24_4_ = fVar206 * fVar227;
        auVar45._28_4_ = auVar180._28_4_;
        auVar46._4_4_ = fVar267 * fVar187;
        auVar46._0_4_ = fVar222 * fVar263;
        auVar46._8_4_ = fVar259 * fVar296;
        auVar46._12_4_ = fVar190 * fVar266;
        auVar46._16_4_ = fVar257 * fVar191;
        auVar46._20_4_ = fVar286 * fVar155;
        auVar46._24_4_ = fVar132 * fVar130;
        auVar46._28_4_ = auVar19._28_4_;
        auVar17 = vsubps_avx(auVar46,auVar45);
        auVar47._4_4_ = fVar125 * fVar187;
        auVar47._0_4_ = fVar109 * fVar263;
        auVar47._8_4_ = fVar127 * fVar296;
        auVar47._12_4_ = fVar129 * fVar266;
        auVar47._16_4_ = fVar131 * fVar191;
        auVar47._20_4_ = fVar133 * fVar155;
        auVar47._24_4_ = fVar134 * fVar130;
        auVar47._28_4_ = auVar145._28_4_;
        auVar48._4_4_ = fVar231 * fVar186;
        auVar48._0_4_ = fVar230 * fVar258;
        auVar48._8_4_ = fVar249 * fVar228;
        auVar48._12_4_ = fVar243 * fVar189;
        auVar48._16_4_ = fVar245 * fVar256;
        auVar48._20_4_ = fVar194 * fVar270;
        auVar48._24_4_ = fVar206 * fVar124;
        auVar48._28_4_ = auVar295._28_4_;
        auVar24 = vsubps_avx(auVar48,auVar47);
        auVar254._0_4_ = auVar149._0_4_ * 0.0 + auVar24._0_4_ + auVar17._0_4_ * 0.0;
        auVar254._4_4_ = auVar149._4_4_ * 0.0 + auVar24._4_4_ + auVar17._4_4_ * 0.0;
        auVar254._8_4_ = auVar149._8_4_ * 0.0 + auVar24._8_4_ + auVar17._8_4_ * 0.0;
        auVar254._12_4_ = auVar149._12_4_ * 0.0 + auVar24._12_4_ + auVar17._12_4_ * 0.0;
        auVar254._16_4_ = auVar149._16_4_ * 0.0 + auVar24._16_4_ + auVar17._16_4_ * 0.0;
        auVar254._20_4_ = auVar149._20_4_ * 0.0 + auVar24._20_4_ + auVar17._20_4_ * 0.0;
        auVar254._24_4_ = auVar149._24_4_ * 0.0 + auVar24._24_4_ + auVar17._24_4_ * 0.0;
        auVar254._28_4_ = auVar295._28_4_ + auVar24._28_4_ + auVar145._28_4_;
        auVar16 = vrcpps_avx(auVar254);
        fVar258 = auVar16._0_4_;
        fVar263 = auVar16._4_4_;
        auVar49._4_4_ = auVar254._4_4_ * fVar263;
        auVar49._0_4_ = auVar254._0_4_ * fVar258;
        fVar222 = auVar16._8_4_;
        auVar49._8_4_ = auVar254._8_4_ * fVar222;
        fVar186 = auVar16._12_4_;
        auVar49._12_4_ = auVar254._12_4_ * fVar186;
        fVar187 = auVar16._16_4_;
        auVar49._16_4_ = auVar254._16_4_ * fVar187;
        fVar267 = auVar16._20_4_;
        auVar49._20_4_ = auVar254._20_4_ * fVar267;
        fVar228 = auVar16._24_4_;
        auVar49._24_4_ = auVar254._24_4_ * fVar228;
        auVar49._28_4_ = auVar19._28_4_;
        auVar302._8_4_ = 0x3f800000;
        auVar302._0_8_ = 0x3f8000003f800000;
        auVar302._12_4_ = 0x3f800000;
        auVar302._16_4_ = 0x3f800000;
        auVar302._20_4_ = 0x3f800000;
        auVar302._24_4_ = 0x3f800000;
        auVar302._28_4_ = 0x3f800000;
        auVar180 = vsubps_avx(auVar302,auVar49);
        fVar258 = auVar180._0_4_ * fVar258 + fVar258;
        fVar263 = auVar180._4_4_ * fVar263 + fVar263;
        fVar222 = auVar180._8_4_ * fVar222 + fVar222;
        fVar186 = auVar180._12_4_ * fVar186 + fVar186;
        fVar187 = auVar180._16_4_ * fVar187 + fVar187;
        fVar267 = auVar180._20_4_ * fVar267 + fVar267;
        fVar228 = auVar180._24_4_ * fVar228 + fVar228;
        auVar50._4_4_ =
             (auVar149._4_4_ * fVar225 + auVar17._4_4_ * fVar265 + auVar24._4_4_ * fVar232) *
             fVar263;
        auVar50._0_4_ =
             (auVar149._0_4_ * fVar171 + auVar17._0_4_ * fVar212 + auVar24._0_4_ * fVar136) *
             fVar258;
        auVar50._8_4_ =
             (auVar149._8_4_ * fVar297 + auVar17._8_4_ * fVar188 + auVar24._8_4_ * fVar241) *
             fVar222;
        auVar50._12_4_ =
             (auVar149._12_4_ * fVar264 + auVar17._12_4_ * fVar255 + auVar24._12_4_ * fVar244) *
             fVar186;
        auVar50._16_4_ =
             (auVar149._16_4_ * fVar269 + auVar17._16_4_ * fVar268 + auVar24._16_4_ * fVar246) *
             fVar187;
        auVar50._20_4_ =
             (auVar149._20_4_ * fVar192 + auVar17._20_4_ * fVar271 + auVar24._20_4_ * fVar247) *
             fVar267;
        auVar50._24_4_ =
             (auVar149._24_4_ * fVar128 + auVar17._24_4_ * fVar126 + auVar24._24_4_ * fVar248) *
             fVar228;
        auVar50._28_4_ = local_700._28_4_ + auVar13._28_4_ + auVar18._28_4_;
        auVar176 = vpermilps_avx(ZEXT416(uVar7),0);
        auVar182._16_16_ = auVar176;
        auVar182._0_16_ = auVar176;
        auVar149 = vcmpps_avx(auVar182,auVar50,2);
        uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar217._4_4_ = uVar105;
        auVar217._0_4_ = uVar105;
        auVar217._8_4_ = uVar105;
        auVar217._12_4_ = uVar105;
        auVar217._16_4_ = uVar105;
        auVar217._20_4_ = uVar105;
        auVar217._24_4_ = uVar105;
        auVar217._28_4_ = uVar105;
        auVar18 = vcmpps_avx(auVar50,auVar217,2);
        auVar149 = vandps_avx(auVar18,auVar149);
        auVar176 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
        auVar161 = vpand_avx(auVar161,auVar176);
        auVar176 = vpmovsxwd_avx(auVar161);
        auVar177 = vpshufd_avx(auVar161,0xee);
        auVar177 = vpmovsxwd_avx(auVar177);
        auVar181._16_16_ = auVar177;
        auVar181._0_16_ = auVar176;
        auVar179 = auVar145;
        if ((((((((auVar181 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar181 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar181 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar181 >> 0x7f,0) == '\0') &&
              (auVar181 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar177 >> 0x3f,0) == '\0') &&
            (auVar181 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar177[0xf]) goto LAB_00822684;
        auVar149 = vcmpps_avx(ZEXT832(0) << 0x20,auVar254,4);
        auVar176 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
        auVar161 = vpand_avx(auVar161,auVar176);
        auVar176 = vpmovsxwd_avx(auVar161);
        auVar161 = vpunpckhwd_avx(auVar161,auVar161);
        auVar185 = ZEXT1664(auVar161);
        auVar239._16_16_ = auVar161;
        auVar239._0_16_ = auVar176;
        auVar219._8_8_ = uStack_618;
        auVar219._0_8_ = local_620;
        auVar219._16_8_ = uStack_610;
        auVar219._24_8_ = uStack_608;
        auVar281 = ZEXT3264(auVar275);
        auVar291 = ZEXT3264(auVar278);
        if ((((((((auVar239 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar239 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar239 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar239 >> 0x7f,0) != '\0') ||
              (auVar239 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar161 >> 0x3f,0) != '\0') ||
            (auVar239 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar161[0xf] < '\0') {
          auVar183._0_4_ = auVar145._0_4_ * fVar258;
          auVar183._4_4_ = auVar145._4_4_ * fVar263;
          auVar183._8_4_ = auVar145._8_4_ * fVar222;
          auVar183._12_4_ = auVar145._12_4_ * fVar186;
          auVar183._16_4_ = auVar145._16_4_ * fVar187;
          auVar183._20_4_ = auVar145._20_4_ * fVar267;
          auVar183._24_4_ = auVar145._24_4_ * fVar228;
          auVar183._28_4_ = 0;
          auVar278._4_4_ = auVar202._4_4_ * fVar263;
          auVar278._0_4_ = auVar202._0_4_ * fVar258;
          auVar278._8_4_ = auVar202._8_4_ * fVar222;
          auVar278._12_4_ = auVar202._12_4_ * fVar186;
          auVar278._16_4_ = auVar202._16_4_ * fVar187;
          auVar278._20_4_ = auVar202._20_4_ * fVar267;
          auVar278._24_4_ = auVar202._24_4_ * fVar228;
          auVar278._28_4_ = auVar180._28_4_ + auVar16._28_4_;
          auVar218._8_4_ = 0x3f800000;
          auVar218._0_8_ = 0x3f8000003f800000;
          auVar218._12_4_ = 0x3f800000;
          auVar218._16_4_ = 0x3f800000;
          auVar218._20_4_ = 0x3f800000;
          auVar218._24_4_ = 0x3f800000;
          auVar218._28_4_ = 0x3f800000;
          auVar275 = vsubps_avx(auVar218,auVar183);
          auVar275 = vblendvps_avx(auVar275,auVar183,auVar200);
          auVar281 = ZEXT3264(auVar275);
          auVar275 = vsubps_avx(auVar218,auVar278);
          auVar185 = ZEXT3264(auVar275);
          _local_520 = vblendvps_avx(auVar275,auVar278,auVar200);
          auVar291 = ZEXT3264(auVar50);
          auVar219 = auVar239;
        }
      }
      if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar219 >> 0x7f,0) != '\0') ||
            (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar219 >> 0xbf,0) != '\0') ||
          (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar219[0x1f] < '\0') {
        auVar275 = vsubps_avx(auVar317,local_7c0._0_32_);
        fVar212 = local_7c0._0_4_ + auVar281._0_4_ * auVar275._0_4_;
        fVar171 = local_7c0._4_4_ + auVar281._4_4_ * auVar275._4_4_;
        fVar263 = local_7c0._8_4_ + auVar281._8_4_ * auVar275._8_4_;
        fVar222 = local_7c0._12_4_ + auVar281._12_4_ * auVar275._12_4_;
        fVar186 = local_7c0._16_4_ + auVar281._16_4_ * auVar275._16_4_;
        fVar265 = local_7c0._20_4_ + auVar281._20_4_ * auVar275._20_4_;
        fVar225 = local_7c0._24_4_ + auVar281._24_4_ * auVar275._24_4_;
        fVar187 = local_7c0._28_4_ + auVar275._28_4_;
        fVar258 = *(float *)((long)local_778->ray_space + k * 4 + -0x20);
        auVar275._4_4_ = (fVar171 + fVar171) * fVar258;
        auVar275._0_4_ = (fVar212 + fVar212) * fVar258;
        auVar275._8_4_ = (fVar263 + fVar263) * fVar258;
        auVar275._12_4_ = (fVar222 + fVar222) * fVar258;
        auVar275._16_4_ = (fVar186 + fVar186) * fVar258;
        auVar275._20_4_ = (fVar265 + fVar265) * fVar258;
        auVar275._24_4_ = (fVar225 + fVar225) * fVar258;
        auVar275._28_4_ = fVar187 + fVar187;
        auVar149 = auVar291._0_32_;
        auVar275 = vcmpps_avx(auVar149,auVar275,6);
        auVar278 = auVar219 & auVar275;
        if ((((((((auVar278 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar278 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar278 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar278 >> 0x7f,0) != '\0') ||
              (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar278 >> 0xbf,0) != '\0') ||
            (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar278[0x1f] < '\0') {
          local_380 = vandps_avx(auVar275,auVar219);
          local_420._0_4_ = (float)local_520._0_4_ + (float)local_520._0_4_ + -1.0;
          local_420._4_4_ = (float)local_520._4_4_ + (float)local_520._4_4_ + -1.0;
          fStack_418 = (float)uStack_518 + (float)uStack_518 + -1.0;
          fStack_414 = uStack_518._4_4_ + uStack_518._4_4_ + -1.0;
          fStack_410 = (float)uStack_510 + (float)uStack_510 + -1.0;
          fStack_40c = uStack_510._4_4_ + uStack_510._4_4_ + -1.0;
          fStack_408 = (float)uStack_508 + (float)uStack_508 + -1.0;
          fStack_404 = uStack_508._4_4_ + uStack_508._4_4_ + -1.0;
          auVar278 = auVar281._0_32_;
          local_3e0 = 0;
          fStack_3cc = fStack_95c;
          fStack_3c8 = fStack_958;
          fStack_3c4 = fStack_954;
          fStack_3bc = fStack_92c;
          fStack_3b8 = fStack_928;
          fStack_3b4 = fStack_924;
          local_3b0 = local_6d0;
          uStack_3a8 = uStack_6c8;
          local_3a0 = local_8c0;
          fStack_39c = fStack_8bc;
          fStack_398 = fStack_8b8;
          fStack_394 = fStack_8b4;
          local_520._4_4_ = local_420._4_4_;
          local_520._0_4_ = local_420._0_4_;
          uStack_518._0_4_ = fStack_418;
          uStack_518._4_4_ = fStack_414;
          uStack_510._0_4_ = fStack_410;
          uStack_510._4_4_ = fStack_40c;
          auVar143 = _local_520;
          uStack_508._0_4_ = fStack_408;
          uStack_508._4_4_ = fStack_404;
          auVar275 = _local_520;
          if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (uVar106 = CONCAT71((int7)(uVar106 >> 8),1),
               pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar158._0_4_ = 1.0 / auVar198._0_4_;
              auVar158._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar161 = vshufps_avx(auVar158,auVar158,0);
              local_360[0] = auVar161._0_4_ * (auVar281._0_4_ + 0.0);
              local_360[1] = auVar161._4_4_ * (auVar281._4_4_ + 1.0);
              local_360[2] = auVar161._8_4_ * (auVar281._8_4_ + 2.0);
              local_360[3] = auVar161._12_4_ * (auVar281._12_4_ + 3.0);
              fStack_350 = auVar161._0_4_ * (auVar281._16_4_ + 4.0);
              fStack_34c = auVar161._4_4_ * (auVar281._20_4_ + 5.0);
              fStack_348 = auVar161._8_4_ * (auVar281._24_4_ + 6.0);
              fStack_344 = auVar281._28_4_ + 7.0;
              uStack_510 = auVar143._16_8_;
              uStack_508 = auVar275._24_8_;
              local_340 = local_520;
              uStack_338 = uStack_518;
              uStack_330 = uStack_510;
              uStack_328 = uStack_508;
              local_320 = auVar149;
              uVar105 = vmovmskps_avx(local_380);
              uVar106 = CONCAT44((int)(uVar106 >> 0x20),uVar105);
              lVar107 = 0;
              if (uVar106 != 0) {
                for (; (uVar106 >> lVar107 & 1) == 0; lVar107 = lVar107 + 1) {
                }
              }
              auVar161 = vshufps_avx(ZEXT416(uVar103),ZEXT416(uVar103),0);
              local_660._16_16_ = auVar161;
              local_660._0_16_ = auVar161;
              auVar161 = vpermilps_avx(ZEXT416(uVar9),0);
              register0x00001210 = auVar161;
              _local_680 = auVar161;
              auVar18 = vcmpps_avx(auVar145,auVar145,0xf);
              auVar151 = ZEXT3264(auVar18);
              _local_740 = auVar317;
              _local_520 = auVar275;
              local_440 = auVar278;
              local_400 = auVar149;
              local_3dc = uVar10;
              local_3d0 = local_960;
              local_3c0 = local_930;
              while (uVar106 != 0) {
                uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
                local_200 = local_360[lVar107];
                local_1e0 = *(undefined4 *)((long)&local_340 + lVar107 * 4);
                local_7c0._0_8_ = lVar107;
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + lVar107 * 4);
                fVar212 = 1.0 - local_200;
                fVar258 = local_200 * 3.0;
                auVar161 = ZEXT416((uint)((fVar212 * -2.0 * local_200 + local_200 * local_200) * 0.5
                                         ));
                auVar161 = vshufps_avx(auVar161,auVar161,0);
                auVar176 = ZEXT416((uint)(((fVar212 + fVar212) * (fVar258 + 2.0) +
                                          fVar212 * fVar212 * -3.0) * 0.5));
                auVar176 = vshufps_avx(auVar176,auVar176,0);
                auVar177 = ZEXT416((uint)(((local_200 + local_200) * (fVar258 + -5.0) +
                                          local_200 * fVar258) * 0.5));
                auVar177 = vshufps_avx(auVar177,auVar177,0);
                local_770.context = context->user;
                auVar175 = ZEXT416((uint)((local_200 * (fVar212 + fVar212) - fVar212 * fVar212) *
                                         0.5));
                auVar175 = vshufps_avx(auVar175,auVar175,0);
                auVar159._0_4_ =
                     local_960 * auVar175._0_4_ +
                     local_930 * auVar177._0_4_ +
                     local_8c0 * auVar161._0_4_ + auVar176._0_4_ * (float)local_6d0._0_4_;
                auVar159._4_4_ =
                     fStack_95c * auVar175._4_4_ +
                     fStack_92c * auVar177._4_4_ +
                     fStack_8bc * auVar161._4_4_ + auVar176._4_4_ * (float)local_6d0._4_4_;
                auVar159._8_4_ =
                     fStack_958 * auVar175._8_4_ +
                     fStack_928 * auVar177._8_4_ +
                     fStack_8b8 * auVar161._8_4_ + auVar176._8_4_ * (float)uStack_6c8;
                auVar159._12_4_ =
                     fStack_954 * auVar175._12_4_ +
                     fStack_924 * auVar177._12_4_ +
                     fStack_8b4 * auVar161._12_4_ + auVar176._12_4_ * uStack_6c8._4_4_;
                local_250 = vshufps_avx(auVar159,auVar159,0);
                local_260[0] = (RTCHitN)local_250[0];
                local_260[1] = (RTCHitN)local_250[1];
                local_260[2] = (RTCHitN)local_250[2];
                local_260[3] = (RTCHitN)local_250[3];
                local_260[4] = (RTCHitN)local_250[4];
                local_260[5] = (RTCHitN)local_250[5];
                local_260[6] = (RTCHitN)local_250[6];
                local_260[7] = (RTCHitN)local_250[7];
                local_260[8] = (RTCHitN)local_250[8];
                local_260[9] = (RTCHitN)local_250[9];
                local_260[10] = (RTCHitN)local_250[10];
                local_260[0xb] = (RTCHitN)local_250[0xb];
                local_260[0xc] = (RTCHitN)local_250[0xc];
                local_260[0xd] = (RTCHitN)local_250[0xd];
                local_260[0xe] = (RTCHitN)local_250[0xe];
                local_260[0xf] = (RTCHitN)local_250[0xf];
                local_230 = vshufps_avx(auVar159,auVar159,0x55);
                local_240 = local_230;
                local_210 = vshufps_avx(auVar159,auVar159,0xaa);
                local_220 = local_210;
                fStack_1fc = local_200;
                fStack_1f8 = local_200;
                fStack_1f4 = local_200;
                fStack_1f0 = local_200;
                fStack_1ec = local_200;
                fStack_1e8 = local_200;
                fStack_1e4 = local_200;
                uStack_1dc = local_1e0;
                uStack_1d8 = local_1e0;
                uStack_1d4 = local_1e0;
                uStack_1d0 = local_1e0;
                uStack_1cc = local_1e0;
                uStack_1c8 = local_1e0;
                uStack_1c4 = local_1e0;
                local_1c0 = local_680;
                uStack_1b8 = uStack_678;
                uStack_1b0 = uStack_670;
                uStack_1a8 = uStack_668;
                local_1a0 = local_660._0_8_;
                uStack_198 = local_660._8_8_;
                uStack_190 = local_660._16_8_;
                uStack_188 = local_660._24_8_;
                local_780[1] = auVar151._0_32_;
                *local_780 = auVar151._0_32_;
                local_180 = (local_770.context)->instID[0];
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_160 = (local_770.context)->instPrimID[0];
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_800 = *local_788;
                local_7f0 = *local_790;
                local_770.valid = (int *)local_800;
                local_770.geometryUserPtr = pGVar11->userPtr;
                local_770.hit = local_260;
                local_770.N = 8;
                local_770.ray = (RTCRayN *)ray;
                if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  local_7e0._0_8_ = uVar106;
                  local_700._0_4_ = uVar105;
                  auVar275 = ZEXT1632(auVar151._0_16_);
                  (*pGVar11->occlusionFilterN)(&local_770);
                  auVar291 = ZEXT3264(auVar149);
                  auVar281 = ZEXT3264(auVar278);
                  auVar275 = vcmpps_avx(auVar275,auVar275,0xf);
                  auVar151 = ZEXT3264(auVar275);
                  uVar106 = local_7e0._0_8_;
                  uVar105 = local_700._0_4_;
                }
                auVar161 = vpcmpeqd_avx(local_800,ZEXT816(0) << 0x40);
                auVar176 = vpcmpeqd_avx(local_7f0,ZEXT816(0) << 0x40);
                auVar185 = ZEXT1664(auVar176);
                auVar164._16_16_ = auVar176;
                auVar164._0_16_ = auVar161;
                auVar275 = auVar151._0_32_ & ~auVar164;
                if ((((((((auVar275 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar275 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar275 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar275 >> 0x7f,0) == '\0') &&
                      (auVar275 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar275 >> 0xbf,0) == '\0') &&
                    (auVar275 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar275[0x1f]) {
                  auVar118._0_4_ = auVar151._0_4_ ^ auVar161._0_4_;
                  auVar118._4_4_ = auVar151._4_4_ ^ auVar161._4_4_;
                  auVar118._8_4_ = auVar151._8_4_ ^ auVar161._8_4_;
                  auVar118._12_4_ = auVar151._12_4_ ^ auVar161._12_4_;
                  auVar118._16_4_ = auVar151._16_4_ ^ auVar176._0_4_;
                  auVar118._20_4_ = auVar151._20_4_ ^ auVar176._4_4_;
                  auVar118._24_4_ = auVar151._24_4_ ^ auVar176._8_4_;
                  auVar118._28_4_ = auVar151._28_4_ ^ auVar176._12_4_;
                }
                else {
                  p_Var12 = context->args->filter;
                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    local_7e0._0_8_ = uVar106;
                    local_700._0_4_ = uVar105;
                    auVar185 = ZEXT1664(auVar176);
                    auVar275 = ZEXT1632(auVar151._0_16_);
                    (*p_Var12)(&local_770);
                    auVar291 = ZEXT3264(auVar149);
                    auVar281 = ZEXT3264(auVar278);
                    auVar275 = vcmpps_avx(auVar275,auVar275,0xf);
                    auVar151 = ZEXT3264(auVar275);
                    uVar106 = local_7e0._0_8_;
                    uVar105 = local_700._0_4_;
                  }
                  auVar161 = vpcmpeqd_avx(local_800,ZEXT816(0) << 0x40);
                  auVar176 = vpcmpeqd_avx(local_7f0,ZEXT816(0) << 0x40);
                  auVar146._16_16_ = auVar176;
                  auVar146._0_16_ = auVar161;
                  auVar118._0_4_ = auVar151._0_4_ ^ auVar161._0_4_;
                  auVar118._4_4_ = auVar151._4_4_ ^ auVar161._4_4_;
                  auVar118._8_4_ = auVar151._8_4_ ^ auVar161._8_4_;
                  auVar118._12_4_ = auVar151._12_4_ ^ auVar161._12_4_;
                  auVar118._16_4_ = auVar151._16_4_ ^ auVar176._0_4_;
                  auVar118._20_4_ = auVar151._20_4_ ^ auVar176._4_4_;
                  auVar118._24_4_ = auVar151._24_4_ ^ auVar176._8_4_;
                  auVar118._28_4_ = auVar151._28_4_ ^ auVar176._12_4_;
                  auVar165._8_4_ = 0xff800000;
                  auVar165._0_8_ = 0xff800000ff800000;
                  auVar165._12_4_ = 0xff800000;
                  auVar165._16_4_ = 0xff800000;
                  auVar165._20_4_ = 0xff800000;
                  auVar165._24_4_ = 0xff800000;
                  auVar165._28_4_ = 0xff800000;
                  auVar275 = vblendvps_avx(auVar165,*(undefined1 (*) [32])(local_770.ray + 0x100),
                                           auVar146);
                  *(undefined1 (*) [32])(local_770.ray + 0x100) = auVar275;
                }
                if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar118 >> 0x7f,0) != '\0') ||
                      (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar118 >> 0xbf,0) != '\0') ||
                    (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar118[0x1f] < '\0') {
                  uVar106 = CONCAT71((int7)(uVar106 >> 8),1);
                  goto LAB_0082109b;
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar105;
                uVar106 = uVar106 ^ 1L << (local_7c0._0_8_ & 0x3f);
                lVar107 = 0;
                if (uVar106 != 0) {
                  for (; (uVar106 >> lVar107 & 1) == 0; lVar107 = lVar107 + 1) {
                  }
                }
              }
              uVar106 = 0;
            }
            goto LAB_0082109b;
          }
        }
      }
      uVar106 = 0;
    }
LAB_0082109b:
    auVar221 = ZEXT3264(auVar199);
    auVar151 = ZEXT1664(auVar178);
    if (8 < (int)uVar10) {
      _local_5e0 = vpshufd_avx(ZEXT416(uVar10),0);
      auVar161 = vshufps_avx(auVar178,auVar178,0);
      local_4e0._16_16_ = auVar161;
      local_4e0._0_16_ = auVar161;
      auVar161 = vpermilps_avx(ZEXT416(uVar7),0);
      register0x00001210 = auVar161;
      _local_500 = auVar161;
      auVar114._0_4_ = 1.0 / (float)local_5a0._0_4_;
      auVar114._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar161 = vshufps_avx(auVar114,auVar114,0);
      register0x00001210 = auVar161;
      _local_140 = auVar161;
      auVar161 = vshufps_avx(ZEXT416(uVar103),ZEXT416(uVar103),0);
      local_100._16_16_ = auVar161;
      local_100._0_16_ = auVar161;
      auVar161 = vpermilps_avx(_local_720,0);
      local_120._16_16_ = auVar161;
      local_120._0_16_ = auVar161;
      auVar123 = ZEXT3264(local_120);
      auVar275 = auVar281._0_32_;
      auVar278 = auVar291._0_32_;
      for (lVar107 = 8; lVar107 < (int)uVar10; lVar107 = lVar107 + 8) {
        pauVar1 = (undefined1 (*) [28])(catmullrom_basis0 + lVar107 * 4 + lVar104);
        fVar258 = *(float *)*pauVar1;
        fVar212 = *(float *)(*pauVar1 + 4);
        fVar171 = *(float *)(*pauVar1 + 8);
        fVar263 = *(float *)(*pauVar1 + 0xc);
        fVar222 = *(float *)(*pauVar1 + 0x10);
        fVar186 = *(float *)(*pauVar1 + 0x14);
        fVar265 = *(float *)(*pauVar1 + 0x18);
        auVar100 = *pauVar1;
        pauVar1 = (undefined1 (*) [28])(lVar104 + 0x22047f0 + lVar107 * 4);
        fVar225 = *(float *)*pauVar1;
        fVar187 = *(float *)(*pauVar1 + 4);
        fVar267 = *(float *)(*pauVar1 + 8);
        fVar228 = *(float *)(*pauVar1 + 0xc);
        fVar188 = *(float *)(*pauVar1 + 0x10);
        fVar297 = *(float *)(*pauVar1 + 0x14);
        fVar296 = *(float *)(*pauVar1 + 0x18);
        auVar99 = *pauVar1;
        pfVar3 = (float *)(lVar104 + 0x2204c74 + lVar107 * 4);
        fVar268 = *pfVar3;
        fVar269 = pfVar3[1];
        fVar191 = pfVar3[2];
        fVar257 = pfVar3[3];
        fVar270 = pfVar3[4];
        fVar271 = pfVar3[5];
        fVar192 = pfVar3[6];
        pauVar1 = (undefined1 (*) [28])(lVar104 + 0x22050f8 + lVar107 * 4);
        fVar259 = *(float *)*pauVar1;
        fVar189 = *(float *)(*pauVar1 + 4);
        fVar255 = *(float *)(*pauVar1 + 8);
        fVar264 = *(float *)(*pauVar1 + 0xc);
        fVar266 = *(float *)(*pauVar1 + 0x10);
        fVar190 = *(float *)(*pauVar1 + 0x14);
        fVar256 = *(float *)(*pauVar1 + 0x18);
        auVar98 = *pauVar1;
        fVar155 = auVar185._28_4_;
        fStack_884 = fVar155 + *(float *)pauVar1[1];
        fVar169 = auVar221._0_4_;
        fVar170 = auVar221._4_4_;
        fVar214 = auVar221._8_4_;
        fVar224 = auVar221._12_4_;
        fVar227 = auVar221._16_4_;
        fVar230 = auVar221._20_4_;
        fVar231 = auVar221._24_4_;
        fVar211 = fVar155 + fStack_884;
        local_8a0._0_4_ =
             fVar258 * (float)local_2a0._0_4_ +
             fVar287 * fVar225 + (float)local_560._0_4_ * fVar268 + (float)local_580._0_4_ * fVar259
        ;
        local_8a0._4_4_ =
             fVar212 * (float)local_2a0._4_4_ +
             fVar292 * fVar187 + (float)local_560._4_4_ * fVar269 + (float)local_580._4_4_ * fVar189
        ;
        fStack_898 = fVar171 * fStack_298 +
                     fVar293 * fVar267 + fStack_558 * fVar191 + fStack_578 * fVar255;
        fStack_894 = fVar263 * fStack_294 +
                     fVar294 * fVar228 + fStack_554 * fVar257 + fStack_574 * fVar264;
        fStack_890 = fVar222 * fStack_290 +
                     fVar287 * fVar188 + fStack_550 * fVar270 + fStack_570 * fVar266;
        fStack_88c = fVar186 * fStack_28c +
                     fVar292 * fVar297 + fStack_54c * fVar271 + fStack_56c * fVar190;
        fStack_888 = fVar265 * fStack_288 +
                     fVar293 * fVar296 + fStack_548 * fVar192 + fStack_568 * fVar256;
        fStack_884 = fStack_884 + fVar155 + fVar155 + auVar123._28_4_;
        auVar184._0_4_ =
             fVar169 * fVar225 + fVar213 * fVar268 + fVar137 * fVar259 +
             fVar258 * (float)local_4a0._0_4_;
        auVar184._4_4_ =
             fVar170 * fVar187 + fVar223 * fVar269 + fVar152 * fVar189 +
             fVar212 * (float)local_4a0._4_4_;
        auVar184._8_4_ =
             fVar214 * fVar267 + fVar226 * fVar191 + fVar153 * fVar255 + fVar171 * fStack_498;
        auVar184._12_4_ =
             fVar224 * fVar228 + fVar229 * fVar257 + fVar154 * fVar264 + fVar263 * fStack_494;
        auVar184._16_4_ =
             fVar227 * fVar188 + fVar213 * fVar270 + fVar137 * fVar266 + fVar222 * fStack_490;
        auVar184._20_4_ =
             fVar230 * fVar297 + fVar223 * fVar271 + fVar152 * fVar190 + fVar186 * fStack_48c;
        auVar184._24_4_ =
             fVar231 * fVar296 + fVar226 * fVar192 + fVar153 * fVar256 + fVar265 * fStack_488;
        auVar184._28_4_ = fVar155 + fVar155 + auVar151._28_4_ + fStack_884;
        fVar109 = fVar258 * (float)local_c0._0_4_ +
                  (float)local_a0._0_4_ * fVar225 +
                  (float)local_280._0_4_ * fVar268 + (float)local_80._0_4_ * fVar259;
        fVar125 = fVar212 * (float)local_c0._4_4_ +
                  (float)local_a0._4_4_ * fVar187 +
                  (float)local_280._4_4_ * fVar269 + (float)local_80._4_4_ * fVar189;
        fVar127 = fVar171 * fStack_b8 +
                  fStack_98 * fVar267 + fStack_278 * fVar191 + fStack_78 * fVar255;
        fVar129 = fVar263 * fStack_b4 +
                  fStack_94 * fVar228 + fStack_274 * fVar257 + fStack_74 * fVar264;
        fVar131 = fVar222 * fStack_b0 +
                  fStack_90 * fVar188 + fStack_270 * fVar270 + fStack_70 * fVar266;
        fVar133 = fVar186 * fStack_ac +
                  fStack_8c * fVar297 + fStack_26c * fVar271 + fStack_6c * fVar190;
        fVar134 = fVar265 * fStack_a8 +
                  fStack_88 * fVar296 + fStack_268 * fVar192 + fStack_68 * fVar256;
        fVar135 = fStack_884 + fVar211;
        pauVar2 = (undefined1 (*) [32])(catmullrom_basis1 + lVar107 * 4 + lVar104);
        auVar143 = *(undefined1 (*) [24])*pauVar2;
        pfVar3 = (float *)(lVar104 + 0x2206c10 + lVar107 * 4);
        fVar155 = *pfVar3;
        fVar286 = pfVar3[1];
        fVar124 = pfVar3[2];
        fVar126 = pfVar3[3];
        fVar128 = pfVar3[4];
        fVar130 = pfVar3[5];
        fVar132 = pfVar3[6];
        auVar149 = *(undefined1 (*) [32])(lVar104 + 0x2207094 + lVar107 * 4);
        auVar123 = ZEXT3264(auVar149);
        pfVar3 = (float *)(lVar104 + 0x2207518 + lVar107 * 4);
        fVar136 = *pfVar3;
        fVar232 = pfVar3[1];
        fVar241 = pfVar3[2];
        fVar244 = pfVar3[3];
        fVar246 = pfVar3[4];
        fVar247 = pfVar3[5];
        fVar248 = pfVar3[6];
        fVar258 = auVar149._0_4_;
        fVar263 = auVar149._4_4_;
        fVar265 = auVar149._8_4_;
        fVar267 = auVar149._12_4_;
        fVar297 = auVar149._16_4_;
        fVar189 = auVar149._20_4_;
        fVar266 = auVar149._24_4_;
        local_720._0_4_ = auVar143._0_4_;
        local_720._4_4_ = auVar143._4_4_;
        fStack_718 = auVar143._8_4_;
        fStack_714 = auVar143._12_4_;
        fStack_710 = auVar143._16_4_;
        fStack_70c = auVar143._20_4_;
        fStack_708 = (float)*(undefined8 *)(*pauVar2 + 0x18);
        fStack_704 = (float)((ulong)*(undefined8 *)(*pauVar2 + 0x18) >> 0x20);
        fVar171 = fVar154 + fVar154 + fVar211;
        local_700._0_4_ =
             (float)local_2a0._0_4_ * (float)local_720._0_4_ +
             fVar155 * fVar287 + (float)local_560._0_4_ * fVar258 + (float)local_580._0_4_ * fVar136
        ;
        local_700._4_4_ =
             (float)local_2a0._4_4_ * (float)local_720._4_4_ +
             fVar286 * fVar292 + (float)local_560._4_4_ * fVar263 + (float)local_580._4_4_ * fVar232
        ;
        local_700._8_4_ =
             fStack_298 * fStack_718 +
             fVar124 * fVar293 + fStack_558 * fVar265 + fStack_578 * fVar241;
        local_700._12_4_ =
             fStack_294 * fStack_714 +
             fVar126 * fVar294 + fStack_554 * fVar267 + fStack_574 * fVar244;
        local_700._16_4_ =
             fStack_290 * fStack_710 +
             fVar128 * fVar287 + fStack_550 * fVar297 + fStack_570 * fVar246;
        local_700._20_4_ =
             fStack_28c * fStack_70c +
             fVar130 * fVar292 + fStack_54c * fVar189 + fStack_56c * fVar247;
        local_700._24_4_ =
             fStack_288 * fStack_708 +
             fVar132 * fVar293 + fStack_548 * fVar266 + fStack_568 * fVar248;
        local_700._28_4_ = fVar294 + fVar171;
        local_660._0_4_ =
             (float)local_720._0_4_ * (float)local_4a0._0_4_ +
             fVar169 * fVar155 + fVar213 * fVar258 + fVar136 * fVar137;
        local_660._4_4_ =
             (float)local_720._4_4_ * (float)local_4a0._4_4_ +
             fVar170 * fVar286 + fVar223 * fVar263 + fVar232 * fVar152;
        local_660._8_4_ =
             fStack_718 * fStack_498 + fVar214 * fVar124 + fVar226 * fVar265 + fVar241 * fVar153;
        local_660._12_4_ =
             fStack_714 * fStack_494 + fVar224 * fVar126 + fVar229 * fVar267 + fVar244 * fVar154;
        local_660._16_4_ =
             fStack_710 * fStack_490 + fVar227 * fVar128 + fVar213 * fVar297 + fVar246 * fVar137;
        local_660._20_4_ =
             fStack_70c * fStack_48c + fVar230 * fVar130 + fVar223 * fVar189 + fVar247 * fVar152;
        local_660._24_4_ =
             fStack_708 * fStack_488 + fVar231 * fVar132 + fVar226 * fVar266 + fVar248 * fVar153;
        local_660._28_4_ = fVar171 + fVar154 + fVar154 + auVar221._28_4_;
        auVar166._0_4_ =
             (float)local_80._0_4_ * fVar136 + (float)local_280._0_4_ * fVar258 +
             (float)local_a0._0_4_ * fVar155 + (float)local_720._0_4_ * (float)local_c0._0_4_;
        auVar166._4_4_ =
             (float)local_80._4_4_ * fVar232 + (float)local_280._4_4_ * fVar263 +
             (float)local_a0._4_4_ * fVar286 + (float)local_720._4_4_ * (float)local_c0._4_4_;
        auVar166._8_4_ =
             fStack_78 * fVar241 + fStack_278 * fVar265 + fStack_98 * fVar124 +
             fStack_718 * fStack_b8;
        auVar166._12_4_ =
             fStack_74 * fVar244 + fStack_274 * fVar267 + fStack_94 * fVar126 +
             fStack_714 * fStack_b4;
        auVar166._16_4_ =
             fStack_70 * fVar246 + fStack_270 * fVar297 + fStack_90 * fVar128 +
             fStack_710 * fStack_b0;
        auVar166._20_4_ =
             fStack_6c * fVar247 + fStack_26c * fVar189 + fStack_8c * fVar130 +
             fStack_70c * fStack_ac;
        auVar166._24_4_ =
             fStack_68 * fVar248 + fStack_268 * fVar266 + fStack_88 * fVar132 +
             fStack_708 * fStack_a8;
        auVar166._28_4_ = fStack_64 + fVar154 + fVar154 + fVar171;
        auVar16 = vsubps_avx(local_700,_local_8a0);
        auVar17 = vsubps_avx(local_660,auVar184);
        auVar151 = ZEXT3264(auVar17);
        fVar212 = auVar16._0_4_;
        fVar222 = auVar16._4_4_;
        auVar51._4_4_ = auVar184._4_4_ * fVar222;
        auVar51._0_4_ = auVar184._0_4_ * fVar212;
        fVar225 = auVar16._8_4_;
        auVar51._8_4_ = auVar184._8_4_ * fVar225;
        fVar228 = auVar16._12_4_;
        auVar51._12_4_ = auVar184._12_4_ * fVar228;
        fVar296 = auVar16._16_4_;
        auVar51._16_4_ = auVar184._16_4_ * fVar296;
        fVar255 = auVar16._20_4_;
        auVar51._20_4_ = auVar184._20_4_ * fVar255;
        fVar190 = auVar16._24_4_;
        auVar51._24_4_ = auVar184._24_4_ * fVar190;
        auVar51._28_4_ = fVar171;
        fVar171 = auVar17._0_4_;
        fVar186 = auVar17._4_4_;
        auVar52._4_4_ = (float)local_8a0._4_4_ * fVar186;
        auVar52._0_4_ = (float)local_8a0._0_4_ * fVar171;
        fVar187 = auVar17._8_4_;
        auVar52._8_4_ = fStack_898 * fVar187;
        fVar188 = auVar17._12_4_;
        auVar52._12_4_ = fStack_894 * fVar188;
        fVar259 = auVar17._16_4_;
        auVar52._16_4_ = fStack_890 * fVar259;
        fVar264 = auVar17._20_4_;
        auVar52._20_4_ = fStack_88c * fVar264;
        fVar256 = auVar17._24_4_;
        auVar52._24_4_ = fStack_888 * fVar256;
        auVar52._28_4_ = local_660._28_4_;
        auVar24 = vsubps_avx(auVar51,auVar52);
        auVar94._4_4_ = fVar125;
        auVar94._0_4_ = fVar109;
        auVar94._8_4_ = fVar127;
        auVar94._12_4_ = fVar129;
        auVar94._16_4_ = fVar131;
        auVar94._20_4_ = fVar133;
        auVar94._24_4_ = fVar134;
        auVar94._28_4_ = fVar135;
        auVar185 = ZEXT3264(auVar94);
        auVar18 = vmaxps_avx(auVar94,auVar166);
        auVar53._4_4_ = auVar18._4_4_ * auVar18._4_4_ * (fVar222 * fVar222 + fVar186 * fVar186);
        auVar53._0_4_ = auVar18._0_4_ * auVar18._0_4_ * (fVar212 * fVar212 + fVar171 * fVar171);
        auVar53._8_4_ = auVar18._8_4_ * auVar18._8_4_ * (fVar225 * fVar225 + fVar187 * fVar187);
        auVar53._12_4_ = auVar18._12_4_ * auVar18._12_4_ * (fVar228 * fVar228 + fVar188 * fVar188);
        auVar53._16_4_ = auVar18._16_4_ * auVar18._16_4_ * (fVar296 * fVar296 + fVar259 * fVar259);
        auVar53._20_4_ = auVar18._20_4_ * auVar18._20_4_ * (fVar255 * fVar255 + fVar264 * fVar264);
        auVar53._24_4_ = auVar18._24_4_ * auVar18._24_4_ * (fVar190 * fVar190 + fVar256 * fVar256);
        auVar53._28_4_ = local_700._28_4_ + local_660._28_4_;
        auVar54._4_4_ = auVar24._4_4_ * auVar24._4_4_;
        auVar54._0_4_ = auVar24._0_4_ * auVar24._0_4_;
        auVar54._8_4_ = auVar24._8_4_ * auVar24._8_4_;
        auVar54._12_4_ = auVar24._12_4_ * auVar24._12_4_;
        auVar54._16_4_ = auVar24._16_4_ * auVar24._16_4_;
        auVar54._20_4_ = auVar24._20_4_ * auVar24._20_4_;
        auVar54._24_4_ = auVar24._24_4_ * auVar24._24_4_;
        auVar54._28_4_ = auVar24._28_4_;
        auVar18 = vcmpps_avx(auVar54,auVar53,2);
        local_3e0 = (uint)lVar107;
        auVar176 = vpshufd_avx(ZEXT416(local_3e0),0);
        auVar161 = vpor_avx(auVar176,_DAT_01f4ad30);
        auVar176 = vpor_avx(auVar176,_DAT_01f7afa0);
        auVar161 = vpcmpgtd_avx(_local_5e0,auVar161);
        auVar176 = vpcmpgtd_avx(_local_5e0,auVar176);
        register0x00001290 = auVar176;
        _local_600 = auVar161;
        auVar24 = _local_600 & auVar18;
        if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar24 >> 0x7f,0) == '\0') &&
              (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar24 >> 0xbf,0) == '\0') &&
            (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar24[0x1f]) {
          auVar221 = ZEXT3264(auVar221._0_32_);
          _local_720 = *pauVar2;
        }
        else {
          local_4c0 = (float)local_720._0_4_ * (float)local_2c0._0_4_ +
                      fVar155 * (float)local_480._0_4_ +
                      (float)local_e0._0_4_ * fVar258 + fVar136 * (float)local_5c0._0_4_;
          fStack_4bc = (float)local_720._4_4_ * (float)local_2c0._4_4_ +
                       fVar286 * (float)local_480._4_4_ +
                       (float)local_e0._4_4_ * fVar263 + fVar232 * (float)local_5c0._4_4_;
          fStack_4b8 = fStack_718 * fStack_2b8 +
                       fVar124 * fStack_478 + fStack_d8 * fVar265 + fVar241 * fStack_5b8;
          fStack_4b4 = fStack_714 * fStack_2b4 +
                       fVar126 * fStack_474 + fStack_d4 * fVar267 + fVar244 * fStack_5b4;
          fStack_4b0 = fStack_710 * fStack_2b0 +
                       fVar128 * fStack_470 + fStack_d0 * fVar297 + fVar246 * fStack_5b0;
          fStack_4ac = fStack_70c * fStack_2ac +
                       fVar130 * fStack_46c + fStack_cc * fVar189 + fVar247 * fStack_5ac;
          fStack_4a8 = fStack_708 * fStack_2a8 +
                       fVar132 * fStack_468 + fStack_c8 * fVar266 + fVar248 * fStack_5a8;
          fStack_4a4 = fStack_704 + auVar149._28_4_ + auVar17._28_4_ + 0.0;
          local_740._0_4_ = auVar99._0_4_;
          local_740._4_4_ = auVar99._4_4_;
          fStack_738 = auVar99._8_4_;
          fStack_734 = auVar99._12_4_;
          fStack_730 = auVar99._16_4_;
          fStack_72c = auVar99._20_4_;
          fStack_728 = auVar99._24_4_;
          local_6c0._0_4_ = auVar98._0_4_;
          local_6c0._4_4_ = auVar98._4_4_;
          fStack_6b8 = auVar98._8_4_;
          fStack_6b4 = auVar98._12_4_;
          fStack_6b0 = auVar98._16_4_;
          fStack_6ac = auVar98._20_4_;
          fStack_6a8 = auVar98._24_4_;
          fVar232 = (float)local_5c0._0_4_ * (float)local_6c0._0_4_;
          fVar241 = (float)local_5c0._4_4_ * (float)local_6c0._4_4_;
          fVar244 = fStack_5b8 * fStack_6b8;
          fVar246 = fStack_5b4 * fStack_6b4;
          fVar247 = fStack_5b0 * fStack_6b0;
          fVar248 = fStack_5ac * fStack_6ac;
          fVar211 = fStack_5a8 * fStack_6a8;
          pfVar4 = (float *)(lVar104 + 0x2205e84 + lVar107 * 4);
          fVar258 = *pfVar4;
          fVar212 = pfVar4[1];
          fVar171 = pfVar4[2];
          fVar263 = pfVar4[3];
          fVar222 = pfVar4[4];
          fVar186 = pfVar4[5];
          fVar265 = pfVar4[6];
          pfVar5 = (float *)(lVar104 + 0x2206308 + lVar107 * 4);
          fVar225 = *pfVar5;
          fVar187 = pfVar5[1];
          fVar267 = pfVar5[2];
          fVar228 = pfVar5[3];
          fVar188 = pfVar5[4];
          fVar297 = pfVar5[5];
          fVar296 = pfVar5[6];
          fVar249 = pfVar3[7] + 0.0;
          pfVar6 = (float *)(lVar104 + 0x2205a00 + lVar107 * 4);
          fVar259 = *pfVar6;
          fVar189 = pfVar6[1];
          fVar255 = pfVar6[2];
          fVar264 = pfVar6[3];
          fVar266 = pfVar6[4];
          fVar190 = pfVar6[5];
          fVar256 = pfVar6[6];
          fVar136 = pfVar4[7] + pfVar5[7];
          fStack_6a4 = pfVar5[7] + fVar249;
          fVar249 = pfVar3[7] + fStack_884 + fVar249;
          pfVar3 = (float *)(lVar104 + 0x220557c + lVar107 * 4);
          fVar155 = *pfVar3;
          fVar286 = pfVar3[1];
          fVar124 = pfVar3[2];
          fVar126 = pfVar3[3];
          fVar128 = pfVar3[4];
          fVar130 = pfVar3[5];
          fVar132 = pfVar3[6];
          local_6a0 = (float)local_2a0._0_4_ * fVar155 +
                      fVar259 * fVar287 +
                      (float)local_560._0_4_ * fVar258 + (float)local_580._0_4_ * fVar225;
          fStack_69c = (float)local_2a0._4_4_ * fVar286 +
                       fVar189 * fVar292 +
                       (float)local_560._4_4_ * fVar212 + (float)local_580._4_4_ * fVar187;
          fStack_698 = fStack_298 * fVar124 +
                       fVar255 * fVar293 + fStack_558 * fVar171 + fStack_578 * fVar267;
          fStack_694 = fStack_294 * fVar126 +
                       fVar264 * fVar294 + fStack_554 * fVar263 + fStack_574 * fVar228;
          fStack_690 = fStack_290 * fVar128 +
                       fVar266 * fVar287 + fStack_550 * fVar222 + fStack_570 * fVar188;
          fStack_68c = fStack_28c * fVar130 +
                       fVar190 * fVar292 + fStack_54c * fVar186 + fStack_56c * fVar297;
          fStack_688 = fStack_288 * fVar132 +
                       fVar256 * fVar293 + fStack_548 * fVar265 + fStack_568 * fVar296;
          fStack_684 = fVar136 + fStack_6a4;
          fStack_6a4 = fStack_6a4 + fVar249;
          local_6c0._4_4_ =
               fVar286 * (float)local_4a0._4_4_ +
               fVar223 * fVar212 + fVar152 * fVar187 + fVar170 * fVar189;
          local_6c0._0_4_ =
               fVar155 * (float)local_4a0._0_4_ +
               fVar213 * fVar258 + fVar137 * fVar225 + fVar169 * fVar259;
          fStack_6b8 = fVar124 * fStack_498 +
                       fVar226 * fVar171 + fVar153 * fVar267 + fVar214 * fVar255;
          fStack_6b4 = fVar126 * fStack_494 +
                       fVar229 * fVar263 + fVar154 * fVar228 + fVar224 * fVar264;
          fStack_6b0 = fVar128 * fStack_490 +
                       fVar213 * fVar222 + fVar137 * fVar188 + fVar227 * fVar266;
          fStack_6ac = fVar130 * fStack_48c +
                       fVar223 * fVar186 + fVar152 * fVar297 + fVar230 * fVar190;
          fStack_6a8 = fVar132 * fStack_488 +
                       fVar226 * fVar265 + fVar153 * fVar296 + fVar231 * fVar256;
          auVar307._0_4_ =
               fVar259 * (float)local_480._0_4_ +
               (float)local_e0._0_4_ * fVar258 + (float)local_5c0._0_4_ * fVar225 +
               fVar155 * (float)local_2c0._0_4_;
          auVar307._4_4_ =
               fVar189 * (float)local_480._4_4_ +
               (float)local_e0._4_4_ * fVar212 + (float)local_5c0._4_4_ * fVar187 +
               fVar286 * (float)local_2c0._4_4_;
          auVar307._8_4_ =
               fVar255 * fStack_478 + fStack_d8 * fVar171 + fStack_5b8 * fVar267 +
               fVar124 * fStack_2b8;
          auVar307._12_4_ =
               fVar264 * fStack_474 + fStack_d4 * fVar263 + fStack_5b4 * fVar228 +
               fVar126 * fStack_2b4;
          auVar307._16_4_ =
               fVar266 * fStack_470 + fStack_d0 * fVar222 + fStack_5b0 * fVar188 +
               fVar128 * fStack_2b0;
          auVar307._20_4_ =
               fVar190 * fStack_46c + fStack_cc * fVar186 + fStack_5ac * fVar297 +
               fVar130 * fStack_2ac;
          auVar307._24_4_ =
               fVar256 * fStack_468 + fStack_c8 * fVar265 + fStack_5a8 * fVar296 +
               fVar132 * fStack_2a8;
          auVar307._28_4_ = pfVar6[7] + fVar136 + fVar249;
          pfVar3 = (float *)(lVar104 + 0x22082a4 + lVar107 * 4);
          fVar258 = *pfVar3;
          fVar212 = pfVar3[1];
          fVar171 = pfVar3[2];
          fVar263 = pfVar3[3];
          fVar222 = pfVar3[4];
          fVar186 = pfVar3[5];
          fVar265 = pfVar3[6];
          pfVar4 = (float *)(lVar104 + 0x2208728 + lVar107 * 4);
          fVar225 = *pfVar4;
          fVar187 = pfVar4[1];
          fVar267 = pfVar4[2];
          fVar228 = pfVar4[3];
          fVar188 = pfVar4[4];
          fVar297 = pfVar4[5];
          fVar296 = pfVar4[6];
          pfVar5 = (float *)(lVar104 + 0x2207e20 + lVar107 * 4);
          fVar259 = *pfVar5;
          fVar189 = pfVar5[1];
          fVar255 = pfVar5[2];
          fVar264 = pfVar5[3];
          fVar266 = pfVar5[4];
          fVar190 = pfVar5[5];
          fVar256 = pfVar5[6];
          pfVar6 = (float *)(lVar104 + 0x220799c + lVar107 * 4);
          fVar155 = *pfVar6;
          fVar286 = pfVar6[1];
          fVar124 = pfVar6[2];
          fVar126 = pfVar6[3];
          fVar128 = pfVar6[4];
          fVar130 = pfVar6[5];
          fVar132 = pfVar6[6];
          auVar279._0_4_ =
               (float)local_2a0._0_4_ * fVar155 +
               fVar259 * fVar287 +
               (float)local_560._0_4_ * fVar258 + (float)local_580._0_4_ * fVar225;
          auVar279._4_4_ =
               (float)local_2a0._4_4_ * fVar286 +
               fVar189 * fVar292 +
               (float)local_560._4_4_ * fVar212 + (float)local_580._4_4_ * fVar187;
          auVar279._8_4_ =
               fStack_298 * fVar124 +
               fVar255 * fVar293 + fStack_558 * fVar171 + fStack_578 * fVar267;
          auVar279._12_4_ =
               fStack_294 * fVar126 +
               fVar264 * fVar294 + fStack_554 * fVar263 + fStack_574 * fVar228;
          auVar279._16_4_ =
               fStack_290 * fVar128 +
               fVar266 * fVar287 + fStack_550 * fVar222 + fStack_570 * fVar188;
          auVar279._20_4_ =
               fStack_28c * fVar130 +
               fVar190 * fVar292 + fStack_54c * fVar186 + fStack_56c * fVar297;
          auVar279._24_4_ =
               fStack_288 * fVar132 +
               fVar256 * fVar293 + fStack_548 * fVar265 + fStack_568 * fVar296;
          auVar279._28_4_ = fVar154 + fVar154 + auVar221._28_4_ + fStack_564;
          auVar303._0_4_ =
               fVar155 * (float)local_4a0._0_4_ +
               fVar259 * fVar193 + fVar213 * fVar258 + fVar137 * fVar225;
          auVar303._4_4_ =
               fVar286 * (float)local_4a0._4_4_ +
               fVar189 * fVar205 + fVar223 * fVar212 + fVar152 * fVar187;
          auVar303._8_4_ =
               fVar124 * fStack_498 + fVar255 * fVar207 + fVar226 * fVar171 + fVar153 * fVar267;
          auVar303._12_4_ =
               fVar126 * fStack_494 + fVar264 * fVar209 + fVar229 * fVar263 + fVar154 * fVar228;
          auVar303._16_4_ =
               fVar128 * fStack_490 + fVar266 * fVar193 + fVar213 * fVar222 + fVar137 * fVar188;
          auVar303._20_4_ =
               fVar130 * fStack_48c + fVar190 * fVar205 + fVar223 * fVar186 + fVar152 * fVar297;
          auVar303._24_4_ =
               fVar132 * fStack_488 + fVar256 * fVar207 + fVar226 * fVar265 + fVar153 * fVar296;
          auVar303._28_4_ = fVar154 + fVar154 + fStack_284 + fVar154;
          auVar220._8_4_ = 0x7fffffff;
          auVar220._0_8_ = 0x7fffffff7fffffff;
          auVar220._12_4_ = 0x7fffffff;
          auVar220._16_4_ = 0x7fffffff;
          auVar220._20_4_ = 0x7fffffff;
          auVar220._24_4_ = 0x7fffffff;
          auVar220._28_4_ = 0x7fffffff;
          auVar96._4_4_ = fStack_69c;
          auVar96._0_4_ = local_6a0;
          auVar96._8_4_ = fStack_698;
          auVar96._12_4_ = fStack_694;
          auVar96._16_4_ = fStack_690;
          auVar96._20_4_ = fStack_68c;
          auVar96._24_4_ = fStack_688;
          auVar96._28_4_ = fStack_684;
          auVar149 = vandps_avx(auVar96,auVar220);
          auVar24 = vandps_avx(_local_6c0,auVar220);
          auVar24 = vmaxps_avx(auVar149,auVar24);
          auVar149 = vandps_avx(auVar307,auVar220);
          auVar24 = vmaxps_avx(auVar24,auVar149);
          auVar24 = vcmpps_avx(auVar24,local_4e0,1);
          auVar13 = vblendvps_avx(auVar96,auVar16,auVar24);
          auVar119._0_4_ =
               fVar155 * (float)local_2c0._0_4_ +
               fVar259 * (float)local_480._0_4_ +
               fVar225 * (float)local_5c0._0_4_ + (float)local_e0._0_4_ * fVar258;
          auVar119._4_4_ =
               fVar286 * (float)local_2c0._4_4_ +
               fVar189 * (float)local_480._4_4_ +
               fVar187 * (float)local_5c0._4_4_ + (float)local_e0._4_4_ * fVar212;
          auVar119._8_4_ =
               fVar124 * fStack_2b8 +
               fVar255 * fStack_478 + fVar267 * fStack_5b8 + fStack_d8 * fVar171;
          auVar119._12_4_ =
               fVar126 * fStack_2b4 +
               fVar264 * fStack_474 + fVar228 * fStack_5b4 + fStack_d4 * fVar263;
          auVar119._16_4_ =
               fVar128 * fStack_2b0 +
               fVar266 * fStack_470 + fVar188 * fStack_5b0 + fStack_d0 * fVar222;
          auVar119._20_4_ =
               fVar130 * fStack_2ac +
               fVar190 * fStack_46c + fVar297 * fStack_5ac + fStack_cc * fVar186;
          auVar119._24_4_ =
               fVar132 * fStack_2a8 +
               fVar256 * fStack_468 + fVar296 * fStack_5a8 + fStack_c8 * fVar265;
          auVar119._28_4_ = auVar149._28_4_ + pfVar5[7] + pfVar4[7] + pfVar3[7];
          auVar179 = vblendvps_avx(_local_6c0,auVar17,auVar24);
          auVar149 = vandps_avx(auVar279,auVar220);
          auVar24 = vandps_avx(auVar303,auVar220);
          auVar180 = vmaxps_avx(auVar149,auVar24);
          auVar149 = vandps_avx(auVar119,auVar220);
          auVar149 = vmaxps_avx(auVar180,auVar149);
          local_680._0_4_ = auVar100._0_4_;
          local_680._4_4_ = auVar100._4_4_;
          uStack_678._0_4_ = auVar100._8_4_;
          uStack_678._4_4_ = auVar100._12_4_;
          uStack_670._0_4_ = auVar100._16_4_;
          uStack_670._4_4_ = auVar100._20_4_;
          uStack_668._0_4_ = auVar100._24_4_;
          auVar24 = vcmpps_avx(auVar149,local_4e0,1);
          auVar149 = vblendvps_avx(auVar279,auVar16,auVar24);
          auVar120._0_4_ =
               (float)local_2c0._0_4_ * (float)local_680._0_4_ +
               (float)local_480._0_4_ * (float)local_740._0_4_ +
               (float)local_e0._0_4_ * fVar268 + fVar232;
          auVar120._4_4_ =
               (float)local_2c0._4_4_ * (float)local_680._4_4_ +
               (float)local_480._4_4_ * (float)local_740._4_4_ +
               (float)local_e0._4_4_ * fVar269 + fVar241;
          auVar120._8_4_ =
               fStack_2b8 * (float)uStack_678 +
               fStack_478 * fStack_738 + fStack_d8 * fVar191 + fVar244;
          auVar120._12_4_ =
               fStack_2b4 * uStack_678._4_4_ +
               fStack_474 * fStack_734 + fStack_d4 * fVar257 + fVar246;
          auVar120._16_4_ =
               fStack_2b0 * (float)uStack_670 +
               fStack_470 * fStack_730 + fStack_d0 * fVar270 + fVar247;
          auVar120._20_4_ =
               fStack_2ac * uStack_670._4_4_ +
               fStack_46c * fStack_72c + fStack_cc * fVar271 + fVar248;
          auVar120._24_4_ =
               fStack_2a8 * (float)uStack_668 +
               fStack_468 * fStack_728 + fStack_c8 * fVar192 + fVar211;
          auVar120._28_4_ = auVar180._28_4_ + fStack_4a4 + auVar17._28_4_ + 0.0;
          auVar16 = vblendvps_avx(auVar303,auVar17,auVar24);
          fVar136 = auVar13._0_4_;
          fVar232 = auVar13._4_4_;
          fVar241 = auVar13._8_4_;
          fVar244 = auVar13._12_4_;
          fVar246 = auVar13._16_4_;
          fVar247 = auVar13._20_4_;
          fVar248 = auVar13._24_4_;
          fVar211 = auVar13._28_4_;
          fVar259 = auVar149._0_4_;
          fVar255 = auVar149._4_4_;
          fVar266 = auVar149._8_4_;
          fVar256 = auVar149._12_4_;
          fVar269 = auVar149._16_4_;
          fVar257 = auVar149._20_4_;
          fVar271 = auVar149._24_4_;
          fVar258 = auVar179._0_4_;
          fVar171 = auVar179._4_4_;
          fVar222 = auVar179._8_4_;
          fVar265 = auVar179._12_4_;
          fVar187 = auVar179._16_4_;
          fVar228 = auVar179._20_4_;
          fVar297 = auVar179._24_4_;
          auVar289._0_4_ = fVar258 * fVar258 + fVar136 * fVar136;
          auVar289._4_4_ = fVar171 * fVar171 + fVar232 * fVar232;
          auVar289._8_4_ = fVar222 * fVar222 + fVar241 * fVar241;
          auVar289._12_4_ = fVar265 * fVar265 + fVar244 * fVar244;
          auVar289._16_4_ = fVar187 * fVar187 + fVar246 * fVar246;
          auVar289._20_4_ = fVar228 * fVar228 + fVar247 * fVar247;
          auVar289._24_4_ = fVar297 * fVar297 + fVar248 * fVar248;
          auVar289._28_4_ = fStack_544 + fStack_6a4;
          auVar24 = vrsqrtps_avx(auVar289);
          fVar212 = auVar24._0_4_;
          fVar263 = auVar24._4_4_;
          auVar55._4_4_ = fVar263 * 1.5;
          auVar55._0_4_ = fVar212 * 1.5;
          fVar186 = auVar24._8_4_;
          auVar55._8_4_ = fVar186 * 1.5;
          fVar225 = auVar24._12_4_;
          auVar55._12_4_ = fVar225 * 1.5;
          fVar267 = auVar24._16_4_;
          auVar55._16_4_ = fVar267 * 1.5;
          fVar188 = auVar24._20_4_;
          auVar55._20_4_ = fVar188 * 1.5;
          fVar296 = auVar24._24_4_;
          auVar55._24_4_ = fVar296 * 1.5;
          auVar55._28_4_ = auVar303._28_4_;
          auVar56._4_4_ = fVar263 * fVar263 * fVar263 * auVar289._4_4_ * 0.5;
          auVar56._0_4_ = fVar212 * fVar212 * fVar212 * auVar289._0_4_ * 0.5;
          auVar56._8_4_ = fVar186 * fVar186 * fVar186 * auVar289._8_4_ * 0.5;
          auVar56._12_4_ = fVar225 * fVar225 * fVar225 * auVar289._12_4_ * 0.5;
          auVar56._16_4_ = fVar267 * fVar267 * fVar267 * auVar289._16_4_ * 0.5;
          auVar56._20_4_ = fVar188 * fVar188 * fVar188 * auVar289._20_4_ * 0.5;
          auVar56._24_4_ = fVar296 * fVar296 * fVar296 * auVar289._24_4_ * 0.5;
          auVar56._28_4_ = auVar289._28_4_;
          auVar13 = vsubps_avx(auVar55,auVar56);
          fVar155 = auVar13._0_4_;
          fVar286 = auVar13._4_4_;
          fVar124 = auVar13._8_4_;
          fVar126 = auVar13._12_4_;
          fVar128 = auVar13._16_4_;
          fVar130 = auVar13._20_4_;
          fVar132 = auVar13._24_4_;
          fVar212 = auVar16._0_4_;
          fVar263 = auVar16._4_4_;
          fVar186 = auVar16._8_4_;
          fVar225 = auVar16._12_4_;
          fVar267 = auVar16._16_4_;
          fVar188 = auVar16._20_4_;
          fVar296 = auVar16._24_4_;
          auVar262._0_4_ = fVar212 * fVar212 + fVar259 * fVar259;
          auVar262._4_4_ = fVar263 * fVar263 + fVar255 * fVar255;
          auVar262._8_4_ = fVar186 * fVar186 + fVar266 * fVar266;
          auVar262._12_4_ = fVar225 * fVar225 + fVar256 * fVar256;
          auVar262._16_4_ = fVar267 * fVar267 + fVar269 * fVar269;
          auVar262._20_4_ = fVar188 * fVar188 + fVar257 * fVar257;
          auVar262._24_4_ = fVar296 * fVar296 + fVar271 * fVar271;
          auVar262._28_4_ = auVar24._28_4_ + auVar149._28_4_;
          auVar149 = vrsqrtps_avx(auVar262);
          fVar189 = auVar149._0_4_;
          fVar264 = auVar149._4_4_;
          auVar57._4_4_ = fVar264 * 1.5;
          auVar57._0_4_ = fVar189 * 1.5;
          fVar190 = auVar149._8_4_;
          auVar57._8_4_ = fVar190 * 1.5;
          fVar268 = auVar149._12_4_;
          auVar57._12_4_ = fVar268 * 1.5;
          fVar191 = auVar149._16_4_;
          auVar57._16_4_ = fVar191 * 1.5;
          fVar270 = auVar149._20_4_;
          auVar57._20_4_ = fVar270 * 1.5;
          fVar192 = auVar149._24_4_;
          auVar57._24_4_ = fVar192 * 1.5;
          auVar57._28_4_ = auVar303._28_4_;
          auVar58._4_4_ = fVar264 * fVar264 * fVar264 * auVar262._4_4_ * 0.5;
          auVar58._0_4_ = fVar189 * fVar189 * fVar189 * auVar262._0_4_ * 0.5;
          auVar58._8_4_ = fVar190 * fVar190 * fVar190 * auVar262._8_4_ * 0.5;
          auVar58._12_4_ = fVar268 * fVar268 * fVar268 * auVar262._12_4_ * 0.5;
          auVar58._16_4_ = fVar191 * fVar191 * fVar191 * auVar262._16_4_ * 0.5;
          auVar58._20_4_ = fVar270 * fVar270 * fVar270 * auVar262._20_4_ * 0.5;
          auVar58._24_4_ = fVar192 * fVar192 * fVar192 * auVar262._24_4_ * 0.5;
          auVar58._28_4_ = auVar262._28_4_;
          auVar16 = vsubps_avx(auVar57,auVar58);
          fVar189 = auVar16._0_4_;
          fVar264 = auVar16._4_4_;
          fVar190 = auVar16._8_4_;
          fVar268 = auVar16._12_4_;
          fVar191 = auVar16._16_4_;
          fVar270 = auVar16._20_4_;
          fVar192 = auVar16._24_4_;
          fVar258 = fVar109 * fVar155 * fVar258;
          fVar171 = fVar125 * fVar286 * fVar171;
          auVar59._4_4_ = fVar171;
          auVar59._0_4_ = fVar258;
          fVar222 = fVar127 * fVar124 * fVar222;
          auVar59._8_4_ = fVar222;
          fVar265 = fVar129 * fVar126 * fVar265;
          auVar59._12_4_ = fVar265;
          fVar187 = fVar131 * fVar128 * fVar187;
          auVar59._16_4_ = fVar187;
          fVar228 = fVar133 * fVar130 * fVar228;
          auVar59._20_4_ = fVar228;
          fVar297 = fVar134 * fVar132 * fVar297;
          auVar59._24_4_ = fVar297;
          auVar59._28_4_ = auVar149._28_4_;
          local_680._4_4_ = fVar171 + (float)local_8a0._4_4_;
          local_680._0_4_ = fVar258 + (float)local_8a0._0_4_;
          uStack_678._0_4_ = fVar222 + fStack_898;
          uStack_678._4_4_ = fVar265 + fStack_894;
          uStack_670._0_4_ = fVar187 + fStack_890;
          uStack_670._4_4_ = fVar228 + fStack_88c;
          uStack_668._0_4_ = fVar297 + fStack_888;
          uStack_668._4_4_ = auVar149._28_4_ + fStack_884;
          fVar258 = fVar109 * fVar155 * -fVar136;
          fVar171 = fVar125 * fVar286 * -fVar232;
          auVar60._4_4_ = fVar171;
          auVar60._0_4_ = fVar258;
          fVar222 = fVar127 * fVar124 * -fVar241;
          auVar60._8_4_ = fVar222;
          fVar265 = fVar129 * fVar126 * -fVar244;
          auVar60._12_4_ = fVar265;
          fVar187 = fVar131 * fVar128 * -fVar246;
          auVar60._16_4_ = fVar187;
          fVar228 = fVar133 * fVar130 * -fVar247;
          auVar60._20_4_ = fVar228;
          fVar297 = fVar134 * fVar132 * -fVar248;
          auVar60._24_4_ = fVar297;
          auVar60._28_4_ = -fVar211;
          local_740._4_4_ = auVar184._4_4_ + fVar171;
          local_740._0_4_ = auVar184._0_4_ + fVar258;
          fStack_738 = auVar184._8_4_ + fVar222;
          fStack_734 = auVar184._12_4_ + fVar265;
          fStack_730 = auVar184._16_4_ + fVar187;
          fStack_72c = auVar184._20_4_ + fVar228;
          fStack_728 = auVar184._24_4_ + fVar297;
          fStack_724 = auVar184._28_4_ + -fVar211;
          fVar258 = fVar155 * 0.0 * fVar109;
          fVar171 = fVar286 * 0.0 * fVar125;
          auVar61._4_4_ = fVar171;
          auVar61._0_4_ = fVar258;
          fVar222 = fVar124 * 0.0 * fVar127;
          auVar61._8_4_ = fVar222;
          fVar265 = fVar126 * 0.0 * fVar129;
          auVar61._12_4_ = fVar265;
          fVar187 = fVar128 * 0.0 * fVar131;
          auVar61._16_4_ = fVar187;
          fVar228 = fVar130 * 0.0 * fVar133;
          auVar61._20_4_ = fVar228;
          fVar297 = fVar132 * 0.0 * fVar134;
          auVar61._24_4_ = fVar297;
          auVar61._28_4_ = fVar211;
          auVar149 = vsubps_avx(_local_8a0,auVar59);
          auVar319._0_4_ = fVar258 + auVar120._0_4_;
          auVar319._4_4_ = fVar171 + auVar120._4_4_;
          auVar319._8_4_ = fVar222 + auVar120._8_4_;
          auVar319._12_4_ = fVar265 + auVar120._12_4_;
          auVar319._16_4_ = fVar187 + auVar120._16_4_;
          auVar319._20_4_ = fVar228 + auVar120._20_4_;
          auVar319._24_4_ = fVar297 + auVar120._24_4_;
          auVar319._28_4_ = fVar211 + auVar120._28_4_;
          fVar258 = auVar166._0_4_ * fVar189 * fVar212;
          fVar212 = auVar166._4_4_ * fVar264 * fVar263;
          auVar62._4_4_ = fVar212;
          auVar62._0_4_ = fVar258;
          fVar171 = auVar166._8_4_ * fVar190 * fVar186;
          auVar62._8_4_ = fVar171;
          fVar263 = auVar166._12_4_ * fVar268 * fVar225;
          auVar62._12_4_ = fVar263;
          fVar222 = auVar166._16_4_ * fVar191 * fVar267;
          auVar62._16_4_ = fVar222;
          fVar186 = auVar166._20_4_ * fVar270 * fVar188;
          auVar62._20_4_ = fVar186;
          fVar265 = auVar166._24_4_ * fVar192 * fVar296;
          auVar62._24_4_ = fVar265;
          auVar62._28_4_ = fStack_884;
          auVar19 = vsubps_avx(auVar184,auVar60);
          auVar308._0_4_ = (float)local_700._0_4_ + fVar258;
          auVar308._4_4_ = local_700._4_4_ + fVar212;
          auVar308._8_4_ = local_700._8_4_ + fVar171;
          auVar308._12_4_ = local_700._12_4_ + fVar263;
          auVar308._16_4_ = local_700._16_4_ + fVar222;
          auVar308._20_4_ = local_700._20_4_ + fVar186;
          auVar308._24_4_ = local_700._24_4_ + fVar265;
          auVar308._28_4_ = local_700._28_4_ + fStack_884;
          fVar258 = fVar189 * -fVar259 * auVar166._0_4_;
          fVar212 = fVar264 * -fVar255 * auVar166._4_4_;
          auVar63._4_4_ = fVar212;
          auVar63._0_4_ = fVar258;
          fVar171 = fVar190 * -fVar266 * auVar166._8_4_;
          auVar63._8_4_ = fVar171;
          fVar263 = fVar268 * -fVar256 * auVar166._12_4_;
          auVar63._12_4_ = fVar263;
          fVar222 = fVar191 * -fVar269 * auVar166._16_4_;
          auVar63._16_4_ = fVar222;
          fVar186 = fVar270 * -fVar257 * auVar166._20_4_;
          auVar63._20_4_ = fVar186;
          fVar265 = fVar192 * -fVar271 * auVar166._24_4_;
          auVar63._24_4_ = fVar265;
          auVar63._28_4_ = fVar135;
          auVar20 = vsubps_avx(auVar120,auVar61);
          auVar203._0_4_ = local_660._0_4_ + fVar258;
          auVar203._4_4_ = local_660._4_4_ + fVar212;
          auVar203._8_4_ = local_660._8_4_ + fVar171;
          auVar203._12_4_ = local_660._12_4_ + fVar263;
          auVar203._16_4_ = local_660._16_4_ + fVar222;
          auVar203._20_4_ = local_660._20_4_ + fVar186;
          auVar203._24_4_ = local_660._24_4_ + fVar265;
          auVar203._28_4_ = local_660._28_4_ + fVar135;
          fVar258 = fVar189 * 0.0 * auVar166._0_4_;
          fVar212 = fVar264 * 0.0 * auVar166._4_4_;
          auVar64._4_4_ = fVar212;
          auVar64._0_4_ = fVar258;
          fVar171 = fVar190 * 0.0 * auVar166._8_4_;
          auVar64._8_4_ = fVar171;
          fVar263 = fVar268 * 0.0 * auVar166._12_4_;
          auVar64._12_4_ = fVar263;
          fVar222 = fVar191 * 0.0 * auVar166._16_4_;
          auVar64._16_4_ = fVar222;
          fVar186 = fVar270 * 0.0 * auVar166._20_4_;
          auVar64._20_4_ = fVar186;
          fVar265 = fVar192 * 0.0 * auVar166._24_4_;
          auVar64._24_4_ = fVar265;
          auVar64._28_4_ = auVar120._28_4_;
          auVar24 = vsubps_avx(local_700,auVar62);
          auVar97._4_4_ = fStack_4bc;
          auVar97._0_4_ = local_4c0;
          auVar97._8_4_ = fStack_4b8;
          auVar97._12_4_ = fStack_4b4;
          auVar97._16_4_ = fStack_4b0;
          auVar97._20_4_ = fStack_4ac;
          auVar97._24_4_ = fStack_4a8;
          auVar97._28_4_ = fStack_4a4;
          auVar280._0_4_ = local_4c0 + fVar258;
          auVar280._4_4_ = fStack_4bc + fVar212;
          auVar280._8_4_ = fStack_4b8 + fVar171;
          auVar280._12_4_ = fStack_4b4 + fVar263;
          auVar280._16_4_ = fStack_4b0 + fVar222;
          auVar280._20_4_ = fStack_4ac + fVar186;
          auVar280._24_4_ = fStack_4a8 + fVar265;
          auVar280._28_4_ = fStack_4a4 + auVar120._28_4_;
          auVar13 = vsubps_avx(local_660,auVar63);
          auVar179 = vsubps_avx(auVar97,auVar64);
          auVar180 = vsubps_avx(auVar203,auVar19);
          auVar200 = vsubps_avx(auVar280,auVar20);
          auVar65._4_4_ = auVar20._4_4_ * auVar180._4_4_;
          auVar65._0_4_ = auVar20._0_4_ * auVar180._0_4_;
          auVar65._8_4_ = auVar20._8_4_ * auVar180._8_4_;
          auVar65._12_4_ = auVar20._12_4_ * auVar180._12_4_;
          auVar65._16_4_ = auVar20._16_4_ * auVar180._16_4_;
          auVar65._20_4_ = auVar20._20_4_ * auVar180._20_4_;
          auVar65._24_4_ = auVar20._24_4_ * auVar180._24_4_;
          auVar65._28_4_ = auVar303._28_4_;
          auVar66._4_4_ = auVar19._4_4_ * auVar200._4_4_;
          auVar66._0_4_ = auVar19._0_4_ * auVar200._0_4_;
          auVar66._8_4_ = auVar19._8_4_ * auVar200._8_4_;
          auVar66._12_4_ = auVar19._12_4_ * auVar200._12_4_;
          auVar66._16_4_ = auVar19._16_4_ * auVar200._16_4_;
          auVar66._20_4_ = auVar19._20_4_ * auVar200._20_4_;
          auVar66._24_4_ = auVar19._24_4_ * auVar200._24_4_;
          auVar66._28_4_ = fStack_4a4;
          auVar295 = vsubps_avx(auVar66,auVar65);
          auVar67._4_4_ = auVar149._4_4_ * auVar200._4_4_;
          auVar67._0_4_ = auVar149._0_4_ * auVar200._0_4_;
          auVar67._8_4_ = auVar149._8_4_ * auVar200._8_4_;
          auVar67._12_4_ = auVar149._12_4_ * auVar200._12_4_;
          auVar67._16_4_ = auVar149._16_4_ * auVar200._16_4_;
          auVar67._20_4_ = auVar149._20_4_ * auVar200._20_4_;
          auVar67._24_4_ = auVar149._24_4_ * auVar200._24_4_;
          auVar67._28_4_ = auVar200._28_4_;
          auVar200 = vsubps_avx(auVar308,auVar149);
          auVar68._4_4_ = auVar20._4_4_ * auVar200._4_4_;
          auVar68._0_4_ = auVar20._0_4_ * auVar200._0_4_;
          auVar68._8_4_ = auVar20._8_4_ * auVar200._8_4_;
          auVar68._12_4_ = auVar20._12_4_ * auVar200._12_4_;
          auVar68._16_4_ = auVar20._16_4_ * auVar200._16_4_;
          auVar68._20_4_ = auVar20._20_4_ * auVar200._20_4_;
          auVar68._24_4_ = auVar20._24_4_ * auVar200._24_4_;
          auVar68._28_4_ = auVar16._28_4_;
          auVar300 = vsubps_avx(auVar68,auVar67);
          auVar69._4_4_ = auVar19._4_4_ * auVar200._4_4_;
          auVar69._0_4_ = auVar19._0_4_ * auVar200._0_4_;
          auVar69._8_4_ = auVar19._8_4_ * auVar200._8_4_;
          auVar69._12_4_ = auVar19._12_4_ * auVar200._12_4_;
          auVar69._16_4_ = auVar19._16_4_ * auVar200._16_4_;
          auVar69._20_4_ = auVar19._20_4_ * auVar200._20_4_;
          auVar69._24_4_ = auVar19._24_4_ * auVar200._24_4_;
          auVar69._28_4_ = auVar16._28_4_;
          auVar70._4_4_ = auVar149._4_4_ * auVar180._4_4_;
          auVar70._0_4_ = auVar149._0_4_ * auVar180._0_4_;
          auVar70._8_4_ = auVar149._8_4_ * auVar180._8_4_;
          auVar70._12_4_ = auVar149._12_4_ * auVar180._12_4_;
          auVar70._16_4_ = auVar149._16_4_ * auVar180._16_4_;
          auVar70._20_4_ = auVar149._20_4_ * auVar180._20_4_;
          auVar70._24_4_ = auVar149._24_4_ * auVar180._24_4_;
          auVar70._28_4_ = auVar180._28_4_;
          auVar16 = vsubps_avx(auVar70,auVar69);
          auVar147._0_4_ = auVar295._0_4_ * 0.0 + auVar16._0_4_ + auVar300._0_4_ * 0.0;
          auVar147._4_4_ = auVar295._4_4_ * 0.0 + auVar16._4_4_ + auVar300._4_4_ * 0.0;
          auVar147._8_4_ = auVar295._8_4_ * 0.0 + auVar16._8_4_ + auVar300._8_4_ * 0.0;
          auVar147._12_4_ = auVar295._12_4_ * 0.0 + auVar16._12_4_ + auVar300._12_4_ * 0.0;
          auVar147._16_4_ = auVar295._16_4_ * 0.0 + auVar16._16_4_ + auVar300._16_4_ * 0.0;
          auVar147._20_4_ = auVar295._20_4_ * 0.0 + auVar16._20_4_ + auVar300._20_4_ * 0.0;
          auVar147._24_4_ = auVar295._24_4_ * 0.0 + auVar16._24_4_ + auVar300._24_4_ * 0.0;
          auVar147._28_4_ = auVar295._28_4_ + auVar16._28_4_ + auVar300._28_4_;
          auVar14 = vcmpps_avx(auVar147,ZEXT832(0) << 0x20,2);
          auVar24 = vblendvps_avx(auVar24,_local_680,auVar14);
          auVar185 = ZEXT3264(auVar24);
          auVar16 = vblendvps_avx(auVar13,_local_740,auVar14);
          auVar13 = vblendvps_avx(auVar179,auVar319,auVar14);
          auVar179 = vblendvps_avx(auVar149,auVar308,auVar14);
          auVar180 = vblendvps_avx(auVar19,auVar203,auVar14);
          auVar200 = vblendvps_avx(auVar20,auVar280,auVar14);
          auVar295 = vblendvps_avx(auVar308,auVar149,auVar14);
          auVar300 = vblendvps_avx(auVar203,auVar19,auVar14);
          auVar317 = vblendvps_avx(auVar280,auVar20,auVar14);
          auVar149 = vandps_avx(_local_600,auVar18);
          auVar295 = vsubps_avx(auVar295,auVar24);
          auVar21 = vsubps_avx(auVar300,auVar16);
          auVar317 = vsubps_avx(auVar317,auVar13);
          auVar22 = vsubps_avx(auVar16,auVar180);
          fVar258 = auVar21._0_4_;
          fVar231 = auVar13._0_4_;
          fVar225 = auVar21._4_4_;
          fVar249 = auVar13._4_4_;
          auVar71._4_4_ = fVar249 * fVar225;
          auVar71._0_4_ = fVar231 * fVar258;
          fVar259 = auVar21._8_4_;
          fVar243 = auVar13._8_4_;
          auVar71._8_4_ = fVar243 * fVar259;
          fVar268 = auVar21._12_4_;
          fVar245 = auVar13._12_4_;
          auVar71._12_4_ = fVar245 * fVar268;
          fVar155 = auVar21._16_4_;
          fVar194 = auVar13._16_4_;
          auVar71._16_4_ = fVar194 * fVar155;
          fVar136 = auVar21._20_4_;
          fVar206 = auVar13._20_4_;
          auVar71._20_4_ = fVar206 * fVar136;
          fVar211 = auVar21._24_4_;
          fVar208 = auVar13._24_4_;
          auVar71._24_4_ = fVar208 * fVar211;
          auVar71._28_4_ = auVar300._28_4_;
          fVar212 = auVar16._0_4_;
          fVar210 = auVar317._0_4_;
          fVar187 = auVar16._4_4_;
          fVar272 = auVar317._4_4_;
          auVar72._4_4_ = fVar272 * fVar187;
          auVar72._0_4_ = fVar210 * fVar212;
          fVar189 = auVar16._8_4_;
          fVar273 = auVar317._8_4_;
          auVar72._8_4_ = fVar273 * fVar189;
          fVar269 = auVar16._12_4_;
          fVar282 = auVar317._12_4_;
          auVar72._12_4_ = fVar282 * fVar269;
          fVar286 = auVar16._16_4_;
          fVar283 = auVar317._16_4_;
          auVar72._16_4_ = fVar283 * fVar286;
          fVar232 = auVar16._20_4_;
          fVar284 = auVar317._20_4_;
          auVar72._20_4_ = fVar284 * fVar232;
          fVar169 = auVar16._24_4_;
          fVar285 = auVar317._24_4_;
          uVar105 = auVar19._28_4_;
          auVar72._24_4_ = fVar285 * fVar169;
          auVar72._28_4_ = uVar105;
          auVar300 = vsubps_avx(auVar72,auVar71);
          fVar171 = auVar24._0_4_;
          fVar267 = auVar24._4_4_;
          auVar73._4_4_ = fVar272 * fVar267;
          auVar73._0_4_ = fVar210 * fVar171;
          fVar255 = auVar24._8_4_;
          auVar73._8_4_ = fVar273 * fVar255;
          fVar191 = auVar24._12_4_;
          auVar73._12_4_ = fVar282 * fVar191;
          fVar124 = auVar24._16_4_;
          auVar73._16_4_ = fVar283 * fVar124;
          fVar241 = auVar24._20_4_;
          auVar73._20_4_ = fVar284 * fVar241;
          fVar170 = auVar24._24_4_;
          auVar73._24_4_ = fVar285 * fVar170;
          auVar73._28_4_ = uVar105;
          fVar263 = auVar295._0_4_;
          fVar228 = auVar295._4_4_;
          auVar74._4_4_ = fVar249 * fVar228;
          auVar74._0_4_ = fVar231 * fVar263;
          fVar264 = auVar295._8_4_;
          auVar74._8_4_ = fVar243 * fVar264;
          fVar257 = auVar295._12_4_;
          auVar74._12_4_ = fVar245 * fVar257;
          fVar126 = auVar295._16_4_;
          auVar74._16_4_ = fVar194 * fVar126;
          fVar244 = auVar295._20_4_;
          auVar74._20_4_ = fVar206 * fVar244;
          fVar214 = auVar295._24_4_;
          auVar74._24_4_ = fVar208 * fVar214;
          auVar74._28_4_ = auVar308._28_4_;
          auVar19 = vsubps_avx(auVar74,auVar73);
          auVar75._4_4_ = fVar187 * fVar228;
          auVar75._0_4_ = fVar212 * fVar263;
          auVar75._8_4_ = fVar189 * fVar264;
          auVar75._12_4_ = fVar269 * fVar257;
          auVar75._16_4_ = fVar286 * fVar126;
          auVar75._20_4_ = fVar232 * fVar244;
          auVar75._24_4_ = fVar169 * fVar214;
          auVar75._28_4_ = uVar105;
          auVar76._4_4_ = fVar267 * fVar225;
          auVar76._0_4_ = fVar171 * fVar258;
          auVar76._8_4_ = fVar255 * fVar259;
          auVar76._12_4_ = fVar191 * fVar268;
          auVar76._16_4_ = fVar124 * fVar155;
          auVar76._20_4_ = fVar241 * fVar136;
          auVar76._24_4_ = fVar170 * fVar211;
          auVar76._28_4_ = auVar20._28_4_;
          auVar20 = vsubps_avx(auVar76,auVar75);
          auVar23 = vsubps_avx(auVar13,auVar200);
          fVar186 = auVar20._28_4_ + auVar19._28_4_;
          auVar290._0_4_ = auVar20._0_4_ + auVar19._0_4_ * 0.0 + auVar300._0_4_ * 0.0;
          auVar290._4_4_ = auVar20._4_4_ + auVar19._4_4_ * 0.0 + auVar300._4_4_ * 0.0;
          auVar290._8_4_ = auVar20._8_4_ + auVar19._8_4_ * 0.0 + auVar300._8_4_ * 0.0;
          auVar290._12_4_ = auVar20._12_4_ + auVar19._12_4_ * 0.0 + auVar300._12_4_ * 0.0;
          auVar290._16_4_ = auVar20._16_4_ + auVar19._16_4_ * 0.0 + auVar300._16_4_ * 0.0;
          auVar290._20_4_ = auVar20._20_4_ + auVar19._20_4_ * 0.0 + auVar300._20_4_ * 0.0;
          auVar290._24_4_ = auVar20._24_4_ + auVar19._24_4_ * 0.0 + auVar300._24_4_ * 0.0;
          auVar290._28_4_ = fVar186 + auVar300._28_4_;
          fVar222 = auVar22._0_4_;
          fVar188 = auVar22._4_4_;
          auVar77._4_4_ = auVar200._4_4_ * fVar188;
          auVar77._0_4_ = auVar200._0_4_ * fVar222;
          fVar266 = auVar22._8_4_;
          auVar77._8_4_ = auVar200._8_4_ * fVar266;
          fVar270 = auVar22._12_4_;
          auVar77._12_4_ = auVar200._12_4_ * fVar270;
          fVar128 = auVar22._16_4_;
          auVar77._16_4_ = auVar200._16_4_ * fVar128;
          fVar246 = auVar22._20_4_;
          auVar77._20_4_ = auVar200._20_4_ * fVar246;
          fVar224 = auVar22._24_4_;
          auVar77._24_4_ = auVar200._24_4_ * fVar224;
          auVar77._28_4_ = fVar186;
          fVar186 = auVar23._0_4_;
          fVar297 = auVar23._4_4_;
          auVar78._4_4_ = auVar180._4_4_ * fVar297;
          auVar78._0_4_ = auVar180._0_4_ * fVar186;
          fVar190 = auVar23._8_4_;
          auVar78._8_4_ = auVar180._8_4_ * fVar190;
          fVar271 = auVar23._12_4_;
          auVar78._12_4_ = auVar180._12_4_ * fVar271;
          fVar130 = auVar23._16_4_;
          auVar78._16_4_ = auVar180._16_4_ * fVar130;
          fVar247 = auVar23._20_4_;
          auVar78._20_4_ = auVar180._20_4_ * fVar247;
          fVar227 = auVar23._24_4_;
          auVar78._24_4_ = auVar180._24_4_ * fVar227;
          auVar78._28_4_ = auVar20._28_4_;
          auVar19 = vsubps_avx(auVar78,auVar77);
          auVar20 = vsubps_avx(auVar24,auVar179);
          fVar265 = auVar20._0_4_;
          fVar296 = auVar20._4_4_;
          auVar79._4_4_ = auVar200._4_4_ * fVar296;
          auVar79._0_4_ = auVar200._0_4_ * fVar265;
          fVar256 = auVar20._8_4_;
          auVar79._8_4_ = auVar200._8_4_ * fVar256;
          fVar192 = auVar20._12_4_;
          auVar79._12_4_ = auVar200._12_4_ * fVar192;
          fVar132 = auVar20._16_4_;
          auVar79._16_4_ = auVar200._16_4_ * fVar132;
          fVar248 = auVar20._20_4_;
          auVar79._20_4_ = auVar200._20_4_ * fVar248;
          fVar230 = auVar20._24_4_;
          auVar79._24_4_ = auVar200._24_4_ * fVar230;
          auVar79._28_4_ = auVar200._28_4_;
          auVar80._4_4_ = fVar297 * auVar179._4_4_;
          auVar80._0_4_ = fVar186 * auVar179._0_4_;
          auVar80._8_4_ = fVar190 * auVar179._8_4_;
          auVar80._12_4_ = fVar271 * auVar179._12_4_;
          auVar80._16_4_ = fVar130 * auVar179._16_4_;
          auVar80._20_4_ = fVar247 * auVar179._20_4_;
          auVar80._24_4_ = fVar227 * auVar179._24_4_;
          auVar80._28_4_ = auVar300._28_4_;
          auVar200 = vsubps_avx(auVar79,auVar80);
          auVar81._4_4_ = auVar180._4_4_ * fVar296;
          auVar81._0_4_ = auVar180._0_4_ * fVar265;
          auVar81._8_4_ = auVar180._8_4_ * fVar256;
          auVar81._12_4_ = auVar180._12_4_ * fVar192;
          auVar81._16_4_ = auVar180._16_4_ * fVar132;
          auVar81._20_4_ = auVar180._20_4_ * fVar248;
          auVar81._24_4_ = auVar180._24_4_ * fVar230;
          auVar81._28_4_ = auVar180._28_4_;
          auVar82._4_4_ = fVar188 * auVar179._4_4_;
          auVar82._0_4_ = fVar222 * auVar179._0_4_;
          auVar82._8_4_ = fVar266 * auVar179._8_4_;
          auVar82._12_4_ = fVar270 * auVar179._12_4_;
          auVar82._16_4_ = fVar128 * auVar179._16_4_;
          auVar82._20_4_ = fVar246 * auVar179._20_4_;
          auVar82._24_4_ = fVar224 * auVar179._24_4_;
          auVar82._28_4_ = auVar179._28_4_;
          auVar179 = vsubps_avx(auVar82,auVar81);
          auVar121._0_4_ = auVar19._0_4_ * 0.0 + auVar179._0_4_ + auVar200._0_4_ * 0.0;
          auVar121._4_4_ = auVar19._4_4_ * 0.0 + auVar179._4_4_ + auVar200._4_4_ * 0.0;
          auVar121._8_4_ = auVar19._8_4_ * 0.0 + auVar179._8_4_ + auVar200._8_4_ * 0.0;
          auVar121._12_4_ = auVar19._12_4_ * 0.0 + auVar179._12_4_ + auVar200._12_4_ * 0.0;
          auVar121._16_4_ = auVar19._16_4_ * 0.0 + auVar179._16_4_ + auVar200._16_4_ * 0.0;
          auVar121._20_4_ = auVar19._20_4_ * 0.0 + auVar179._20_4_ + auVar200._20_4_ * 0.0;
          auVar121._24_4_ = auVar19._24_4_ * 0.0 + auVar179._24_4_ + auVar200._24_4_ * 0.0;
          auVar121._28_4_ = auVar200._28_4_ + auVar179._28_4_ + auVar200._28_4_;
          auVar123 = ZEXT3264(auVar121);
          auVar179 = vmaxps_avx(auVar290,auVar121);
          auVar179 = vcmpps_avx(auVar179,ZEXT432(0) << 0x20,2);
          auVar180 = auVar149 & auVar179;
          if ((((((((auVar180 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar180 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar180 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar180 >> 0x7f,0) == '\0') &&
                (auVar180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar180 >> 0xbf,0) == '\0') &&
              (auVar180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar180[0x1f]) {
LAB_0082258e:
            auVar242 = auVar16._4_12_;
            auVar151 = ZEXT3264(CONCAT824(uStack_608,
                                          CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
            auVar149 = vcmpps_avx(auVar22,auVar22,0xf);
            auVar281 = ZEXT3264(auVar149);
            auVar320._4_4_ = fVar125;
            auVar320._0_4_ = fVar109;
            auVar320._8_4_ = fVar127;
            auVar320._12_4_ = fVar129;
            auVar320._16_4_ = fVar131;
            auVar320._20_4_ = fVar133;
            auVar320._24_4_ = fVar134;
            auVar320._28_4_ = fVar135;
          }
          else {
            auVar180 = vandps_avx(auVar179,auVar149);
            auVar83._4_4_ = fVar297 * fVar225;
            auVar83._0_4_ = fVar186 * fVar258;
            auVar83._8_4_ = fVar190 * fVar259;
            auVar83._12_4_ = fVar271 * fVar268;
            auVar83._16_4_ = fVar130 * fVar155;
            auVar83._20_4_ = fVar247 * fVar136;
            auVar83._24_4_ = fVar227 * fVar211;
            auVar83._28_4_ = auVar149._28_4_;
            auVar84._4_4_ = fVar188 * fVar272;
            auVar84._0_4_ = fVar222 * fVar210;
            auVar84._8_4_ = fVar266 * fVar273;
            auVar84._12_4_ = fVar270 * fVar282;
            auVar84._16_4_ = fVar128 * fVar283;
            auVar84._20_4_ = fVar246 * fVar284;
            auVar84._24_4_ = fVar224 * fVar285;
            auVar84._28_4_ = auVar179._28_4_;
            auVar179 = vsubps_avx(auVar84,auVar83);
            auVar85._4_4_ = fVar296 * fVar272;
            auVar85._0_4_ = fVar265 * fVar210;
            auVar85._8_4_ = fVar256 * fVar273;
            auVar85._12_4_ = fVar192 * fVar282;
            auVar85._16_4_ = fVar132 * fVar283;
            auVar85._20_4_ = fVar248 * fVar284;
            auVar85._24_4_ = fVar230 * fVar285;
            auVar85._28_4_ = auVar317._28_4_;
            auVar86._4_4_ = fVar297 * fVar228;
            auVar86._0_4_ = fVar186 * fVar263;
            auVar86._8_4_ = fVar190 * fVar264;
            auVar86._12_4_ = fVar271 * fVar257;
            auVar86._16_4_ = fVar130 * fVar126;
            auVar86._20_4_ = fVar247 * fVar244;
            auVar86._24_4_ = fVar227 * fVar214;
            auVar86._28_4_ = auVar23._28_4_;
            auVar200 = vsubps_avx(auVar86,auVar85);
            auVar87._4_4_ = fVar188 * fVar228;
            auVar87._0_4_ = fVar222 * fVar263;
            auVar87._8_4_ = fVar266 * fVar264;
            auVar87._12_4_ = fVar270 * fVar257;
            auVar87._16_4_ = fVar128 * fVar126;
            auVar87._20_4_ = fVar246 * fVar244;
            auVar87._24_4_ = fVar224 * fVar214;
            auVar87._28_4_ = auVar295._28_4_;
            auVar88._4_4_ = fVar296 * fVar225;
            auVar88._0_4_ = fVar265 * fVar258;
            auVar88._8_4_ = fVar256 * fVar259;
            auVar88._12_4_ = fVar192 * fVar268;
            auVar88._16_4_ = fVar132 * fVar155;
            auVar88._20_4_ = fVar248 * fVar136;
            auVar88._24_4_ = fVar230 * fVar211;
            auVar88._28_4_ = auVar21._28_4_;
            auVar22 = vsubps_avx(auVar88,auVar87);
            auVar148._0_4_ = auVar179._0_4_ * 0.0 + auVar22._0_4_ + auVar200._0_4_ * 0.0;
            auVar148._4_4_ = auVar179._4_4_ * 0.0 + auVar22._4_4_ + auVar200._4_4_ * 0.0;
            auVar148._8_4_ = auVar179._8_4_ * 0.0 + auVar22._8_4_ + auVar200._8_4_ * 0.0;
            auVar148._12_4_ = auVar179._12_4_ * 0.0 + auVar22._12_4_ + auVar200._12_4_ * 0.0;
            auVar148._16_4_ = auVar179._16_4_ * 0.0 + auVar22._16_4_ + auVar200._16_4_ * 0.0;
            auVar148._20_4_ = auVar179._20_4_ * 0.0 + auVar22._20_4_ + auVar200._20_4_ * 0.0;
            auVar148._24_4_ = auVar179._24_4_ * 0.0 + auVar22._24_4_ + auVar200._24_4_ * 0.0;
            auVar148._28_4_ = auVar21._28_4_ + auVar22._28_4_ + auVar295._28_4_;
            auVar149 = vrcpps_avx(auVar148);
            fVar258 = auVar149._0_4_;
            fVar263 = auVar149._4_4_;
            auVar89._4_4_ = auVar148._4_4_ * fVar263;
            auVar89._0_4_ = auVar148._0_4_ * fVar258;
            fVar222 = auVar149._8_4_;
            auVar89._8_4_ = auVar148._8_4_ * fVar222;
            fVar186 = auVar149._12_4_;
            auVar89._12_4_ = auVar148._12_4_ * fVar186;
            fVar265 = auVar149._16_4_;
            auVar89._16_4_ = auVar148._16_4_ * fVar265;
            fVar225 = auVar149._20_4_;
            auVar89._20_4_ = auVar148._20_4_ * fVar225;
            fVar228 = auVar149._24_4_;
            auVar89._24_4_ = auVar148._24_4_ * fVar228;
            auVar89._28_4_ = auVar23._28_4_;
            auVar304._8_4_ = 0x3f800000;
            auVar304._0_8_ = 0x3f8000003f800000;
            auVar304._12_4_ = 0x3f800000;
            auVar304._16_4_ = 0x3f800000;
            auVar304._20_4_ = 0x3f800000;
            auVar304._24_4_ = 0x3f800000;
            auVar304._28_4_ = 0x3f800000;
            auVar149 = vsubps_avx(auVar304,auVar89);
            fVar258 = auVar149._0_4_ * fVar258 + fVar258;
            fVar263 = auVar149._4_4_ * fVar263 + fVar263;
            fVar222 = auVar149._8_4_ * fVar222 + fVar222;
            fVar186 = auVar149._12_4_ * fVar186 + fVar186;
            fVar265 = auVar149._16_4_ * fVar265 + fVar265;
            fVar225 = auVar149._20_4_ * fVar225 + fVar225;
            fVar228 = auVar149._24_4_ * fVar228 + fVar228;
            auVar90._4_4_ =
                 (fVar267 * auVar179._4_4_ + auVar200._4_4_ * fVar187 + auVar22._4_4_ * fVar249) *
                 fVar263;
            auVar90._0_4_ =
                 (fVar171 * auVar179._0_4_ + auVar200._0_4_ * fVar212 + auVar22._0_4_ * fVar231) *
                 fVar258;
            auVar90._8_4_ =
                 (fVar255 * auVar179._8_4_ + auVar200._8_4_ * fVar189 + auVar22._8_4_ * fVar243) *
                 fVar222;
            auVar90._12_4_ =
                 (fVar191 * auVar179._12_4_ + auVar200._12_4_ * fVar269 + auVar22._12_4_ * fVar245)
                 * fVar186;
            auVar90._16_4_ =
                 (fVar124 * auVar179._16_4_ + auVar200._16_4_ * fVar286 + auVar22._16_4_ * fVar194)
                 * fVar265;
            auVar90._20_4_ =
                 (fVar241 * auVar179._20_4_ + auVar200._20_4_ * fVar232 + auVar22._20_4_ * fVar206)
                 * fVar225;
            auVar90._24_4_ =
                 (fVar170 * auVar179._24_4_ + auVar200._24_4_ * fVar169 + auVar22._24_4_ * fVar208)
                 * fVar228;
            auVar90._28_4_ = auVar24._28_4_ + auVar16._28_4_ + auVar13._28_4_;
            auVar185 = ZEXT3264(auVar90);
            uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar204._4_4_ = uVar105;
            auVar204._0_4_ = uVar105;
            auVar204._8_4_ = uVar105;
            auVar204._12_4_ = uVar105;
            auVar204._16_4_ = uVar105;
            auVar204._20_4_ = uVar105;
            auVar204._24_4_ = uVar105;
            auVar204._28_4_ = uVar105;
            auVar149 = vcmpps_avx(_local_500,auVar90,2);
            auVar24 = vcmpps_avx(auVar90,auVar204,2);
            auVar16 = vandps_avx(auVar149,auVar24);
            auVar149 = auVar180 & auVar16;
            if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar149 >> 0x7f,0) == '\0') &&
                  (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar149 >> 0xbf,0) == '\0') &&
                (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar149[0x1f]) goto LAB_0082258e;
            auVar149 = vandps_avx(auVar180,auVar16);
            auVar242 = auVar149._4_12_;
            auVar16 = vcmpps_avx(ZEXT432(0) << 0x20,auVar148,4);
            auVar179 = auVar149 & auVar16;
            auVar151 = ZEXT3264(CONCAT824(uStack_608,
                                          CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
            auVar13 = vcmpps_avx(auVar22,auVar22,0xf);
            auVar281 = ZEXT3264(auVar13);
            auVar320._4_4_ = fVar125;
            auVar320._0_4_ = fVar109;
            auVar320._8_4_ = fVar127;
            auVar320._12_4_ = fVar129;
            auVar320._16_4_ = fVar131;
            auVar320._20_4_ = fVar133;
            auVar320._24_4_ = fVar134;
            auVar320._28_4_ = fVar135;
            if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar179 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar179 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar179 >> 0x7f,0) != '\0') ||
                  (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar179 >> 0xbf,0) != '\0') ||
                (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar179[0x1f] < '\0') {
              auVar149 = vandps_avx(auVar16,auVar149);
              auVar151 = ZEXT3264(auVar149);
              auVar91._4_4_ = auVar290._4_4_ * fVar263;
              auVar91._0_4_ = auVar290._0_4_ * fVar258;
              auVar91._8_4_ = auVar290._8_4_ * fVar222;
              auVar91._12_4_ = auVar290._12_4_ * fVar186;
              auVar91._16_4_ = auVar290._16_4_ * fVar265;
              auVar91._20_4_ = auVar290._20_4_ * fVar225;
              auVar91._24_4_ = auVar290._24_4_ * fVar228;
              auVar91._28_4_ = auVar24._28_4_;
              auVar92._4_4_ = auVar121._4_4_ * fVar263;
              auVar92._0_4_ = auVar121._0_4_ * fVar258;
              auVar92._8_4_ = auVar121._8_4_ * fVar222;
              auVar92._12_4_ = auVar121._12_4_ * fVar186;
              auVar92._16_4_ = auVar121._16_4_ * fVar265;
              auVar92._20_4_ = auVar121._20_4_ * fVar225;
              auVar92._24_4_ = auVar121._24_4_ * fVar228;
              auVar92._28_4_ = auVar121._28_4_;
              auVar235._8_4_ = 0x3f800000;
              auVar235._0_8_ = 0x3f8000003f800000;
              auVar235._12_4_ = 0x3f800000;
              auVar240._16_4_ = 0x3f800000;
              auVar240._0_16_ = auVar235;
              auVar240._20_4_ = 0x3f800000;
              auVar240._24_4_ = 0x3f800000;
              auVar240._28_4_ = 0x3f800000;
              auVar242 = auVar235._4_12_;
              auVar149 = vsubps_avx(auVar240,auVar91);
              local_2e0 = vblendvps_avx(auVar149,auVar91,auVar14);
              auVar149 = vsubps_avx(auVar240,auVar92);
              _local_540 = vblendvps_avx(auVar149,auVar92,auVar14);
              auVar123 = ZEXT3264(_local_540);
              local_300 = auVar90;
            }
          }
          auVar149 = auVar151._0_32_;
          _local_720 = auVar18;
          local_5a0 = auVar17;
          if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar149 >> 0x7f,0) == '\0') &&
                (auVar151 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar149 >> 0xbf,0) == '\0') &&
              (auVar151 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar151[0x1f]) {
            auVar221 = ZEXT3264(auVar199);
          }
          else {
            auVar18 = vsubps_avx(auVar166,auVar320);
            auVar185 = ZEXT3264(local_2e0);
            fVar212 = auVar320._0_4_ + auVar18._0_4_ * local_2e0._0_4_;
            fVar171 = auVar320._4_4_ + auVar18._4_4_ * local_2e0._4_4_;
            fVar263 = auVar320._8_4_ + auVar18._8_4_ * local_2e0._8_4_;
            fVar222 = auVar320._12_4_ + auVar18._12_4_ * local_2e0._12_4_;
            fVar186 = auVar320._16_4_ + auVar18._16_4_ * local_2e0._16_4_;
            fVar265 = auVar320._20_4_ + auVar18._20_4_ * local_2e0._20_4_;
            fVar225 = auVar320._24_4_ + auVar18._24_4_ * local_2e0._24_4_;
            fVar187 = auVar320._28_4_ + auVar18._28_4_;
            fVar258 = *(float *)((long)local_778->ray_space + k * 4 + -0x20);
            auVar93._4_4_ = (fVar171 + fVar171) * fVar258;
            auVar93._0_4_ = (fVar212 + fVar212) * fVar258;
            auVar93._8_4_ = (fVar263 + fVar263) * fVar258;
            auVar93._12_4_ = (fVar222 + fVar222) * fVar258;
            auVar93._16_4_ = (fVar186 + fVar186) * fVar258;
            auVar93._20_4_ = (fVar265 + fVar265) * fVar258;
            auVar93._24_4_ = (fVar225 + fVar225) * fVar258;
            auVar93._28_4_ = fVar187 + fVar187;
            auVar18 = vcmpps_avx(local_300,auVar93,6);
            auVar123 = ZEXT3264(auVar18);
            auVar16 = auVar149 & auVar18;
            auVar221 = ZEXT3264(auVar199);
            if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar16 >> 0x7f,0) != '\0') ||
                  (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar16 >> 0xbf,0) != '\0') ||
                (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar16[0x1f] < '\0') {
              local_380 = vandps_avx(auVar18,auVar149);
              auVar123 = ZEXT3264(local_380);
              auVar142._0_8_ =
                   CONCAT44((float)local_540._4_4_ + (float)local_540._4_4_ + -1.0,
                            (float)local_540._0_4_ + (float)local_540._0_4_ + -1.0);
              auVar142._8_4_ = (float)uStack_538 + (float)uStack_538 + -1.0;
              auVar142._12_4_ = uStack_538._4_4_ + uStack_538._4_4_ + -1.0;
              auVar143._16_4_ = (float)uStack_530 + (float)uStack_530 + -1.0;
              auVar143._0_16_ = auVar142;
              auVar143._20_4_ = uStack_530._4_4_ + uStack_530._4_4_ + -1.0;
              fStack_408 = (float)uStack_528 + (float)uStack_528 + -1.0;
              _local_420 = auVar143;
              fStack_404 = uStack_528._4_4_ + uStack_528._4_4_ + -1.0;
              auVar151 = ZEXT3264(_local_420);
              local_440 = local_2e0;
              local_400 = local_300;
              local_3d0 = local_960;
              fStack_3cc = fStack_95c;
              fStack_3c8 = fStack_958;
              fStack_3c4 = fStack_954;
              local_3c0 = local_930;
              fStack_3bc = fStack_92c;
              fStack_3b8 = fStack_928;
              fStack_3b4 = fStack_924;
              local_3b0 = local_6d0;
              uStack_3a8 = uStack_6c8;
              local_3a0 = local_8c0;
              fStack_39c = fStack_8bc;
              fStack_398 = fStack_8b8;
              fStack_394 = fStack_8b4;
              local_7c0._0_8_ = (context->scene->geometries).items[uVar103].ptr;
              _local_540 = _local_420;
              if ((((Geometry *)local_7c0._0_8_)->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                pRVar101 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar101 = context->args;
                if ((pRVar101->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar101 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar101 >> 8),1),
                   ((Geometry *)local_7c0._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_7c0._8_24_ = auVar166._8_24_;
                  stack0xfffffffffffff824 = auVar184._4_28_;
                  local_7e0._0_4_ = (int)uVar106;
                  auVar160._0_4_ = (float)(int)local_3e0;
                  auVar160._4_12_ = auVar242;
                  auVar161 = vshufps_avx(auVar160,auVar160,0);
                  local_360[0] = (auVar161._0_4_ + local_2e0._0_4_ + 0.0) * (float)local_140._0_4_;
                  local_360[1] = (auVar161._4_4_ + local_2e0._4_4_ + 1.0) * (float)local_140._4_4_;
                  local_360[2] = (auVar161._8_4_ + local_2e0._8_4_ + 2.0) * fStack_138;
                  local_360[3] = (auVar161._12_4_ + local_2e0._12_4_ + 3.0) * fStack_134;
                  fStack_350 = (auVar161._0_4_ + local_2e0._16_4_ + 4.0) * fStack_130;
                  fStack_34c = (auVar161._4_4_ + local_2e0._20_4_ + 5.0) * fStack_12c;
                  fStack_348 = (auVar161._8_4_ + local_2e0._24_4_ + 6.0) * fStack_128;
                  fStack_344 = auVar161._12_4_ + (float)local_2e0._28_4_ + 7.0;
                  uStack_538 = auVar142._8_8_;
                  uStack_530 = auVar143._16_8_;
                  uStack_528 = local_420._24_8_;
                  local_340 = auVar142._0_8_;
                  uStack_338 = uStack_538;
                  uStack_330 = uStack_530;
                  uStack_328 = uStack_528;
                  auVar151 = ZEXT3264(local_300);
                  local_320 = local_300;
                  uVar105 = vmovmskps_avx(local_380);
                  uVar102 = CONCAT44((int)((ulong)pRVar101 >> 0x20),uVar105);
                  uVar106 = 0;
                  local_3dc = uVar10;
                  if (uVar102 != 0) {
                    for (; (uVar102 >> uVar106 & 1) == 0; uVar106 = uVar106 + 1) {
                    }
                  }
                  while (auVar149 = auVar281._0_32_, uVar102 != 0) {
                    local_720._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_200 = local_360[uVar106];
                    local_1e0 = *(undefined4 *)((long)&local_340 + uVar106 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar106 * 4);
                    fVar212 = 1.0 - local_200;
                    fVar258 = local_200 * 3.0;
                    auVar161 = ZEXT416((uint)((fVar212 * -2.0 * local_200 + local_200 * local_200) *
                                             0.5));
                    auVar161 = vshufps_avx(auVar161,auVar161,0);
                    auVar176 = ZEXT416((uint)(((fVar212 + fVar212) * (fVar258 + 2.0) +
                                              fVar212 * fVar212 * -3.0) * 0.5));
                    auVar176 = vshufps_avx(auVar176,auVar176,0);
                    auVar177 = ZEXT416((uint)(((local_200 + local_200) * (fVar258 + -5.0) +
                                              local_200 * fVar258) * 0.5));
                    auVar177 = vshufps_avx(auVar177,auVar177,0);
                    local_770.context = context->user;
                    auVar178 = ZEXT416((uint)((local_200 * (fVar212 + fVar212) - fVar212 * fVar212)
                                             * 0.5));
                    auVar178 = vshufps_avx(auVar178,auVar178,0);
                    auVar162._0_4_ =
                         local_960 * auVar178._0_4_ +
                         local_930 * auVar177._0_4_ +
                         local_8c0 * auVar161._0_4_ + auVar176._0_4_ * (float)local_6d0._0_4_;
                    auVar162._4_4_ =
                         fStack_95c * auVar178._4_4_ +
                         fStack_92c * auVar177._4_4_ +
                         fStack_8bc * auVar161._4_4_ + auVar176._4_4_ * (float)local_6d0._4_4_;
                    auVar162._8_4_ =
                         fStack_958 * auVar178._8_4_ +
                         fStack_928 * auVar177._8_4_ +
                         fStack_8b8 * auVar161._8_4_ + auVar176._8_4_ * (float)uStack_6c8;
                    auVar162._12_4_ =
                         fStack_954 * auVar178._12_4_ +
                         fStack_924 * auVar177._12_4_ +
                         fStack_8b4 * auVar161._12_4_ + auVar176._12_4_ * uStack_6c8._4_4_;
                    local_250 = vshufps_avx(auVar162,auVar162,0);
                    local_260[0] = (RTCHitN)local_250[0];
                    local_260[1] = (RTCHitN)local_250[1];
                    local_260[2] = (RTCHitN)local_250[2];
                    local_260[3] = (RTCHitN)local_250[3];
                    local_260[4] = (RTCHitN)local_250[4];
                    local_260[5] = (RTCHitN)local_250[5];
                    local_260[6] = (RTCHitN)local_250[6];
                    local_260[7] = (RTCHitN)local_250[7];
                    local_260[8] = (RTCHitN)local_250[8];
                    local_260[9] = (RTCHitN)local_250[9];
                    local_260[10] = (RTCHitN)local_250[10];
                    local_260[0xb] = (RTCHitN)local_250[0xb];
                    local_260[0xc] = (RTCHitN)local_250[0xc];
                    local_260[0xd] = (RTCHitN)local_250[0xd];
                    local_260[0xe] = (RTCHitN)local_250[0xe];
                    local_260[0xf] = (RTCHitN)local_250[0xf];
                    local_230 = vshufps_avx(auVar162,auVar162,0x55);
                    local_240 = local_230;
                    local_210 = vshufps_avx(auVar162,auVar162,0xaa);
                    local_220 = local_210;
                    fStack_1fc = local_200;
                    fStack_1f8 = local_200;
                    fStack_1f4 = local_200;
                    fStack_1f0 = local_200;
                    fStack_1ec = local_200;
                    fStack_1e8 = local_200;
                    fStack_1e4 = local_200;
                    uStack_1dc = local_1e0;
                    uStack_1d8 = local_1e0;
                    uStack_1d4 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1cc = local_1e0;
                    uStack_1c8 = local_1e0;
                    uStack_1c4 = local_1e0;
                    local_1c0 = local_120._0_8_;
                    uStack_1b8 = local_120._8_8_;
                    uStack_1b0 = local_120._16_8_;
                    uStack_1a8 = local_120._24_8_;
                    local_1a0 = local_100._0_8_;
                    uStack_198 = local_100._8_8_;
                    uStack_190 = local_100._16_8_;
                    uStack_188 = local_100._24_8_;
                    local_780[1] = auVar149;
                    *local_780 = auVar149;
                    local_180 = (local_770.context)->instID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_160 = (local_770.context)->instPrimID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_800 = *local_788;
                    local_7f0 = *local_790;
                    local_770.valid = (int *)local_800;
                    local_770.geometryUserPtr = *(void **)(local_7c0._0_8_ + 0x18);
                    local_770.hit = local_260;
                    local_770.N = 8;
                    local_770.ray = (RTCRayN *)ray;
                    if (*(code **)(local_7c0._0_8_ + 0x48) != (code *)0x0) {
                      auVar149 = ZEXT1632(auVar281._0_16_);
                      (**(code **)(local_7c0._0_8_ + 0x48))(&local_770);
                    }
                    auVar151 = ZEXT1664(local_7f0);
                    auVar161 = vpcmpeqd_avx(local_800,ZEXT816(0) << 0x40);
                    auVar176 = vpcmpeqd_avx(local_7f0,ZEXT816(0) << 0x40);
                    auVar185 = ZEXT1664(auVar176);
                    auVar167._16_16_ = auVar176;
                    auVar167._0_16_ = auVar161;
                    auVar149 = vcmpps_avx(auVar149,auVar149,0xf);
                    auVar18 = auVar149 & ~auVar167;
                    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar18 >> 0x7f,0) == '\0') &&
                          (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar18 >> 0xbf,0) == '\0') &&
                        (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar18[0x1f]) {
                      auVar122._0_4_ = auVar149._0_4_ ^ auVar161._0_4_;
                      auVar122._4_4_ = auVar149._4_4_ ^ auVar161._4_4_;
                      auVar122._8_4_ = auVar149._8_4_ ^ auVar161._8_4_;
                      auVar122._12_4_ = auVar149._12_4_ ^ auVar161._12_4_;
                      auVar122._16_4_ = auVar149._16_4_ ^ auVar176._0_4_;
                      auVar122._20_4_ = auVar149._20_4_ ^ auVar176._4_4_;
                      auVar122._24_4_ = auVar149._24_4_ ^ auVar176._8_4_;
                      auVar122._28_4_ = auVar149._28_4_ ^ auVar176._12_4_;
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_7c0._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar185 = ZEXT1664(auVar176);
                        auVar149 = ZEXT1632(auVar149._0_16_);
                        (*p_Var12)(&local_770);
                      }
                      auVar161 = vpcmpeqd_avx(local_800,ZEXT816(0) << 0x40);
                      auVar176 = vpcmpeqd_avx(local_7f0,ZEXT816(0) << 0x40);
                      auVar150._16_16_ = auVar176;
                      auVar150._0_16_ = auVar161;
                      auVar149 = vcmpps_avx(auVar149,auVar149,0xf);
                      auVar122._0_4_ = auVar149._0_4_ ^ auVar161._0_4_;
                      auVar122._4_4_ = auVar149._4_4_ ^ auVar161._4_4_;
                      auVar122._8_4_ = auVar149._8_4_ ^ auVar161._8_4_;
                      auVar122._12_4_ = auVar149._12_4_ ^ auVar161._12_4_;
                      auVar122._16_4_ = auVar149._16_4_ ^ auVar176._0_4_;
                      auVar122._20_4_ = auVar149._20_4_ ^ auVar176._4_4_;
                      auVar122._24_4_ = auVar149._24_4_ ^ auVar176._8_4_;
                      auVar122._28_4_ = auVar149._28_4_ ^ auVar176._12_4_;
                      auVar168._8_4_ = 0xff800000;
                      auVar168._0_8_ = 0xff800000ff800000;
                      auVar168._12_4_ = 0xff800000;
                      auVar168._16_4_ = 0xff800000;
                      auVar168._20_4_ = 0xff800000;
                      auVar168._24_4_ = 0xff800000;
                      auVar168._28_4_ = 0xff800000;
                      auVar18 = vblendvps_avx(auVar168,*(undefined1 (*) [32])(local_770.ray + 0x100)
                                              ,auVar150);
                      auVar151 = ZEXT3264(auVar18);
                      *(undefined1 (*) [32])(local_770.ray + 0x100) = auVar18;
                    }
                    auVar281 = ZEXT3264(auVar149);
                    auVar123 = ZEXT3264(auVar122);
                    if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar122 >> 0x7f,0) != '\0') ||
                          (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar122 >> 0xbf,0) != '\0') ||
                        (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar122[0x1f] < '\0') {
                      pRVar101 = (RTCIntersectArguments *)0x1;
                      goto LAB_008225cf;
                    }
                    auVar123 = ZEXT464((uint)local_720._0_4_);
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_720._0_4_;
                    uVar102 = uVar102 ^ 1L << (uVar106 & 0x3f);
                    uVar106 = 0;
                    if (uVar102 != 0) {
                      for (; (uVar102 >> uVar106 & 1) == 0; uVar106 = uVar106 + 1) {
                      }
                    }
                  }
                  pRVar101 = (RTCIntersectArguments *)0x0;
LAB_008225cf:
                  uVar106 = (ulong)(uint)local_7e0._0_4_;
                }
              }
              auVar221 = ZEXT3264(auVar199);
              uVar106 = CONCAT71((int7)(uVar106 >> 8),(byte)uVar106 | (byte)pRVar101);
            }
          }
        }
        auVar291 = ZEXT3264(auVar278);
        auVar281 = ZEXT3264(auVar275);
      }
    }
    if ((uVar106 & 1) != 0) break;
    uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar113._4_4_ = uVar105;
    auVar113._0_4_ = uVar105;
    auVar113._8_4_ = uVar105;
    auVar113._12_4_ = uVar105;
    auVar161 = vcmpps_avx(local_450,auVar113,2);
    uVar103 = vmovmskps_avx(auVar161);
    local_628 = (ulong)((uint)uVar108 & uVar103);
  }
  return local_628 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }